

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_avx512::forward_inplace(BNLL_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [40];
  undefined1 auVar178 [48];
  undefined1 auVar179 [56];
  undefined1 auVar180 [24];
  undefined1 auVar181 [40];
  undefined1 auVar182 [48];
  undefined1 auVar183 [56];
  long *in_RSI;
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  double dVar187;
  undefined1 auVar188 [32];
  float fVar193;
  float fVar194;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  __m128 _x_1;
  __m128 _tmp_2;
  __m128 _abs_p_2;
  __m128 mask_6;
  __m128 _p_2;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp_1;
  __m256 _abs_p_1;
  __m256 mask_3;
  __m256 _p_1;
  __m256 _zero_avx;
  __m256 _one_avx;
  __m512 _tmp;
  __m512 _abs_p;
  __mmask16 mask;
  __m512 _p;
  __m512 _zero_avx512;
  __m512 _one_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 y_1;
  __m512 z;
  __m512 tmp_1;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_1;
  __m512i imm0_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask_1;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 y_3;
  __m256 z_1;
  __m256 tmp_3;
  __m256 mask_5;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_3;
  __m256i imm0_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_4;
  __m256 one_2;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  v4sf y_5;
  v4sf z_2;
  v4sf tmp_5;
  v4sf mask_8;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_5;
  v4si emm0_1;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_7;
  v4sf one_4;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_4;
  undefined8 local_5690;
  undefined8 uStack_5688;
  undefined8 local_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 local_5650;
  undefined8 uStack_5648;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined4 uStack_5594;
  undefined4 uStack_5590;
  undefined4 uStack_558c;
  undefined4 uStack_5588;
  undefined4 uStack_5584;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 uStack_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined4 uStack_5474;
  undefined4 uStack_5470;
  undefined4 uStack_546c;
  undefined4 uStack_5468;
  undefined4 uStack_5464;
  undefined4 uStack_5460;
  undefined4 uStack_545c;
  undefined4 uStack_5458;
  undefined4 uStack_5454;
  undefined4 uStack_5450;
  undefined4 uStack_544c;
  undefined4 uStack_5448;
  undefined4 uStack_5444;
  int local_5390;
  undefined8 local_5380;
  undefined8 local_5378;
  undefined8 local_5370;
  undefined4 local_5368;
  long local_5360;
  undefined4 local_5358;
  undefined4 local_5354;
  undefined4 local_5350;
  undefined4 local_534c;
  undefined4 local_5348;
  undefined8 local_5340;
  undefined1 (*local_5338) [64];
  int local_532c;
  int local_5328;
  int local_5324;
  int local_5320;
  int local_531c;
  int local_5318;
  int local_5314;
  long *local_5308;
  undefined1 local_52f5;
  int local_52f4;
  undefined8 *local_52e8;
  undefined8 *local_52e0;
  undefined8 *local_52d0;
  undefined1 local_52c0 [64];
  undefined4 local_5244;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 uStack_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined1 (*local_51c8) [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 uStack_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 uStack_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined1 local_50c0 [64];
  undefined4 local_5044;
  undefined1 local_5040 [8];
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 uStack_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  ushort local_4f42;
  undefined1 local_4f40 [16];
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 uStack_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined2 local_4ec2;
  float local_4ec0 [2];
  float afStack_4eb8 [2];
  float afStack_4eb0 [2];
  float afStack_4ea8 [2];
  float afStack_4ea0 [2];
  float afStack_4e98 [2];
  float afStack_4e90 [2];
  float afStack_4e88 [2];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 uStack_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined1 local_4dc0 [64];
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 uStack_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 uStack_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 uStack_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  float local_4cc0 [2];
  float afStack_4cb8 [2];
  float afStack_4cb0 [2];
  float afStack_4ca8 [2];
  float afStack_4ca0 [2];
  float afStack_4c98 [2];
  float afStack_4c90 [2];
  float afStack_4c88 [2];
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [8];
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 uStack_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  ushort local_4b02;
  float local_4b00 [2];
  float afStack_4af8 [2];
  float afStack_4af0 [2];
  float afStack_4ae8 [2];
  float afStack_4ae0 [2];
  float afStack_4ad8 [2];
  float afStack_4ad0 [2];
  float afStack_4ac8 [2];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [16];
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 uStack_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 uStack_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined1 local_4980 [64];
  float local_4940 [2];
  float afStack_4938 [2];
  float afStack_4930 [2];
  float afStack_4928 [2];
  float afStack_4920 [2];
  float afStack_4918 [2];
  float afStack_4910 [2];
  float afStack_4908 [2];
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 uStack_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  float local_48c0 [2];
  float afStack_48b8 [2];
  float afStack_48b0 [2];
  float afStack_48a8 [2];
  float afStack_48a0 [2];
  float afStack_4898 [2];
  float afStack_4890 [2];
  float afStack_4888 [2];
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 uStack_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 uStack_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 uStack_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined8 uStack_47a0;
  undefined8 uStack_4798;
  undefined8 uStack_4790;
  undefined8 uStack_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 uStack_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  ushort local_4702;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 uStack_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 uStack_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 uStack_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 uStack_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  ushort local_4582;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 uStack_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 uStack_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 uStack_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined1 (*local_4450) [64];
  undefined4 local_4444;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined1 (*local_43e8) [64];
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  int local_43a0 [2];
  int aiStack_4398 [2];
  int aiStack_4390 [2];
  int aiStack_4388 [2];
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined1 local_4360 [8];
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  float local_4340;
  float fStack_433c;
  float fStack_4338;
  float fStack_4334;
  float fStack_4330;
  float fStack_432c;
  float fStack_4328;
  float fStack_4324;
  undefined1 local_4320 [32];
  undefined1 local_4300 [32];
  undefined1 local_42e0 [8];
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined1 local_42c0 [32];
  undefined4 local_42a0;
  undefined4 uStack_429c;
  undefined4 uStack_4298;
  undefined4 uStack_4294;
  undefined4 uStack_4290;
  undefined4 uStack_428c;
  undefined4 uStack_4288;
  undefined4 uStack_4284;
  undefined1 local_4280 [32];
  undefined1 local_4260 [8];
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined4 local_41a0;
  undefined4 uStack_419c;
  undefined4 uStack_4198;
  undefined4 uStack_4194;
  undefined4 uStack_4190;
  undefined4 uStack_418c;
  undefined4 uStack_4188;
  undefined4 uStack_4184;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined1 local_4000 [8];
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined1 local_3fe0 [32];
  undefined4 local_3fc0;
  undefined4 uStack_3fbc;
  undefined4 uStack_3fb8;
  undefined4 uStack_3fb4;
  undefined4 uStack_3fb0;
  undefined4 uStack_3fac;
  undefined4 uStack_3fa8;
  undefined4 uStack_3fa4;
  undefined1 local_3fa0 [32];
  undefined1 local_3f80 [32];
  undefined1 local_3f60 [8];
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined1 local_3f40 [32];
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined1 local_3e40 [32];
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined1 (*local_3d48) [64];
  undefined4 local_3d40;
  undefined4 uStack_3d3c;
  undefined4 uStack_3d38;
  undefined4 uStack_3d34;
  undefined4 local_3d24;
  undefined1 local_3d20 [16];
  undefined1 (*local_3d08) [64];
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 local_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 local_3cd0;
  undefined8 uStack_3cc8;
  int local_3cc0 [2];
  int aiStack_3cb8 [2];
  undefined8 local_3cb0;
  undefined8 uStack_3ca8;
  undefined1 local_3ca0 [8];
  undefined8 uStack_3c98;
  float local_3c90;
  float fStack_3c8c;
  float fStack_3c88;
  float fStack_3c84;
  undefined1 local_3c80 [16];
  undefined1 local_3c70 [16];
  undefined1 local_3c60 [8];
  undefined8 uStack_3c58;
  undefined1 local_3c50 [16];
  undefined4 local_3c40;
  undefined4 uStack_3c3c;
  undefined4 uStack_3c38;
  undefined4 uStack_3c34;
  undefined1 local_3c30 [16];
  undefined1 local_3c20 [8];
  undefined8 uStack_3c18;
  undefined1 local_3c10 [16];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 local_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 local_3bd0;
  undefined8 uStack_3bc8;
  undefined4 local_3bc0;
  undefined4 uStack_3bbc;
  undefined4 uStack_3bb8;
  undefined4 uStack_3bb4;
  undefined8 local_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 local_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 local_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 local_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 local_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 local_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 local_3af0;
  undefined8 uStack_3ae8;
  undefined1 local_3ae0 [16];
  undefined4 local_3ad0;
  undefined4 uStack_3acc;
  undefined4 uStack_3ac8;
  undefined4 uStack_3ac4;
  undefined1 local_3ac0 [16];
  undefined1 local_3ab0 [8];
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined1 local_3a90 [16];
  undefined1 local_3a80 [16];
  undefined8 local_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 local_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 local_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined4 local_3a10;
  undefined4 uStack_3a0c;
  undefined4 uStack_3a08;
  undefined4 uStack_3a04;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 local_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined1 local_39d0 [16];
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 local_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 local_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 local_3970;
  undefined8 uStack_3968;
  undefined1 (*local_3958) [64];
  long local_3950;
  undefined4 local_3944;
  long local_3940;
  undefined1 (*local_3938) [64];
  undefined4 local_392c;
  int local_3928;
  int local_3924;
  undefined8 *local_3920;
  undefined4 local_3914;
  long local_3910;
  undefined8 *local_38f0;
  float local_38c0 [2];
  float afStack_38b8 [2];
  float afStack_38b0 [2];
  float afStack_38a8 [2];
  float afStack_38a0 [2];
  float afStack_3898 [2];
  float afStack_3890 [2];
  float afStack_3888 [2];
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  int local_3840 [2];
  int aiStack_3838 [2];
  int aiStack_3830 [2];
  int aiStack_3828 [2];
  int aiStack_3820 [2];
  int aiStack_3818 [2];
  int aiStack_3810 [2];
  int aiStack_3808 [2];
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 uStack_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined4 local_3784;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 uStack_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  int local_3740 [2];
  int aiStack_3738 [2];
  int aiStack_3730 [2];
  int aiStack_3728 [2];
  int aiStack_3720 [2];
  int aiStack_3718 [2];
  int aiStack_3710 [2];
  int aiStack_3708 [2];
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 uStack_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined1 local_36c0 [64];
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  float local_3640 [2];
  float afStack_3638 [2];
  float afStack_3630 [2];
  float afStack_3628 [2];
  float afStack_3620 [2];
  float afStack_3618 [2];
  float afStack_3610 [2];
  float afStack_3608 [2];
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  float local_3500 [2];
  float afStack_34f8 [2];
  float afStack_34f0 [2];
  float afStack_34e8 [2];
  float afStack_34e0 [2];
  float afStack_34d8 [2];
  float afStack_34d0 [2];
  float afStack_34c8 [2];
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  ushort local_3442;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 uStack_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  float local_3400 [2];
  float afStack_33f8 [2];
  float afStack_33f0 [2];
  float afStack_33e8 [2];
  float afStack_33e0 [2];
  float afStack_33d8 [2];
  float afStack_33d0 [2];
  float afStack_33c8 [2];
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 uStack_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  float local_3380 [2];
  float afStack_3378 [2];
  float afStack_3370 [2];
  float afStack_3368 [2];
  float afStack_3360 [2];
  float afStack_3358 [2];
  float afStack_3350 [2];
  float afStack_3348 [2];
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 uStack_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  ushort local_32c2;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 uStack_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  float local_3280 [2];
  float afStack_3278 [2];
  float afStack_3270 [2];
  float afStack_3268 [2];
  float afStack_3260 [2];
  float afStack_3258 [2];
  float afStack_3250 [2];
  float afStack_3248 [2];
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 uStack_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 uStack_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 uStack_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 uStack_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 uStack_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 uStack_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 uStack_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 uStack_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  float local_2ec0 [2];
  float afStack_2eb8 [2];
  float afStack_2eb0 [2];
  float afStack_2ea8 [2];
  float afStack_2ea0 [2];
  float afStack_2e98 [2];
  float afStack_2e90 [2];
  float afStack_2e88 [2];
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  float local_2e00 [2];
  float afStack_2df8 [2];
  float afStack_2df0 [2];
  float afStack_2de8 [2];
  float afStack_2de0 [2];
  float afStack_2dd8 [2];
  float afStack_2dd0 [2];
  float afStack_2dc8 [2];
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  float local_2d40 [2];
  float afStack_2d38 [2];
  float afStack_2d30 [2];
  float afStack_2d28 [2];
  float afStack_2d20 [2];
  float afStack_2d18 [2];
  float afStack_2d10 [2];
  float afStack_2d08 [2];
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  float local_2c80 [2];
  float afStack_2c78 [2];
  float afStack_2c70 [2];
  float afStack_2c68 [2];
  float afStack_2c60 [2];
  float afStack_2c58 [2];
  float afStack_2c50 [2];
  float afStack_2c48 [2];
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  float local_2bc0 [2];
  float afStack_2bb8 [2];
  float afStack_2bb0 [2];
  float afStack_2ba8 [2];
  float afStack_2ba0 [2];
  float afStack_2b98 [2];
  float afStack_2b90 [2];
  float afStack_2b88 [2];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  float local_2b40 [2];
  float afStack_2b38 [2];
  float afStack_2b30 [2];
  float afStack_2b28 [2];
  float afStack_2b20 [2];
  float afStack_2b18 [2];
  float afStack_2b10 [2];
  float afStack_2b08 [2];
  float local_2b00 [2];
  float afStack_2af8 [2];
  float afStack_2af0 [2];
  float afStack_2ae8 [2];
  float afStack_2ae0 [2];
  float afStack_2ad8 [2];
  float afStack_2ad0 [2];
  float afStack_2ac8 [2];
  float local_2ac0 [2];
  float afStack_2ab8 [2];
  float afStack_2ab0 [2];
  float afStack_2aa8 [2];
  float afStack_2aa0 [2];
  float afStack_2a98 [2];
  float afStack_2a90 [2];
  float afStack_2a88 [2];
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  float local_2a00 [2];
  float afStack_29f8 [2];
  float afStack_29f0 [2];
  float afStack_29e8 [2];
  float afStack_29e0 [2];
  float afStack_29d8 [2];
  float afStack_29d0 [2];
  float afStack_29c8 [2];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  float local_2940 [2];
  float afStack_2938 [2];
  float afStack_2930 [2];
  float afStack_2928 [2];
  float afStack_2920 [2];
  float afStack_2918 [2];
  float afStack_2910 [2];
  float afStack_2908 [2];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  float local_28c0 [2];
  float afStack_28b8 [2];
  float afStack_28b0 [2];
  float afStack_28a8 [2];
  float afStack_28a0 [2];
  float afStack_2898 [2];
  float afStack_2890 [2];
  float afStack_2888 [2];
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  float local_2800 [2];
  float afStack_27f8 [2];
  float afStack_27f0 [2];
  float afStack_27e8 [2];
  float afStack_27e0 [2];
  float afStack_27d8 [2];
  float afStack_27d0 [2];
  float afStack_27c8 [2];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  float local_2740 [2];
  float afStack_2738 [2];
  float afStack_2730 [2];
  float afStack_2728 [2];
  float afStack_2720 [2];
  float afStack_2718 [2];
  float afStack_2710 [2];
  float afStack_2708 [2];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  float local_2680 [2];
  float afStack_2678 [2];
  float afStack_2670 [2];
  float afStack_2668 [2];
  float afStack_2660 [2];
  float afStack_2658 [2];
  float afStack_2650 [2];
  float afStack_2648 [2];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  float local_25c0 [2];
  float afStack_25b8 [2];
  float afStack_25b0 [2];
  float afStack_25a8 [2];
  float afStack_25a0 [2];
  float afStack_2598 [2];
  float afStack_2590 [2];
  float afStack_2588 [2];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  float local_2440 [2];
  float afStack_2438 [2];
  float afStack_2430 [2];
  float afStack_2428 [2];
  float afStack_2420 [2];
  float afStack_2418 [2];
  float afStack_2410 [2];
  float afStack_2408 [2];
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  float local_2380 [2];
  float afStack_2378 [2];
  float afStack_2370 [2];
  float afStack_2368 [2];
  float afStack_2360 [2];
  float afStack_2358 [2];
  float afStack_2350 [2];
  float afStack_2348 [2];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  float local_2300 [2];
  float afStack_22f8 [2];
  float afStack_22f0 [2];
  float afStack_22e8 [2];
  float afStack_22e0 [2];
  float afStack_22d8 [2];
  float afStack_22d0 [2];
  float afStack_22c8 [2];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280 [2];
  float afStack_2278 [2];
  float afStack_2270 [2];
  float afStack_2268 [2];
  float afStack_2260 [2];
  float afStack_2258 [2];
  float afStack_2250 [2];
  float afStack_2248 [2];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  float local_21c0 [2];
  float afStack_21b8 [2];
  float afStack_21b0 [2];
  float afStack_21a8 [2];
  float afStack_21a0 [2];
  float afStack_2198 [2];
  float afStack_2190 [2];
  float afStack_2188 [2];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  float local_2100 [2];
  float afStack_20f8 [2];
  float afStack_20f0 [2];
  float afStack_20e8 [2];
  float afStack_20e0 [2];
  float afStack_20d8 [2];
  float afStack_20d0 [2];
  float afStack_20c8 [2];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined2 local_2042;
  float local_2040 [2];
  float afStack_2038 [2];
  float afStack_2030 [2];
  float afStack_2028 [2];
  float afStack_2020 [2];
  float afStack_2018 [2];
  float afStack_2010 [2];
  float afStack_2008 [2];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined4 local_1ec4;
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [16];
  undefined1 auStack_1e30 [16];
  undefined4 local_1e20;
  undefined4 local_1e1c;
  undefined4 local_1e18;
  undefined4 local_1e14;
  undefined4 local_1e10;
  undefined4 local_1e0c;
  undefined4 local_1e08;
  undefined4 local_1e04;
  undefined4 local_1e00;
  undefined4 uStack_1dfc;
  undefined4 uStack_1df8;
  undefined4 uStack_1df4;
  undefined4 uStack_1df0;
  undefined4 uStack_1dec;
  undefined4 uStack_1de8;
  undefined4 uStack_1de4;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined4 local_1dc0;
  undefined4 uStack_1dbc;
  undefined4 uStack_1db8;
  undefined4 uStack_1db4;
  undefined4 uStack_1db0;
  undefined4 uStack_1dac;
  undefined4 uStack_1da8;
  undefined4 uStack_1da4;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined4 local_1d64;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined4 local_1ce0;
  undefined4 uStack_1cdc;
  undefined4 uStack_1cd8;
  undefined4 uStack_1cd4;
  undefined4 uStack_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  ulong uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined4 local_1aa0;
  undefined4 uStack_1a9c;
  undefined4 uStack_1a98;
  undefined4 uStack_1a94;
  undefined4 uStack_1a90;
  undefined4 uStack_1a8c;
  undefined4 uStack_1a88;
  undefined4 uStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined4 local_1a40;
  undefined4 uStack_1a3c;
  undefined4 uStack_1a38;
  undefined4 uStack_1a34;
  undefined4 uStack_1a30;
  undefined4 uStack_1a2c;
  undefined4 uStack_1a28;
  undefined4 uStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined4 local_19e0;
  undefined4 uStack_19dc;
  undefined4 uStack_19d8;
  undefined4 uStack_19d4;
  undefined4 uStack_19d0;
  undefined4 uStack_19cc;
  undefined4 uStack_19c8;
  undefined4 uStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined4 uStack_1970;
  undefined4 uStack_196c;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined4 local_1920;
  undefined4 uStack_191c;
  undefined4 uStack_1918;
  undefined4 uStack_1914;
  undefined4 uStack_1910;
  undefined4 uStack_190c;
  undefined4 uStack_1908;
  undefined4 uStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined4 uStack_18b0;
  undefined4 uStack_18ac;
  undefined4 uStack_18a8;
  undefined4 uStack_18a4;
  undefined4 local_18a0;
  undefined4 uStack_189c;
  undefined4 uStack_1898;
  undefined4 uStack_1894;
  undefined4 uStack_1890;
  undefined4 uStack_188c;
  undefined4 uStack_1888;
  undefined4 uStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined4 local_1840;
  undefined4 uStack_183c;
  undefined4 uStack_1838;
  undefined4 uStack_1834;
  undefined4 uStack_1830;
  undefined4 uStack_182c;
  undefined4 uStack_1828;
  undefined4 uStack_1824;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  ulong uStack_17e8;
  undefined4 local_17e0;
  undefined4 uStack_17dc;
  undefined4 uStack_17d8;
  undefined4 uStack_17d4;
  undefined4 uStack_17d0;
  undefined4 uStack_17cc;
  undefined4 uStack_17c8;
  undefined4 uStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined4 local_17a0;
  undefined4 uStack_179c;
  undefined4 uStack_1798;
  undefined4 uStack_1794;
  undefined4 uStack_1790;
  undefined4 uStack_178c;
  undefined4 uStack_1788;
  undefined4 uStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined4 local_1740;
  undefined4 uStack_173c;
  undefined4 uStack_1738;
  undefined4 uStack_1734;
  undefined4 uStack_1730;
  undefined4 uStack_172c;
  undefined4 uStack_1728;
  undefined4 uStack_1724;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined4 local_16e0;
  undefined4 uStack_16dc;
  undefined4 uStack_16d8;
  undefined4 uStack_16d4;
  undefined4 uStack_16d0;
  undefined4 uStack_16cc;
  undefined4 uStack_16c8;
  undefined4 uStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined4 local_1680;
  undefined4 uStack_167c;
  undefined4 uStack_1678;
  undefined4 uStack_1674;
  undefined4 uStack_1670;
  undefined4 uStack_166c;
  undefined4 uStack_1668;
  undefined4 uStack_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined4 local_1620;
  undefined4 uStack_161c;
  undefined4 uStack_1618;
  undefined4 uStack_1614;
  undefined4 uStack_1610;
  undefined4 uStack_160c;
  undefined4 uStack_1608;
  undefined4 uStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined4 uStack_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined4 local_1560;
  undefined4 uStack_155c;
  undefined4 uStack_1558;
  undefined4 uStack_1554;
  undefined4 uStack_1550;
  undefined4 uStack_154c;
  undefined4 uStack_1548;
  undefined4 uStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined4 local_1500;
  undefined4 uStack_14fc;
  undefined4 uStack_14f8;
  undefined4 uStack_14f4;
  undefined4 uStack_14f0;
  undefined4 uStack_14ec;
  undefined4 uStack_14e8;
  undefined4 uStack_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined4 local_1480;
  undefined4 uStack_147c;
  undefined4 uStack_1478;
  undefined4 uStack_1474;
  undefined4 uStack_1470;
  undefined4 uStack_146c;
  undefined4 uStack_1468;
  undefined4 uStack_1464;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined4 local_1420;
  undefined4 uStack_141c;
  undefined4 uStack_1418;
  undefined4 uStack_1414;
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined4 local_13c0;
  undefined4 uStack_13bc;
  undefined4 uStack_13b8;
  undefined4 uStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined4 local_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  ulong uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined4 local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined4 local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined4 local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined4 local_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined4 local_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined4 local_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined4 local_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined4 local_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined4 local_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 auVar191 [24];
  undefined1 auVar192 [32];
  
  local_5314 = *(int *)((long)in_RSI + 0x2c);
  local_5318 = (int)in_RSI[6];
  local_531c = *(int *)((long)in_RSI + 0x34);
  local_5320 = (int)in_RSI[7];
  local_5324 = (int)in_RSI[3];
  local_5328 = local_5314 * local_5318 * local_531c * local_5324;
  local_5308 = in_RSI;
  for (local_532c = 0; local_532c < local_5320; local_532c = local_532c + 1) {
    local_52e8 = &local_5380;
    local_3924 = *(int *)((long)local_5308 + 0x2c);
    local_3928 = (int)local_5308[6];
    local_392c = *(undefined4 *)((long)local_5308 + 0x34);
    local_3938 = (undefined1 (*) [64])
                 (*local_5308 + local_5308[8] * (long)local_532c * local_5308[2]);
    local_3940 = local_5308[2];
    local_3944 = (undefined4)local_5308[3];
    local_3950 = local_5308[4];
    local_3920 = &local_5380;
    local_3910 = (long)local_3924 * (long)local_3928 * local_3940;
    local_52e0 = &local_5380;
    local_52d0 = &local_5380;
    local_3914 = 0x10;
    local_52f4 = local_532c;
    local_52f5 = 1;
    local_5380 = 0;
    local_5370 = 0;
    local_5368 = 0;
    local_5358 = 0;
    local_5354 = 0;
    local_5350 = 0;
    local_534c = 0;
    local_5348 = 0;
    local_5340 = 0;
    local_5378 = 0;
    local_5390 = 0;
    local_5244 = 0x3f800000;
    local_52c0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_5240 = 0;
    uStack_5238 = 0;
    uStack_5230 = 0;
    uStack_5228 = 0;
    uStack_5220 = 0;
    uStack_5218 = 0;
    uStack_5210 = 0;
    uStack_5208 = 0;
    local_5338 = local_3938;
    for (; local_5390 + 0xf < local_5328; local_5390 = local_5390 + 0x10) {
      local_51c8 = local_5338;
      local_5140 = *(undefined8 *)*local_5338;
      uStack_5138 = *(undefined8 *)(*local_5338 + 8);
      uStack_5130 = *(undefined8 *)(*local_5338 + 0x10);
      uStack_5128 = *(undefined8 *)(*local_5338 + 0x18);
      uStack_5120 = *(undefined8 *)(*local_5338 + 0x20);
      uStack_5118 = *(undefined8 *)(*local_5338 + 0x28);
      uStack_5110 = *(undefined8 *)(*local_5338 + 0x30);
      uStack_5108 = *(undefined8 *)(*local_5338 + 0x38);
      uStack_5474 = (undefined4)((ulong)uStack_5138 >> 0x20);
      uStack_5470 = (undefined4)uStack_5130;
      uStack_546c = (undefined4)((ulong)uStack_5130 >> 0x20);
      uStack_5468 = (undefined4)uStack_5128;
      uStack_5464 = (undefined4)((ulong)uStack_5128 >> 0x20);
      uStack_5460 = (undefined4)uStack_5120;
      uStack_545c = (undefined4)((ulong)uStack_5120 >> 0x20);
      uStack_5458 = (undefined4)uStack_5118;
      uStack_5454 = (undefined4)((ulong)uStack_5118 >> 0x20);
      uStack_5450 = (undefined4)uStack_5110;
      uStack_544c = (undefined4)((ulong)uStack_5110 >> 0x20);
      uStack_5448 = (undefined4)uStack_5108;
      uStack_5444 = (undefined4)((ulong)uStack_5108 >> 0x20);
      auVar184._12_4_ = uStack_5474;
      auVar184._0_12_ = *(undefined1 (*) [12])*local_5338;
      auVar184._16_4_ = uStack_5470;
      auVar184._20_4_ = uStack_546c;
      auVar184._24_4_ = uStack_5468;
      auVar184._28_4_ = uStack_5464;
      auVar184._32_4_ = uStack_5460;
      auVar184._36_4_ = uStack_545c;
      auVar184._40_4_ = uStack_5458;
      auVar184._44_4_ = uStack_5454;
      auVar184._48_4_ = uStack_5450;
      auVar184._52_4_ = uStack_544c;
      auVar184._56_4_ = uStack_5448;
      auVar184._60_4_ = uStack_5444;
      uVar22 = vcmpps_avx512f(ZEXT1664(ZEXT816(0)),auVar184,1);
      local_4582 = (ushort)uVar22;
      local_5044 = 0x7fffffff;
      auVar184 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_50c0 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(local_50c0);
      local_5180 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(*local_5338);
      auVar185 = vmovdqa64_avx512f(local_5180);
      auVar184 = vpandq_avx512f(auVar184,auVar185);
      local_51c0 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(local_51c0);
      auVar184 = vmovdqa64_avx512f(auVar184);
      local_4c00 = local_52c0._0_8_;
      uStack_4bf8 = local_52c0._8_8_;
      uStack_4bf0 = local_52c0._16_8_;
      uStack_4be8 = local_52c0._24_8_;
      uStack_4be0 = local_52c0._32_8_;
      uStack_4bd8 = local_52c0._40_8_;
      uStack_4bd0 = local_52c0._48_8_;
      uStack_4bc8 = local_52c0._56_8_;
      local_4800 = 0;
      uStack_47f8 = 0;
      uStack_47f0 = 0;
      uStack_47e8 = 0;
      uStack_47e0 = 0;
      uStack_47d8 = 0;
      uStack_47d0 = 0;
      uStack_47c8 = 0;
      local_5500 = auVar184._0_8_;
      local_4840 = local_5500;
      uStack_54f8 = auVar184._8_8_;
      uStack_4838 = uStack_54f8;
      uStack_54f0 = auVar184._16_8_;
      uStack_4830 = uStack_54f0;
      uStack_54e8 = auVar184._24_8_;
      uStack_4828 = uStack_54e8;
      uStack_54e0 = auVar184._32_8_;
      uStack_4820 = uStack_54e0;
      uStack_54d8 = auVar184._40_8_;
      uStack_4818 = uStack_54d8;
      uStack_54d0 = auVar184._48_8_;
      uStack_4810 = uStack_54d0;
      uStack_54c8 = auVar184._56_8_;
      uStack_4808 = uStack_54c8;
      auVar184 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),auVar184);
      local_49c0 = 0;
      uStack_49b8 = 0;
      uStack_49b0 = 0;
      uStack_49a8 = 0;
      uStack_49a0 = 0;
      uStack_4998 = 0;
      uStack_4990 = 0;
      uStack_4988 = 0;
      local_4b00[0] = 1.0;
      local_4b00[1] = 1.0;
      afStack_4af8[0] = 1.0;
      afStack_4af8[1] = 1.0;
      afStack_4af0[0] = 1.0;
      afStack_4af0[1] = 1.0;
      afStack_4ae8[0] = 1.0;
      afStack_4ae8[1] = 1.0;
      afStack_4ae0[0] = 1.0;
      afStack_4ae0[1] = 1.0;
      afStack_4ad8[0] = 1.0;
      afStack_4ad8[1] = 1.0;
      afStack_4ad0[0] = 1.0;
      afStack_4ad0[1] = 1.0;
      afStack_4ac8[0] = 1.0;
      afStack_4ac8[1] = 1.0;
      local_4a00._0_8_ = auVar184._0_8_;
      local_2000 = local_4a00._0_8_;
      local_4a00._8_8_ = auVar184._8_8_;
      uStack_1ff8 = local_4a00._8_8_;
      local_4a00._16_8_ = auVar184._16_8_;
      uStack_1ff0 = local_4a00._16_8_;
      local_4a00._24_8_ = auVar184._24_8_;
      uStack_1fe8 = local_4a00._24_8_;
      local_4a00._32_8_ = auVar184._32_8_;
      uStack_1fe0 = local_4a00._32_8_;
      local_4a00._40_8_ = auVar184._40_8_;
      uStack_1fd8 = local_4a00._40_8_;
      local_4a00._48_8_ = auVar184._48_8_;
      uStack_1fd0 = local_4a00._48_8_;
      local_4a00._56_8_ = auVar184._56_8_;
      uStack_1fc8 = local_4a00._56_8_;
      local_2040[0] = 88.37626;
      local_2040[1] = 88.37626;
      afStack_2038[0] = 88.37626;
      afStack_2038[1] = 88.37626;
      afStack_2030[0] = 88.37626;
      afStack_2030[1] = 88.37626;
      afStack_2028[0] = 88.37626;
      afStack_2028[1] = 88.37626;
      afStack_2020[0] = 88.37626;
      afStack_2020[1] = 88.37626;
      afStack_2018[0] = 88.37626;
      afStack_2018[1] = 88.37626;
      afStack_2010[0] = 88.37626;
      afStack_2010[1] = 88.37626;
      afStack_2008[0] = 88.37626;
      afStack_2008[1] = 88.37626;
      auVar91._8_4_ = 88.37626;
      auVar91._12_4_ = 88.37626;
      auVar91._0_4_ = 88.37626;
      auVar91._4_4_ = 88.37626;
      auVar91._16_4_ = 88.37626;
      auVar91._20_4_ = 88.37626;
      auVar91._24_4_ = 88.37626;
      auVar91._28_4_ = 88.37626;
      auVar91._32_4_ = 88.37626;
      auVar91._36_4_ = 88.37626;
      auVar91._40_4_ = 88.37626;
      auVar91._44_4_ = 88.37626;
      auVar91._48_4_ = 88.37626;
      auVar91._52_4_ = 88.37626;
      auVar91._56_4_ = 88.37626;
      auVar91._60_4_ = 88.37626;
      auVar184 = vminps_avx512f(auVar184,auVar91);
      local_4a00._0_8_ = auVar184._0_8_;
      local_3880 = local_4a00._0_8_;
      local_4a00._8_8_ = auVar184._8_8_;
      uStack_3878 = local_4a00._8_8_;
      local_4a00._16_8_ = auVar184._16_8_;
      uStack_3870 = local_4a00._16_8_;
      local_4a00._24_8_ = auVar184._24_8_;
      uStack_3868 = local_4a00._24_8_;
      local_4a00._32_8_ = auVar184._32_8_;
      uStack_3860 = local_4a00._32_8_;
      local_4a00._40_8_ = auVar184._40_8_;
      uStack_3858 = local_4a00._40_8_;
      local_4a00._48_8_ = auVar184._48_8_;
      uStack_3850 = local_4a00._48_8_;
      local_4a00._56_8_ = auVar184._56_8_;
      uStack_3848 = local_4a00._56_8_;
      local_38c0[0] = -88.37626;
      local_38c0[1] = -88.37626;
      afStack_38b8[0] = -88.37626;
      afStack_38b8[1] = -88.37626;
      afStack_38b0[0] = -88.37626;
      afStack_38b0[1] = -88.37626;
      afStack_38a8[0] = -88.37626;
      afStack_38a8[1] = -88.37626;
      afStack_38a0[0] = -88.37626;
      afStack_38a0[1] = -88.37626;
      afStack_3898[0] = -88.37626;
      afStack_3898[1] = -88.37626;
      afStack_3890[0] = -88.37626;
      afStack_3890[1] = -88.37626;
      afStack_3888[0] = -88.37626;
      afStack_3888[1] = -88.37626;
      auVar48._8_4_ = -88.37626;
      auVar48._12_4_ = -88.37626;
      auVar48._0_4_ = -88.37626;
      auVar48._4_4_ = -88.37626;
      auVar48._16_4_ = -88.37626;
      auVar48._20_4_ = -88.37626;
      auVar48._24_4_ = -88.37626;
      auVar48._28_4_ = -88.37626;
      auVar48._32_4_ = -88.37626;
      auVar48._36_4_ = -88.37626;
      auVar48._40_4_ = -88.37626;
      auVar48._44_4_ = -88.37626;
      auVar48._48_4_ = -88.37626;
      auVar48._52_4_ = -88.37626;
      auVar48._56_4_ = -88.37626;
      auVar48._60_4_ = -88.37626;
      auVar184 = vmaxps_avx512f(auVar184,auVar48);
      local_4a00._0_8_ = auVar184._0_8_;
      local_2a80 = local_4a00._0_8_;
      local_4a00._8_8_ = auVar184._8_8_;
      uStack_2a78 = local_4a00._8_8_;
      local_4a00._16_8_ = auVar184._16_8_;
      uStack_2a70 = local_4a00._16_8_;
      local_4a00._24_8_ = auVar184._24_8_;
      uStack_2a68 = local_4a00._24_8_;
      local_4a00._32_8_ = auVar184._32_8_;
      uStack_2a60 = local_4a00._32_8_;
      local_4a00._40_8_ = auVar184._40_8_;
      uStack_2a58 = local_4a00._40_8_;
      local_4a00._48_8_ = auVar184._48_8_;
      uStack_2a50 = local_4a00._48_8_;
      local_4a00._56_8_ = auVar184._56_8_;
      uStack_2a48 = local_4a00._56_8_;
      local_2ac0[0] = 1.442695;
      local_2ac0[1] = 1.442695;
      afStack_2ab8[0] = 1.442695;
      afStack_2ab8[1] = 1.442695;
      afStack_2ab0[0] = 1.442695;
      afStack_2ab0[1] = 1.442695;
      afStack_2aa8[0] = 1.442695;
      afStack_2aa8[1] = 1.442695;
      afStack_2aa0[0] = 1.442695;
      afStack_2aa0[1] = 1.442695;
      afStack_2a98[0] = 1.442695;
      afStack_2a98[1] = 1.442695;
      afStack_2a90[0] = 1.442695;
      afStack_2a90[1] = 1.442695;
      afStack_2a88[0] = 1.442695;
      afStack_2a88[1] = 1.442695;
      local_2b00[0] = 0.5;
      local_2b00[1] = 0.5;
      afStack_2af8[0] = 0.5;
      afStack_2af8[1] = 0.5;
      afStack_2af0[0] = 0.5;
      afStack_2af0[1] = 0.5;
      afStack_2ae8[0] = 0.5;
      afStack_2ae8[1] = 0.5;
      afStack_2ae0[0] = 0.5;
      afStack_2ae0[1] = 0.5;
      afStack_2ad8[0] = 0.5;
      afStack_2ad8[1] = 0.5;
      afStack_2ad0[0] = 0.5;
      afStack_2ad0[1] = 0.5;
      afStack_2ac8[0] = 0.5;
      afStack_2ac8[1] = 0.5;
      auVar64._8_4_ = 1.442695;
      auVar64._12_4_ = 1.442695;
      auVar64._0_4_ = 1.442695;
      auVar64._4_4_ = 1.442695;
      auVar64._16_4_ = 1.442695;
      auVar64._20_4_ = 1.442695;
      auVar64._24_4_ = 1.442695;
      auVar64._28_4_ = 1.442695;
      auVar64._32_4_ = 1.442695;
      auVar64._36_4_ = 1.442695;
      auVar64._40_4_ = 1.442695;
      auVar64._44_4_ = 1.442695;
      auVar64._48_4_ = 1.442695;
      auVar64._52_4_ = 1.442695;
      auVar64._56_4_ = 1.442695;
      auVar64._60_4_ = 1.442695;
      auVar63._8_4_ = 0.5;
      auVar63._12_4_ = 0.5;
      auVar63._0_4_ = 0.5;
      auVar63._4_4_ = 0.5;
      auVar63._16_4_ = 0.5;
      auVar63._20_4_ = 0.5;
      auVar63._24_4_ = 0.5;
      auVar63._28_4_ = 0.5;
      auVar63._32_4_ = 0.5;
      auVar63._36_4_ = 0.5;
      auVar63._40_4_ = 0.5;
      auVar63._44_4_ = 0.5;
      auVar63._48_4_ = 0.5;
      auVar63._52_4_ = 0.5;
      auVar63._56_4_ = 0.5;
      auVar63._60_4_ = 0.5;
      auVar185 = vfmadd213ps_avx512f(auVar64,auVar184,auVar63);
      auVar186 = vrndscaleps_avx512f(auVar185,1);
      uVar23 = vcmpps_avx512f(auVar185,auVar186,1);
      local_4b02 = (ushort)uVar23;
      local_4a40._0_8_ = auVar186._0_8_;
      local_34c0 = local_4a40._0_8_;
      local_4a40._8_8_ = auVar186._8_8_;
      uStack_34b8 = local_4a40._8_8_;
      local_4a40._16_8_ = auVar186._16_8_;
      uStack_34b0 = local_4a40._16_8_;
      local_4a40._24_8_ = auVar186._24_8_;
      uStack_34a8 = local_4a40._24_8_;
      local_4a40._32_8_ = auVar186._32_8_;
      uStack_34a0 = local_4a40._32_8_;
      local_4a40._40_8_ = auVar186._40_8_;
      uStack_3498 = local_4a40._40_8_;
      local_4a40._48_8_ = auVar186._48_8_;
      uStack_3490 = local_4a40._48_8_;
      local_4a40._56_8_ = auVar186._56_8_;
      uStack_3488 = local_4a40._56_8_;
      local_3500[0] = 1.0;
      local_3500[1] = 1.0;
      afStack_34f8[0] = 1.0;
      afStack_34f8[1] = 1.0;
      afStack_34f0[0] = 1.0;
      afStack_34f0[1] = 1.0;
      afStack_34e8[0] = 1.0;
      afStack_34e8[1] = 1.0;
      afStack_34e0[0] = 1.0;
      afStack_34e0[1] = 1.0;
      afStack_34d8[0] = 1.0;
      afStack_34d8[1] = 1.0;
      afStack_34d0[0] = 1.0;
      afStack_34d0[1] = 1.0;
      afStack_34c8[0] = 1.0;
      afStack_34c8[1] = 1.0;
      local_33c0 = local_4a40._0_8_;
      uStack_33b8 = local_4a40._8_8_;
      uStack_33b0 = local_4a40._16_8_;
      uStack_33a8 = local_4a40._24_8_;
      uStack_33a0 = local_4a40._32_8_;
      uStack_3398 = local_4a40._40_8_;
      uStack_3390 = local_4a40._48_8_;
      uStack_3388 = local_4a40._56_8_;
      local_3400[0] = 1.0;
      local_3400[1] = 1.0;
      afStack_33f8[0] = 1.0;
      afStack_33f8[1] = 1.0;
      afStack_33f0[0] = 1.0;
      afStack_33f0[1] = 1.0;
      afStack_33e8[0] = 1.0;
      afStack_33e8[1] = 1.0;
      afStack_33e0[0] = 1.0;
      afStack_33e0[1] = 1.0;
      afStack_33d8[0] = 1.0;
      afStack_33d8[1] = 1.0;
      afStack_33d0[0] = 1.0;
      afStack_33d0[1] = 1.0;
      afStack_33c8[0] = 1.0;
      afStack_33c8[1] = 1.0;
      auVar52._8_4_ = 1.0;
      auVar52._12_4_ = 1.0;
      auVar52._0_4_ = 1.0;
      auVar52._4_4_ = 1.0;
      auVar52._16_4_ = 1.0;
      auVar52._20_4_ = 1.0;
      auVar52._24_4_ = 1.0;
      auVar52._28_4_ = 1.0;
      auVar52._32_4_ = 1.0;
      auVar52._36_4_ = 1.0;
      auVar52._40_4_ = 1.0;
      auVar52._44_4_ = 1.0;
      auVar52._48_4_ = 1.0;
      auVar52._52_4_ = 1.0;
      auVar52._56_4_ = 1.0;
      auVar52._60_4_ = 1.0;
      local_3440._0_4_ = auVar186._0_4_;
      local_3440._4_4_ = auVar186._4_4_;
      uStack_3438._0_4_ = auVar186._8_4_;
      uStack_3438._4_4_ = auVar186._12_4_;
      uStack_3430._0_4_ = auVar186._16_4_;
      uStack_3430._4_4_ = auVar186._20_4_;
      uStack_3428._0_4_ = auVar186._24_4_;
      uStack_3428._4_4_ = auVar186._28_4_;
      uStack_3420._0_4_ = auVar186._32_4_;
      uStack_3420._4_4_ = auVar186._36_4_;
      uStack_3418._0_4_ = auVar186._40_4_;
      uStack_3418._4_4_ = auVar186._44_4_;
      uStack_3410._0_4_ = auVar186._48_4_;
      uStack_3410._4_4_ = auVar186._52_4_;
      uStack_3408._0_4_ = auVar186._56_4_;
      uStack_3408._4_4_ = auVar186._60_4_;
      auVar185 = vsubps_avx512f(auVar186,auVar52);
      bVar1 = (bool)((byte)uVar23 & 1);
      bVar2 = (bool)((byte)(local_4b02 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4b02 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4b02 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4b02 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4b02 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4b02 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4b02 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar23 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4a80._4_4_ = (uint)bVar2 * auVar185._4_4_ | (uint)!bVar2 * local_3440._4_4_;
      local_4a80._0_4_ = (uint)bVar1 * auVar185._0_4_ | (uint)!bVar1 * (int)local_3440;
      local_4a80._8_4_ = (uint)bVar3 * auVar185._8_4_ | (uint)!bVar3 * (int)uStack_3438;
      local_4a80._12_4_ = (uint)bVar4 * auVar185._12_4_ | (uint)!bVar4 * uStack_3438._4_4_;
      uStack_4a70._0_4_ = (uint)bVar5 * auVar185._16_4_ | (uint)!bVar5 * (int)uStack_3430;
      uStack_4a70._4_4_ = (uint)bVar6 * auVar185._20_4_ | (uint)!bVar6 * uStack_3430._4_4_;
      auVar191 = _local_4a80;
      uStack_4a68._0_4_ = (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * (int)uStack_3428;
      uStack_4a68._4_4_ = (uint)bVar8 * auVar185._28_4_ | (uint)!bVar8 * uStack_3428._4_4_;
      auVar16 = _local_4a80;
      uStack_4a60._0_4_ =
           (uint)(bVar9 & 1) * auVar185._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_3420;
      uStack_4a60._4_4_ = (uint)bVar10 * auVar185._36_4_ | (uint)!bVar10 * uStack_3420._4_4_;
      auVar177 = _local_4a80;
      uStack_4a58._0_4_ = (uint)bVar11 * auVar185._40_4_ | (uint)!bVar11 * (int)uStack_3418;
      uStack_4a58._4_4_ = (uint)bVar12 * auVar185._44_4_ | (uint)!bVar12 * uStack_3418._4_4_;
      auVar178 = _local_4a80;
      uStack_4a50._0_4_ = (uint)bVar13 * auVar185._48_4_ | (uint)!bVar13 * (int)uStack_3410;
      uStack_4a50._4_4_ = (uint)bVar14 * auVar185._52_4_ | (uint)!bVar14 * uStack_3410._4_4_;
      auVar179 = _local_4a80;
      uStack_4a48._0_4_ = (uint)bVar15 * auVar185._56_4_ | (uint)!bVar15 * (int)uStack_3408;
      uStack_4a48._4_4_ =
           (uint)(bVar9 >> 7) * auVar185._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_3408._4_4_;
      auVar48 = _local_4a80;
      local_2180 = local_4a80._0_8_;
      uStack_2178 = local_4a80._8_8_;
      uStack_4a70 = auVar191._16_8_;
      uStack_2170 = uStack_4a70;
      uStack_4a68 = auVar16._24_8_;
      uStack_2168 = uStack_4a68;
      uStack_4a60 = auVar177._32_8_;
      uStack_2160 = uStack_4a60;
      uStack_4a58 = auVar178._40_8_;
      uStack_2158 = uStack_4a58;
      uStack_4a50 = auVar179._48_8_;
      uStack_2150 = uStack_4a50;
      uStack_4a48 = auVar48._56_8_;
      uStack_2148 = uStack_4a48;
      local_21c0[0] = 0.6933594;
      local_21c0[1] = 0.6933594;
      afStack_21b8[0] = 0.6933594;
      afStack_21b8[1] = 0.6933594;
      afStack_21b0[0] = 0.6933594;
      afStack_21b0[1] = 0.6933594;
      afStack_21a8[0] = 0.6933594;
      afStack_21a8[1] = 0.6933594;
      afStack_21a0[0] = 0.6933594;
      afStack_21a0[1] = 0.6933594;
      afStack_2198[0] = 0.6933594;
      afStack_2198[1] = 0.6933594;
      afStack_2190[0] = 0.6933594;
      afStack_2190[1] = 0.6933594;
      afStack_2188[0] = 0.6933594;
      afStack_2188[1] = 0.6933594;
      local_2200 = local_4a00._0_8_;
      uStack_21f8 = local_4a00._8_8_;
      uStack_21f0 = local_4a00._16_8_;
      uStack_21e8 = local_4a00._24_8_;
      uStack_21e0 = local_4a00._32_8_;
      uStack_21d8 = local_4a00._40_8_;
      uStack_21d0 = local_4a00._48_8_;
      uStack_21c8 = local_4a00._56_8_;
      auVar89._16_8_ = uStack_4a70;
      auVar89._0_16_ = local_4a80;
      auVar89._24_8_ = uStack_4a68;
      auVar89._32_8_ = uStack_4a60;
      auVar89._40_8_ = uStack_4a58;
      auVar89._48_8_ = uStack_4a50;
      auVar89._56_8_ = uStack_4a48;
      auVar88._8_4_ = 0.6933594;
      auVar88._12_4_ = 0.6933594;
      auVar88._0_4_ = 0.6933594;
      auVar88._4_4_ = 0.6933594;
      auVar88._16_4_ = 0.6933594;
      auVar88._20_4_ = 0.6933594;
      auVar88._24_4_ = 0.6933594;
      auVar88._28_4_ = 0.6933594;
      auVar88._32_4_ = 0.6933594;
      auVar88._36_4_ = 0.6933594;
      auVar88._40_4_ = 0.6933594;
      auVar88._44_4_ = 0.6933594;
      auVar88._48_4_ = 0.6933594;
      auVar88._52_4_ = 0.6933594;
      auVar88._56_4_ = 0.6933594;
      auVar88._60_4_ = 0.6933594;
      auVar184 = vfnmadd213ps_avx512f(auVar88,auVar89,auVar184);
      local_2240 = local_4a80._0_8_;
      uStack_2238 = local_4a80._8_8_;
      uStack_2230 = uStack_4a70;
      uStack_2228 = uStack_4a68;
      uStack_2220 = uStack_4a60;
      uStack_2218 = uStack_4a58;
      uStack_2210 = uStack_4a50;
      uStack_2208 = uStack_4a48;
      local_2280[0] = -0.00021219444;
      local_2280[1] = -0.00021219444;
      afStack_2278[0] = -0.00021219444;
      afStack_2278[1] = -0.00021219444;
      afStack_2270[0] = -0.00021219444;
      afStack_2270[1] = -0.00021219444;
      afStack_2268[0] = -0.00021219444;
      afStack_2268[1] = -0.00021219444;
      afStack_2260[0] = -0.00021219444;
      afStack_2260[1] = -0.00021219444;
      afStack_2258[0] = -0.00021219444;
      afStack_2258[1] = -0.00021219444;
      afStack_2250[0] = -0.00021219444;
      afStack_2250[1] = -0.00021219444;
      afStack_2248[0] = -0.00021219444;
      afStack_2248[1] = -0.00021219444;
      local_4a00._0_8_ = auVar184._0_8_;
      local_22c0 = local_4a00._0_8_;
      local_4a00._8_8_ = auVar184._8_8_;
      uStack_22b8 = local_4a00._8_8_;
      local_4a00._16_8_ = auVar184._16_8_;
      uStack_22b0 = local_4a00._16_8_;
      local_4a00._24_8_ = auVar184._24_8_;
      uStack_22a8 = local_4a00._24_8_;
      local_4a00._32_8_ = auVar184._32_8_;
      uStack_22a0 = local_4a00._32_8_;
      local_4a00._40_8_ = auVar184._40_8_;
      uStack_2298 = local_4a00._40_8_;
      local_4a00._48_8_ = auVar184._48_8_;
      uStack_2290 = local_4a00._48_8_;
      local_4a00._56_8_ = auVar184._56_8_;
      uStack_2288 = local_4a00._56_8_;
      auVar87._16_8_ = uStack_4a70;
      auVar87._0_16_ = local_4a80;
      auVar87._24_8_ = uStack_4a68;
      auVar87._32_8_ = uStack_4a60;
      auVar87._40_8_ = uStack_4a58;
      auVar87._48_8_ = uStack_4a50;
      auVar87._56_8_ = uStack_4a48;
      auVar86._8_4_ = -0.00021219444;
      auVar86._12_4_ = -0.00021219444;
      auVar86._0_4_ = -0.00021219444;
      auVar86._4_4_ = -0.00021219444;
      auVar86._16_4_ = -0.00021219444;
      auVar86._20_4_ = -0.00021219444;
      auVar86._24_4_ = -0.00021219444;
      auVar86._28_4_ = -0.00021219444;
      auVar86._32_4_ = -0.00021219444;
      auVar86._36_4_ = -0.00021219444;
      auVar86._40_4_ = -0.00021219444;
      auVar86._44_4_ = -0.00021219444;
      auVar86._48_4_ = -0.00021219444;
      auVar86._52_4_ = -0.00021219444;
      auVar86._56_4_ = -0.00021219444;
      auVar86._60_4_ = -0.00021219444;
      local_4a00 = vfnmadd213ps_avx512f(auVar86,auVar87,auVar184);
      local_3180 = local_4a00._0_8_;
      uStack_3178 = local_4a00._8_8_;
      uStack_3170 = local_4a00._16_8_;
      uStack_3168 = local_4a00._24_8_;
      uStack_3160 = local_4a00._32_8_;
      uStack_3158 = local_4a00._40_8_;
      uStack_3150 = local_4a00._48_8_;
      uStack_3148 = local_4a00._56_8_;
      local_4a40 = vmulps_avx512f(local_4a00,local_4a00);
      uStack_4b78._0_4_ = 0.00019875691;
      uStack_4b78._4_4_ = 0.00019875691;
      local_4b80._0_4_ = 0.00019875691;
      local_4b80._4_4_ = 0.00019875691;
      local_2b40[0] = 0.00019875691;
      local_2b40[1] = 0.00019875691;
      afStack_2b38[0] = 0.00019875691;
      afStack_2b38[1] = 0.00019875691;
      afStack_2b30[0] = 0.00019875691;
      afStack_2b30[1] = 0.00019875691;
      afStack_2b28[0] = 0.00019875691;
      afStack_2b28[1] = 0.00019875691;
      afStack_2b20[0] = 0.00019875691;
      afStack_2b20[1] = 0.00019875691;
      afStack_2b18[0] = 0.00019875691;
      afStack_2b18[1] = 0.00019875691;
      afStack_2b10[0] = 0.00019875691;
      afStack_2b10[1] = 0.00019875691;
      afStack_2b08[0] = 0.00019875691;
      afStack_2b08[1] = 0.00019875691;
      local_2b80 = local_4a00._0_8_;
      uStack_2b78 = local_4a00._8_8_;
      uStack_2b70 = local_4a00._16_8_;
      uStack_2b68 = local_4a00._24_8_;
      uStack_2b60 = local_4a00._32_8_;
      uStack_2b58 = local_4a00._40_8_;
      uStack_2b50 = local_4a00._48_8_;
      uStack_2b48 = local_4a00._56_8_;
      local_2bc0[0] = 0.0013981999;
      local_2bc0[1] = 0.0013981999;
      afStack_2bb8[0] = 0.0013981999;
      afStack_2bb8[1] = 0.0013981999;
      afStack_2bb0[0] = 0.0013981999;
      afStack_2bb0[1] = 0.0013981999;
      afStack_2ba8[0] = 0.0013981999;
      afStack_2ba8[1] = 0.0013981999;
      afStack_2ba0[0] = 0.0013981999;
      afStack_2ba0[1] = 0.0013981999;
      afStack_2b98[0] = 0.0013981999;
      afStack_2b98[1] = 0.0013981999;
      afStack_2b90[0] = 0.0013981999;
      afStack_2b90[1] = 0.0013981999;
      afStack_2b88[0] = 0.0013981999;
      afStack_2b88[1] = 0.0013981999;
      auVar62._16_4_ = 0.00019875691;
      auVar62._20_4_ = 0.00019875691;
      auVar62._0_16_ = _local_4b80;
      auVar62._24_4_ = 0.00019875691;
      auVar62._28_4_ = 0.00019875691;
      auVar62._32_4_ = 0.00019875691;
      auVar62._36_4_ = 0.00019875691;
      auVar62._40_4_ = 0.00019875691;
      auVar62._44_4_ = 0.00019875691;
      auVar62._48_4_ = 0.00019875691;
      auVar62._52_4_ = 0.00019875691;
      auVar62._56_4_ = 0.00019875691;
      auVar62._60_4_ = 0.00019875691;
      auVar61._8_4_ = 0.0013981999;
      auVar61._12_4_ = 0.0013981999;
      auVar61._0_4_ = 0.0013981999;
      auVar61._4_4_ = 0.0013981999;
      auVar61._16_4_ = 0.0013981999;
      auVar61._20_4_ = 0.0013981999;
      auVar61._24_4_ = 0.0013981999;
      auVar61._28_4_ = 0.0013981999;
      auVar61._32_4_ = 0.0013981999;
      auVar61._36_4_ = 0.0013981999;
      auVar61._40_4_ = 0.0013981999;
      auVar61._44_4_ = 0.0013981999;
      auVar61._48_4_ = 0.0013981999;
      auVar61._52_4_ = 0.0013981999;
      auVar61._56_4_ = 0.0013981999;
      auVar61._60_4_ = 0.0013981999;
      auVar184 = vfmadd213ps_avx512f(local_4a00,auVar62,auVar61);
      local_4b80 = auVar184._0_8_;
      local_2c00 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_2bf8 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_2bf0 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_2be8 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_2be0 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_2bd8 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_2bd0 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_2bc8 = uStack_4b48;
      local_2c40 = local_4a00._0_8_;
      uStack_2c38 = local_4a00._8_8_;
      uStack_2c30 = local_4a00._16_8_;
      uStack_2c28 = local_4a00._24_8_;
      uStack_2c20 = local_4a00._32_8_;
      uStack_2c18 = local_4a00._40_8_;
      uStack_2c10 = local_4a00._48_8_;
      uStack_2c08 = local_4a00._56_8_;
      local_2c80[0] = 0.008333452;
      local_2c80[1] = 0.008333452;
      afStack_2c78[0] = 0.008333452;
      afStack_2c78[1] = 0.008333452;
      afStack_2c70[0] = 0.008333452;
      afStack_2c70[1] = 0.008333452;
      afStack_2c68[0] = 0.008333452;
      afStack_2c68[1] = 0.008333452;
      afStack_2c60[0] = 0.008333452;
      afStack_2c60[1] = 0.008333452;
      afStack_2c58[0] = 0.008333452;
      afStack_2c58[1] = 0.008333452;
      afStack_2c50[0] = 0.008333452;
      afStack_2c50[1] = 0.008333452;
      afStack_2c48[0] = 0.008333452;
      afStack_2c48[1] = 0.008333452;
      auVar60._8_4_ = 0.008333452;
      auVar60._12_4_ = 0.008333452;
      auVar60._0_4_ = 0.008333452;
      auVar60._4_4_ = 0.008333452;
      auVar60._16_4_ = 0.008333452;
      auVar60._20_4_ = 0.008333452;
      auVar60._24_4_ = 0.008333452;
      auVar60._28_4_ = 0.008333452;
      auVar60._32_4_ = 0.008333452;
      auVar60._36_4_ = 0.008333452;
      auVar60._40_4_ = 0.008333452;
      auVar60._44_4_ = 0.008333452;
      auVar60._48_4_ = 0.008333452;
      auVar60._52_4_ = 0.008333452;
      auVar60._56_4_ = 0.008333452;
      auVar60._60_4_ = 0.008333452;
      auVar184 = vfmadd213ps_avx512f(local_4a00,auVar184,auVar60);
      local_4b80 = auVar184._0_8_;
      local_2cc0 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_2cb8 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_2cb0 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_2ca8 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_2ca0 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_2c98 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_2c90 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_2c88 = uStack_4b48;
      local_2d00 = local_4a00._0_8_;
      uStack_2cf8 = local_4a00._8_8_;
      uStack_2cf0 = local_4a00._16_8_;
      uStack_2ce8 = local_4a00._24_8_;
      uStack_2ce0 = local_4a00._32_8_;
      uStack_2cd8 = local_4a00._40_8_;
      uStack_2cd0 = local_4a00._48_8_;
      uStack_2cc8 = local_4a00._56_8_;
      local_2d40[0] = 0.041665796;
      local_2d40[1] = 0.041665796;
      afStack_2d38[0] = 0.041665796;
      afStack_2d38[1] = 0.041665796;
      afStack_2d30[0] = 0.041665796;
      afStack_2d30[1] = 0.041665796;
      afStack_2d28[0] = 0.041665796;
      afStack_2d28[1] = 0.041665796;
      afStack_2d20[0] = 0.041665796;
      afStack_2d20[1] = 0.041665796;
      afStack_2d18[0] = 0.041665796;
      afStack_2d18[1] = 0.041665796;
      afStack_2d10[0] = 0.041665796;
      afStack_2d10[1] = 0.041665796;
      afStack_2d08[0] = 0.041665796;
      afStack_2d08[1] = 0.041665796;
      auVar59._8_4_ = 0.041665796;
      auVar59._12_4_ = 0.041665796;
      auVar59._0_4_ = 0.041665796;
      auVar59._4_4_ = 0.041665796;
      auVar59._16_4_ = 0.041665796;
      auVar59._20_4_ = 0.041665796;
      auVar59._24_4_ = 0.041665796;
      auVar59._28_4_ = 0.041665796;
      auVar59._32_4_ = 0.041665796;
      auVar59._36_4_ = 0.041665796;
      auVar59._40_4_ = 0.041665796;
      auVar59._44_4_ = 0.041665796;
      auVar59._48_4_ = 0.041665796;
      auVar59._52_4_ = 0.041665796;
      auVar59._56_4_ = 0.041665796;
      auVar59._60_4_ = 0.041665796;
      auVar184 = vfmadd213ps_avx512f(local_4a00,auVar184,auVar59);
      local_4b80 = auVar184._0_8_;
      local_2d80 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_2d78 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_2d70 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_2d68 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_2d60 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_2d58 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_2d50 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_2d48 = uStack_4b48;
      local_2dc0 = local_4a00._0_8_;
      uStack_2db8 = local_4a00._8_8_;
      uStack_2db0 = local_4a00._16_8_;
      uStack_2da8 = local_4a00._24_8_;
      uStack_2da0 = local_4a00._32_8_;
      uStack_2d98 = local_4a00._40_8_;
      uStack_2d90 = local_4a00._48_8_;
      uStack_2d88 = local_4a00._56_8_;
      local_2e00[0] = 0.16666666;
      local_2e00[1] = 0.16666666;
      afStack_2df8[0] = 0.16666666;
      afStack_2df8[1] = 0.16666666;
      afStack_2df0[0] = 0.16666666;
      afStack_2df0[1] = 0.16666666;
      afStack_2de8[0] = 0.16666666;
      afStack_2de8[1] = 0.16666666;
      afStack_2de0[0] = 0.16666666;
      afStack_2de0[1] = 0.16666666;
      afStack_2dd8[0] = 0.16666666;
      afStack_2dd8[1] = 0.16666666;
      afStack_2dd0[0] = 0.16666666;
      afStack_2dd0[1] = 0.16666666;
      afStack_2dc8[0] = 0.16666666;
      afStack_2dc8[1] = 0.16666666;
      auVar58._8_4_ = 0.16666666;
      auVar58._12_4_ = 0.16666666;
      auVar58._0_4_ = 0.16666666;
      auVar58._4_4_ = 0.16666666;
      auVar58._16_4_ = 0.16666666;
      auVar58._20_4_ = 0.16666666;
      auVar58._24_4_ = 0.16666666;
      auVar58._28_4_ = 0.16666666;
      auVar58._32_4_ = 0.16666666;
      auVar58._36_4_ = 0.16666666;
      auVar58._40_4_ = 0.16666666;
      auVar58._44_4_ = 0.16666666;
      auVar58._48_4_ = 0.16666666;
      auVar58._52_4_ = 0.16666666;
      auVar58._56_4_ = 0.16666666;
      auVar58._60_4_ = 0.16666666;
      auVar184 = vfmadd213ps_avx512f(local_4a00,auVar184,auVar58);
      local_4b80 = auVar184._0_8_;
      local_2e40 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_2e38 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_2e30 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_2e28 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_2e20 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_2e18 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_2e10 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_2e08 = uStack_4b48;
      local_2e80 = local_4a00._0_8_;
      uStack_2e78 = local_4a00._8_8_;
      uStack_2e70 = local_4a00._16_8_;
      uStack_2e68 = local_4a00._24_8_;
      uStack_2e60 = local_4a00._32_8_;
      uStack_2e58 = local_4a00._40_8_;
      uStack_2e50 = local_4a00._48_8_;
      uStack_2e48 = local_4a00._56_8_;
      local_2ec0[0] = 0.5;
      local_2ec0[1] = 0.5;
      afStack_2eb8[0] = 0.5;
      afStack_2eb8[1] = 0.5;
      afStack_2eb0[0] = 0.5;
      afStack_2eb0[1] = 0.5;
      afStack_2ea8[0] = 0.5;
      afStack_2ea8[1] = 0.5;
      afStack_2ea0[0] = 0.5;
      afStack_2ea0[1] = 0.5;
      afStack_2e98[0] = 0.5;
      afStack_2e98[1] = 0.5;
      afStack_2e90[0] = 0.5;
      afStack_2e90[1] = 0.5;
      afStack_2e88[0] = 0.5;
      afStack_2e88[1] = 0.5;
      auVar57._8_4_ = 0.5;
      auVar57._12_4_ = 0.5;
      auVar57._0_4_ = 0.5;
      auVar57._4_4_ = 0.5;
      auVar57._16_4_ = 0.5;
      auVar57._20_4_ = 0.5;
      auVar57._24_4_ = 0.5;
      auVar57._28_4_ = 0.5;
      auVar57._32_4_ = 0.5;
      auVar57._36_4_ = 0.5;
      auVar57._40_4_ = 0.5;
      auVar57._44_4_ = 0.5;
      auVar57._48_4_ = 0.5;
      auVar57._52_4_ = 0.5;
      auVar57._56_4_ = 0.5;
      auVar57._60_4_ = 0.5;
      auVar184 = vfmadd213ps_avx512f(local_4a00,auVar184,auVar57);
      local_4b80 = auVar184._0_8_;
      local_2f00 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_2ef8 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_2ef0 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_2ee8 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_2ee0 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_2ed8 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_2ed0 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_2ec8 = uStack_4b48;
      local_2f40 = local_4a40._0_8_;
      uStack_2f38 = local_4a40._8_8_;
      uStack_2f30 = local_4a40._16_8_;
      uStack_2f28 = local_4a40._24_8_;
      uStack_2f20 = local_4a40._32_8_;
      uStack_2f18 = local_4a40._40_8_;
      uStack_2f10 = local_4a40._48_8_;
      uStack_2f08 = local_4a40._56_8_;
      local_2f80 = local_4a00._0_8_;
      uStack_2f78 = local_4a00._8_8_;
      uStack_2f70 = local_4a00._16_8_;
      uStack_2f68 = local_4a00._24_8_;
      uStack_2f60 = local_4a00._32_8_;
      uStack_2f58 = local_4a00._40_8_;
      uStack_2f50 = local_4a00._48_8_;
      uStack_2f48 = local_4a00._56_8_;
      auVar184 = vfmadd213ps_avx512f(local_4a40,auVar184,local_4a00);
      local_4b80 = auVar184._0_8_;
      local_4900 = local_4b80;
      uStack_4b78 = auVar184._8_8_;
      uStack_48f8 = uStack_4b78;
      uStack_4b70 = auVar184._16_8_;
      uStack_48f0 = uStack_4b70;
      uStack_4b68 = auVar184._24_8_;
      uStack_48e8 = uStack_4b68;
      uStack_4b60 = auVar184._32_8_;
      uStack_48e0 = uStack_4b60;
      uStack_4b58 = auVar184._40_8_;
      uStack_48d8 = uStack_4b58;
      uStack_4b50 = auVar184._48_8_;
      uStack_48d0 = uStack_4b50;
      uStack_4b48 = auVar184._56_8_;
      uStack_48c8 = uStack_4b48;
      local_4940[0] = 1.0;
      local_4940[1] = 1.0;
      afStack_4938[0] = 1.0;
      afStack_4938[1] = 1.0;
      afStack_4930[0] = 1.0;
      afStack_4930[1] = 1.0;
      afStack_4928[0] = 1.0;
      afStack_4928[1] = 1.0;
      afStack_4920[0] = 1.0;
      afStack_4920[1] = 1.0;
      afStack_4918[0] = 1.0;
      afStack_4918[1] = 1.0;
      afStack_4910[0] = 1.0;
      afStack_4910[1] = 1.0;
      afStack_4908[0] = 1.0;
      afStack_4908[1] = 1.0;
      auVar38._8_4_ = 1.0;
      auVar38._12_4_ = 1.0;
      auVar38._0_4_ = 1.0;
      auVar38._4_4_ = 1.0;
      auVar38._16_4_ = 1.0;
      auVar38._20_4_ = 1.0;
      auVar38._24_4_ = 1.0;
      auVar38._28_4_ = 1.0;
      auVar38._32_4_ = 1.0;
      auVar38._36_4_ = 1.0;
      auVar38._40_4_ = 1.0;
      auVar38._44_4_ = 1.0;
      auVar38._48_4_ = 1.0;
      auVar38._52_4_ = 1.0;
      auVar38._56_4_ = 1.0;
      auVar38._60_4_ = 1.0;
      auVar185 = vaddps_avx512f(auVar184,auVar38);
      local_1fc0 = local_4a80._0_8_;
      uStack_1fb8 = local_4a80._8_8_;
      uStack_1fb0 = uStack_4a70;
      uStack_1fa8 = uStack_4a68;
      uStack_1fa0 = uStack_4a60;
      uStack_1f98 = uStack_4a58;
      uStack_1f90 = uStack_4a50;
      uStack_1f88 = uStack_4a48;
      auVar92._16_8_ = uStack_4a70;
      auVar92._0_16_ = local_4a80;
      auVar92._24_8_ = uStack_4a68;
      auVar92._32_8_ = uStack_4a60;
      auVar92._40_8_ = uStack_4a58;
      auVar92._48_8_ = uStack_4a50;
      auVar92._56_8_ = uStack_4a48;
      auVar184 = vcvttps2dq_avx512f(auVar92);
      local_1e80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar184 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(auVar184);
      auVar186 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_1f40 = vmovdqa64_avx512f(auVar184);
      local_1f80 = vmovdqa64_avx512f(auVar186);
      auVar184 = vmovdqa64_avx512f(local_1f40);
      auVar186 = vmovdqa64_avx512f(local_1f80);
      auVar184 = vpaddd_avx512f(auVar184,auVar186);
      auVar184 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(auVar184);
      local_1ec0 = vmovdqa64_avx512f(auVar184);
      local_1ec4 = 0x17;
      auVar184 = vmovdqa64_avx512f(local_1ec0);
      auVar184 = vpslld_avx512f(auVar184,ZEXT416(0x17));
      local_4ac0 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(local_4ac0);
      local_4980 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(local_4980);
      local_4bc0 = vmovdqa64_avx512f(auVar184);
      local_4b80 = auVar185._0_8_;
      local_31c0 = local_4b80;
      uStack_4b78 = auVar185._8_8_;
      uStack_31b8 = uStack_4b78;
      uStack_4b70 = auVar185._16_8_;
      uStack_31b0 = uStack_4b70;
      uStack_4b68 = auVar185._24_8_;
      uStack_31a8 = uStack_4b68;
      uStack_4b60 = auVar185._32_8_;
      uStack_31a0 = uStack_4b60;
      uStack_4b58 = auVar185._40_8_;
      uStack_3198 = uStack_4b58;
      uStack_4b50 = auVar185._48_8_;
      uStack_3190 = uStack_4b50;
      uStack_4b48 = auVar185._56_8_;
      uStack_3188 = uStack_4b48;
      local_3200 = local_4bc0._0_8_;
      uStack_31f8 = local_4bc0._8_8_;
      uStack_31f0 = local_4bc0._16_8_;
      uStack_31e8 = local_4bc0._24_8_;
      uStack_31e0 = local_4bc0._32_8_;
      uStack_31d8 = local_4bc0._40_8_;
      uStack_31d0 = local_4bc0._48_8_;
      uStack_31c8 = local_4bc0._56_8_;
      _local_4b80 = vmulps_avx512f(auVar185,local_4bc0);
      local_4c40 = local_4b80;
      uStack_4c38 = uStack_4b78;
      uStack_4c30 = uStack_4b70;
      uStack_4c28 = uStack_4b68;
      uStack_4c20 = uStack_4b60;
      uStack_4c18 = uStack_4b58;
      uStack_4c10 = uStack_4b50;
      uStack_4c08 = uStack_4b48;
      auVar184 = vaddps_avx512f(local_52c0,_local_4b80);
      local_4ec0[0] = 1.0;
      local_4ec0[1] = 1.0;
      afStack_4eb8[0] = 1.0;
      afStack_4eb8[1] = 1.0;
      afStack_4eb0[0] = 1.0;
      afStack_4eb0[1] = 1.0;
      afStack_4ea8[0] = 1.0;
      afStack_4ea8[1] = 1.0;
      afStack_4ea0[0] = 1.0;
      afStack_4ea0[1] = 1.0;
      afStack_4e98[0] = 1.0;
      afStack_4e98[1] = 1.0;
      afStack_4e90[0] = 1.0;
      afStack_4e90[1] = 1.0;
      afStack_4e88[0] = 1.0;
      afStack_4e88[1] = 1.0;
      local_4e00 = 0;
      uStack_4df8 = 0;
      uStack_4df0 = 0;
      uStack_4de8 = 0;
      uStack_4de0 = 0;
      uStack_4dd8 = 0;
      uStack_4dd0 = 0;
      uStack_4dc8 = 0;
      uVar24 = vcmpps_avx512f(auVar184,ZEXT1664(ZEXT816(0)),2);
      local_4ec2 = (undefined2)uVar24;
      local_4e40._0_8_ = auVar184._0_8_;
      local_3800 = local_4e40._0_8_;
      local_4e40._8_8_ = auVar184._8_8_;
      uStack_37f8 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar184._16_8_;
      uStack_37f0 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar184._24_8_;
      uStack_37e8 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar184._32_8_;
      uStack_37e0 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar184._40_8_;
      uStack_37d8 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar184._48_8_;
      uStack_37d0 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar184._56_8_;
      uStack_37c8 = local_4e40._56_8_;
      local_3840[0] = 0x800000;
      local_3840[1] = 0x800000;
      aiStack_3838[0] = 0x800000;
      aiStack_3838[1] = 0x800000;
      aiStack_3830[0] = 0x800000;
      aiStack_3830[1] = 0x800000;
      aiStack_3828[0] = 0x800000;
      aiStack_3828[1] = 0x800000;
      aiStack_3820[0] = 0x800000;
      aiStack_3820[1] = 0x800000;
      aiStack_3818[0] = 0x800000;
      aiStack_3818[1] = 0x800000;
      aiStack_3810[0] = 0x800000;
      aiStack_3810[1] = 0x800000;
      aiStack_3808[0] = 0x800000;
      aiStack_3808[1] = 0x800000;
      auVar49._8_4_ = 0x800000;
      auVar49._12_4_ = 0x800000;
      auVar49._0_4_ = 0x800000;
      auVar49._4_4_ = 0x800000;
      auVar49._16_4_ = 0x800000;
      auVar49._20_4_ = 0x800000;
      auVar49._24_4_ = 0x800000;
      auVar49._28_4_ = 0x800000;
      auVar49._32_4_ = 0x800000;
      auVar49._36_4_ = 0x800000;
      auVar49._40_4_ = 0x800000;
      auVar49._44_4_ = 0x800000;
      auVar49._48_4_ = 0x800000;
      auVar49._52_4_ = 0x800000;
      auVar49._56_4_ = 0x800000;
      auVar49._60_4_ = 0x800000;
      auVar185 = vmaxps_avx512f(auVar184,auVar49);
      local_4e40._0_8_ = auVar185._0_8_;
      local_4d80 = local_4e40._0_8_;
      local_4e40._8_8_ = auVar185._8_8_;
      uStack_4d78 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar185._16_8_;
      uStack_4d70 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar185._24_8_;
      uStack_4d68 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar185._32_8_;
      uStack_4d60 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar185._40_8_;
      uStack_4d58 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar185._48_8_;
      uStack_4d50 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar185._56_8_;
      uStack_4d48 = local_4e40._56_8_;
      local_3780 = local_4e40._0_8_;
      uStack_3778 = local_4e40._8_8_;
      uStack_3770 = local_4e40._16_8_;
      uStack_3768 = local_4e40._24_8_;
      uStack_3760 = local_4e40._32_8_;
      uStack_3758 = local_4e40._40_8_;
      uStack_3750 = local_4e40._48_8_;
      uStack_3748 = local_4e40._56_8_;
      local_3784 = 0x17;
      auVar184 = vmovdqa64_avx512f(auVar185);
      auVar184 = vpsrld_avx512f(auVar184,ZEXT416(0x17));
      auVar184 = vmovdqa64_avx512f(auVar184);
      local_3700 = local_4e40._0_8_;
      uStack_36f8 = local_4e40._8_8_;
      uStack_36f0 = local_4e40._16_8_;
      uStack_36e8 = local_4e40._24_8_;
      uStack_36e0 = local_4e40._32_8_;
      uStack_36d8 = local_4e40._40_8_;
      uStack_36d0 = local_4e40._48_8_;
      uStack_36c8 = local_4e40._56_8_;
      local_3740[0] = -0x7f800001;
      local_3740[1] = -0x7f800001;
      aiStack_3738[0] = -0x7f800001;
      aiStack_3738[1] = -0x7f800001;
      aiStack_3730[0] = -0x7f800001;
      aiStack_3730[1] = -0x7f800001;
      aiStack_3728[0] = -0x7f800001;
      aiStack_3728[1] = -0x7f800001;
      aiStack_3720[0] = -0x7f800001;
      aiStack_3720[1] = -0x7f800001;
      aiStack_3718[0] = -0x7f800001;
      aiStack_3718[1] = -0x7f800001;
      aiStack_3710[0] = -0x7f800001;
      aiStack_3710[1] = -0x7f800001;
      aiStack_3708[0] = -0x7f800001;
      aiStack_3708[1] = -0x7f800001;
      auVar185 = vmovdqa64_avx512f(auVar185);
      auVar50._8_4_ = -0x7f800001;
      auVar50._12_4_ = -0x7f800001;
      auVar50._0_4_ = -0x7f800001;
      auVar50._4_4_ = -0x7f800001;
      auVar50._16_4_ = -0x7f800001;
      auVar50._20_4_ = -0x7f800001;
      auVar50._24_4_ = -0x7f800001;
      auVar50._28_4_ = -0x7f800001;
      auVar50._32_4_ = -0x7f800001;
      auVar50._36_4_ = -0x7f800001;
      auVar50._40_4_ = -0x7f800001;
      auVar50._44_4_ = -0x7f800001;
      auVar50._48_4_ = -0x7f800001;
      auVar50._52_4_ = -0x7f800001;
      auVar50._56_4_ = -0x7f800001;
      auVar50._60_4_ = -0x7f800001;
      auVar186 = vmovdqa64_avx512f(auVar50);
      auVar185 = vpandd_avx512f(auVar185,auVar186);
      auVar185 = vmovdqa64_avx512f(auVar185);
      local_4e40._0_8_ = auVar185._0_8_;
      local_3600 = local_4e40._0_8_;
      local_4e40._8_8_ = auVar185._8_8_;
      uStack_35f8 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar185._16_8_;
      uStack_35f0 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar185._24_8_;
      uStack_35e8 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar185._32_8_;
      uStack_35e0 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar185._40_8_;
      uStack_35d8 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar185._48_8_;
      uStack_35d0 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar185._56_8_;
      uStack_35c8 = local_4e40._56_8_;
      local_3640[0] = 0.5;
      local_3640[1] = 0.5;
      afStack_3638[0] = 0.5;
      afStack_3638[1] = 0.5;
      afStack_3630[0] = 0.5;
      afStack_3630[1] = 0.5;
      afStack_3628[0] = 0.5;
      afStack_3628[1] = 0.5;
      afStack_3620[0] = 0.5;
      afStack_3620[1] = 0.5;
      afStack_3618[0] = 0.5;
      afStack_3618[1] = 0.5;
      afStack_3610[0] = 0.5;
      afStack_3610[1] = 0.5;
      afStack_3608[0] = 0.5;
      afStack_3608[1] = 0.5;
      auVar185 = vmovdqa64_avx512f(auVar185);
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar51._32_4_ = 0.5;
      auVar51._36_4_ = 0.5;
      auVar51._40_4_ = 0.5;
      auVar51._44_4_ = 0.5;
      auVar51._48_4_ = 0.5;
      auVar51._52_4_ = 0.5;
      auVar51._56_4_ = 0.5;
      auVar51._60_4_ = 0.5;
      auVar186 = vmovdqa64_avx512f(auVar51);
      auVar185 = vpord_avx512f(auVar185,auVar186);
      auVar185 = vmovdqa64_avx512f(auVar185);
      auVar184 = vmovdqa64_avx512f(auVar184);
      auVar186 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_3580 = vmovdqa64_avx512f(auVar184);
      local_35c0 = vmovdqa64_avx512f(auVar186);
      auVar184 = vmovdqa64_avx512f(local_3580);
      auVar186 = vmovdqa64_avx512f(local_35c0);
      auVar184 = vpsubd_avx512f(auVar184,auVar186);
      local_4e80 = vmovdqa64_avx512f(auVar184);
      auVar184 = vmovdqa64_avx512f(local_4e80);
      local_3540 = vmovdqa64_avx512f(auVar184);
      auVar184 = vcvtdq2ps_avx512f(local_3540);
      local_4f40._0_8_ = auVar184._0_8_;
      local_4c80 = local_4f40._0_8_;
      local_4f40._8_8_ = auVar184._8_8_;
      uStack_4c78 = local_4f40._8_8_;
      uStack_4f30 = auVar184._16_8_;
      uStack_4c70 = uStack_4f30;
      uStack_4f28 = auVar184._24_8_;
      uStack_4c68 = uStack_4f28;
      uStack_4f20 = auVar184._32_8_;
      uStack_4c60 = uStack_4f20;
      uStack_4f18 = auVar184._40_8_;
      uStack_4c58 = uStack_4f18;
      uStack_4f10 = auVar184._48_8_;
      uStack_4c50 = uStack_4f10;
      uStack_4f08 = auVar184._56_8_;
      uStack_4c48 = uStack_4f08;
      local_4cc0[0] = 1.0;
      local_4cc0[1] = 1.0;
      afStack_4cb8[0] = 1.0;
      afStack_4cb8[1] = 1.0;
      afStack_4cb0[0] = 1.0;
      afStack_4cb0[1] = 1.0;
      afStack_4ca8[0] = 1.0;
      afStack_4ca8[1] = 1.0;
      afStack_4ca0[0] = 1.0;
      afStack_4ca0[1] = 1.0;
      afStack_4c98[0] = 1.0;
      afStack_4c98[1] = 1.0;
      afStack_4c90[0] = 1.0;
      afStack_4c90[1] = 1.0;
      afStack_4c88[0] = 1.0;
      afStack_4c88[1] = 1.0;
      auVar186._8_4_ = 1.0;
      auVar186._12_4_ = 1.0;
      auVar186._0_4_ = 1.0;
      auVar186._4_4_ = 1.0;
      auVar186._16_4_ = 1.0;
      auVar186._20_4_ = 1.0;
      auVar186._24_4_ = 1.0;
      auVar186._28_4_ = 1.0;
      auVar186._32_4_ = 1.0;
      auVar186._36_4_ = 1.0;
      auVar186._40_4_ = 1.0;
      auVar186._44_4_ = 1.0;
      auVar186._48_4_ = 1.0;
      auVar186._52_4_ = 1.0;
      auVar186._56_4_ = 1.0;
      auVar186._60_4_ = 1.0;
      auVar184 = vaddps_avx512f(auVar184,auVar186);
      uVar23 = vcmpps_avx512f(auVar185,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      local_4f42 = (ushort)uVar23;
      local_4e40._0_8_ = auVar185._0_8_;
      local_4880 = local_4e40._0_8_;
      local_4e40._8_8_ = auVar185._8_8_;
      uStack_4878 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar185._16_8_;
      uStack_4870 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar185._24_8_;
      uStack_4868 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar185._32_8_;
      uStack_4860 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar185._40_8_;
      uStack_4858 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar185._48_8_;
      uStack_4850 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar185._56_8_;
      uStack_4848 = local_4e40._56_8_;
      local_48c0[0] = 1.0;
      local_48c0[1] = 1.0;
      afStack_48b8[0] = 1.0;
      afStack_48b8[1] = 1.0;
      afStack_48b0[0] = 1.0;
      afStack_48b0[1] = 1.0;
      afStack_48a8[0] = 1.0;
      afStack_48a8[1] = 1.0;
      afStack_48a0[0] = 1.0;
      afStack_48a0[1] = 1.0;
      afStack_4898[0] = 1.0;
      afStack_4898[1] = 1.0;
      afStack_4890[0] = 1.0;
      afStack_4890[1] = 1.0;
      afStack_4888[0] = 1.0;
      afStack_4888[1] = 1.0;
      auVar39._8_4_ = 1.0;
      auVar39._12_4_ = 1.0;
      auVar39._0_4_ = 1.0;
      auVar39._4_4_ = 1.0;
      auVar39._16_4_ = 1.0;
      auVar39._20_4_ = 1.0;
      auVar39._24_4_ = 1.0;
      auVar39._28_4_ = 1.0;
      auVar39._32_4_ = 1.0;
      auVar39._36_4_ = 1.0;
      auVar39._40_4_ = 1.0;
      auVar39._44_4_ = 1.0;
      auVar39._48_4_ = 1.0;
      auVar39._52_4_ = 1.0;
      auVar39._56_4_ = 1.0;
      auVar39._60_4_ = 1.0;
      local_4fc0 = vsubps_avx512f(auVar185,auVar39);
      local_4f40._0_8_ = auVar184._0_8_;
      local_3340 = local_4f40._0_8_;
      local_4f40._8_8_ = auVar184._8_8_;
      uStack_3338 = local_4f40._8_8_;
      uStack_4f30 = auVar184._16_8_;
      uStack_3330 = uStack_4f30;
      uStack_4f28 = auVar184._24_8_;
      uStack_3328 = uStack_4f28;
      uStack_4f20 = auVar184._32_8_;
      uStack_3320 = uStack_4f20;
      uStack_4f18 = auVar184._40_8_;
      uStack_3318 = uStack_4f18;
      uStack_4f10 = auVar184._48_8_;
      uStack_3310 = uStack_4f10;
      uStack_4f08 = auVar184._56_8_;
      uStack_3308 = uStack_4f08;
      local_3380[0] = 1.0;
      local_3380[1] = 1.0;
      afStack_3378[0] = 1.0;
      afStack_3378[1] = 1.0;
      afStack_3370[0] = 1.0;
      afStack_3370[1] = 1.0;
      afStack_3368[0] = 1.0;
      afStack_3368[1] = 1.0;
      afStack_3360[0] = 1.0;
      afStack_3360[1] = 1.0;
      afStack_3358[0] = 1.0;
      afStack_3358[1] = 1.0;
      afStack_3350[0] = 1.0;
      afStack_3350[1] = 1.0;
      afStack_3348[0] = 1.0;
      afStack_3348[1] = 1.0;
      local_3240 = local_4f40._0_8_;
      uStack_3238 = local_4f40._8_8_;
      uStack_3230 = uStack_4f30;
      uStack_3228 = uStack_4f28;
      uStack_3220 = uStack_4f20;
      uStack_3218 = uStack_4f18;
      uStack_3210 = uStack_4f10;
      uStack_3208 = uStack_4f08;
      local_3280[0] = 1.0;
      local_3280[1] = 1.0;
      afStack_3278[0] = 1.0;
      afStack_3278[1] = 1.0;
      afStack_3270[0] = 1.0;
      afStack_3270[1] = 1.0;
      afStack_3268[0] = 1.0;
      afStack_3268[1] = 1.0;
      afStack_3260[0] = 1.0;
      afStack_3260[1] = 1.0;
      afStack_3258[0] = 1.0;
      afStack_3258[1] = 1.0;
      afStack_3250[0] = 1.0;
      afStack_3250[1] = 1.0;
      afStack_3248[0] = 1.0;
      afStack_3248[1] = 1.0;
      auVar53._8_4_ = 1.0;
      auVar53._12_4_ = 1.0;
      auVar53._0_4_ = 1.0;
      auVar53._4_4_ = 1.0;
      auVar53._16_4_ = 1.0;
      auVar53._20_4_ = 1.0;
      auVar53._24_4_ = 1.0;
      auVar53._28_4_ = 1.0;
      auVar53._32_4_ = 1.0;
      auVar53._36_4_ = 1.0;
      auVar53._40_4_ = 1.0;
      auVar53._44_4_ = 1.0;
      auVar53._48_4_ = 1.0;
      auVar53._52_4_ = 1.0;
      auVar53._56_4_ = 1.0;
      auVar53._60_4_ = 1.0;
      local_32c0._0_4_ = auVar184._0_4_;
      local_32c0._4_4_ = auVar184._4_4_;
      uStack_32b8._0_4_ = auVar184._8_4_;
      uStack_32b8._4_4_ = auVar184._12_4_;
      uStack_32b0._0_4_ = auVar184._16_4_;
      uStack_32b0._4_4_ = auVar184._20_4_;
      uStack_32a8._0_4_ = auVar184._24_4_;
      uStack_32a8._4_4_ = auVar184._28_4_;
      uStack_32a0._0_4_ = auVar184._32_4_;
      uStack_32a0._4_4_ = auVar184._36_4_;
      uStack_3298._0_4_ = auVar184._40_4_;
      uStack_3298._4_4_ = auVar184._44_4_;
      uStack_3290._0_4_ = auVar184._48_4_;
      uStack_3290._4_4_ = auVar184._52_4_;
      uStack_3288._0_4_ = auVar184._56_4_;
      uStack_3288._4_4_ = auVar184._60_4_;
      auVar184 = vsubps_avx512f(auVar184,auVar53);
      bVar1 = (bool)((byte)uVar23 & 1);
      bVar2 = (bool)((byte)(local_4f42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4f42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4f42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4f42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4f42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4f42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4f42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar23 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4f40._4_4_ = (uint)bVar2 * auVar184._4_4_ | (uint)!bVar2 * local_32c0._4_4_;
      local_4f40._0_4_ = (uint)bVar1 * auVar184._0_4_ | (uint)!bVar1 * (int)local_32c0;
      local_4f40._8_4_ = (uint)bVar3 * auVar184._8_4_ | (uint)!bVar3 * (int)uStack_32b8;
      local_4f40._12_4_ = (uint)bVar4 * auVar184._12_4_ | (uint)!bVar4 * uStack_32b8._4_4_;
      uStack_4f30._0_4_ = (uint)bVar5 * auVar184._16_4_ | (uint)!bVar5 * (int)uStack_32b0;
      uStack_4f30._4_4_ = (uint)bVar6 * auVar184._20_4_ | (uint)!bVar6 * uStack_32b0._4_4_;
      auVar191 = _local_4f40;
      uStack_4f28._0_4_ = (uint)bVar7 * auVar184._24_4_ | (uint)!bVar7 * (int)uStack_32a8;
      uStack_4f28._4_4_ = (uint)bVar8 * auVar184._28_4_ | (uint)!bVar8 * uStack_32a8._4_4_;
      auVar16 = _local_4f40;
      uStack_4f20._0_4_ =
           (uint)(bVar9 & 1) * auVar184._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_32a0;
      uStack_4f20._4_4_ = (uint)bVar10 * auVar184._36_4_ | (uint)!bVar10 * uStack_32a0._4_4_;
      auVar177 = _local_4f40;
      uStack_4f18._0_4_ = (uint)bVar11 * auVar184._40_4_ | (uint)!bVar11 * (int)uStack_3298;
      uStack_4f18._4_4_ = (uint)bVar12 * auVar184._44_4_ | (uint)!bVar12 * uStack_3298._4_4_;
      auVar178 = _local_4f40;
      uStack_4f10._0_4_ = (uint)bVar13 * auVar184._48_4_ | (uint)!bVar13 * (int)uStack_3290;
      uStack_4f10._4_4_ = (uint)bVar14 * auVar184._52_4_ | (uint)!bVar14 * uStack_3290._4_4_;
      auVar179 = _local_4f40;
      uStack_4f08._0_4_ = (uint)bVar15 * auVar184._56_4_ | (uint)!bVar15 * (int)uStack_3288;
      uStack_4f08._4_4_ =
           (uint)(bVar9 >> 7) * auVar184._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_3288._4_4_;
      auVar184 = _local_4f40;
      local_4780 = local_4fc0._0_8_;
      uStack_4778 = local_4fc0._8_8_;
      uStack_4770 = local_4fc0._16_8_;
      uStack_4768 = local_4fc0._24_8_;
      uStack_4760 = local_4fc0._32_8_;
      uStack_4758 = local_4fc0._40_8_;
      uStack_4750 = local_4fc0._48_8_;
      uStack_4748 = local_4fc0._56_8_;
      local_47c0 = local_4e40._0_8_;
      uStack_47b8 = local_4e40._8_8_;
      uStack_47b0 = local_4e40._16_8_;
      uStack_47a8 = local_4e40._24_8_;
      uStack_47a0 = local_4e40._32_8_;
      uStack_4798 = local_4e40._40_8_;
      uStack_4790 = local_4e40._48_8_;
      uStack_4788 = local_4e40._56_8_;
      local_4680 = local_4fc0._0_8_;
      uStack_4678 = local_4fc0._8_8_;
      uStack_4670 = local_4fc0._16_8_;
      uStack_4668 = local_4fc0._24_8_;
      uStack_4660 = local_4fc0._32_8_;
      uStack_4658 = local_4fc0._40_8_;
      uStack_4650 = local_4fc0._48_8_;
      uStack_4648 = local_4fc0._56_8_;
      local_46c0 = local_4e40._0_8_;
      uStack_46b8 = local_4e40._8_8_;
      uStack_46b0 = local_4e40._16_8_;
      uStack_46a8 = local_4e40._24_8_;
      uStack_46a0 = local_4e40._32_8_;
      uStack_4698 = local_4e40._40_8_;
      uStack_4690 = local_4e40._48_8_;
      uStack_4688 = local_4e40._56_8_;
      local_4700._0_4_ = local_4fc0._0_4_;
      local_4700._4_4_ = local_4fc0._4_4_;
      uStack_46f8._0_4_ = local_4fc0._8_4_;
      uStack_46f8._4_4_ = local_4fc0._12_4_;
      uStack_46f0._0_4_ = local_4fc0._16_4_;
      uStack_46f0._4_4_ = local_4fc0._20_4_;
      uStack_46e8._0_4_ = local_4fc0._24_4_;
      uStack_46e8._4_4_ = local_4fc0._28_4_;
      uStack_46e0._0_4_ = local_4fc0._32_4_;
      uStack_46e0._4_4_ = local_4fc0._36_4_;
      uStack_46d8._0_4_ = local_4fc0._40_4_;
      uStack_46d8._4_4_ = local_4fc0._44_4_;
      uStack_46d0._0_4_ = local_4fc0._48_4_;
      uStack_46d0._4_4_ = local_4fc0._52_4_;
      uStack_46c8._0_4_ = local_4fc0._56_4_;
      uStack_46c8._4_4_ = local_4fc0._60_4_;
      auVar185 = vaddps_avx512f(local_4fc0,auVar185);
      bVar1 = (bool)((byte)uVar23 & 1);
      bVar2 = (bool)((byte)(local_4f42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4f42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4f42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4f42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4f42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4f42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4f42 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4e40._4_4_ = (uint)bVar2 * auVar185._4_4_ | (uint)!bVar2 * local_4700._4_4_;
      local_4e40._0_4_ = (uint)bVar1 * auVar185._0_4_ | (uint)!bVar1 * (int)local_4700;
      local_4e40._8_4_ = (uint)bVar3 * auVar185._8_4_ | (uint)!bVar3 * (int)uStack_46f8;
      local_4e40._12_4_ = (uint)bVar4 * auVar185._12_4_ | (uint)!bVar4 * uStack_46f8._4_4_;
      local_4e40._16_4_ = (uint)bVar5 * auVar185._16_4_ | (uint)!bVar5 * (int)uStack_46f0;
      local_4e40._20_4_ = (uint)bVar6 * auVar185._20_4_ | (uint)!bVar6 * uStack_46f0._4_4_;
      auVar180 = local_4e40._0_24_;
      local_4e40._24_4_ = (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * (int)uStack_46e8;
      local_4e40._28_4_ = (uint)bVar8 * auVar185._28_4_ | (uint)!bVar8 * uStack_46e8._4_4_;
      auVar21 = local_4e40._0_32_;
      local_4e40._32_4_ =
           (uint)(bVar9 & 1) * auVar185._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_46e0;
      local_4e40._36_4_ = (uint)bVar10 * auVar185._36_4_ | (uint)!bVar10 * uStack_46e0._4_4_;
      auVar181 = local_4e40._0_40_;
      local_4e40._40_4_ = (uint)bVar11 * auVar185._40_4_ | (uint)!bVar11 * (int)uStack_46d8;
      local_4e40._44_4_ = (uint)bVar12 * auVar185._44_4_ | (uint)!bVar12 * uStack_46d8._4_4_;
      auVar182 = local_4e40._0_48_;
      local_4e40._48_4_ = (uint)bVar13 * auVar185._48_4_ | (uint)!bVar13 * (int)uStack_46d0;
      local_4e40._52_4_ = (uint)bVar14 * auVar185._52_4_ | (uint)!bVar14 * uStack_46d0._4_4_;
      auVar183 = local_4e40._0_56_;
      local_4e40._56_4_ = (uint)bVar15 * auVar185._56_4_ | (uint)!bVar15 * (int)uStack_46c8;
      local_4e40._60_4_ =
           (uint)(bVar9 >> 7) * auVar185._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_46c8._4_4_;
      auVar185 = local_4e40;
      local_3000 = local_4e40._0_8_;
      uStack_2ff8 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar180._16_8_;
      uStack_2ff0 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar21._24_8_;
      uStack_2fe8 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar181._32_8_;
      uStack_2fe0 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar182._40_8_;
      uStack_2fd8 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar183._48_8_;
      uStack_2fd0 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar185._56_8_;
      uStack_2fc8 = local_4e40._56_8_;
      auVar56._16_8_ = local_4e40._16_8_;
      auVar56._0_16_ = local_4e40._0_16_;
      auVar56._24_8_ = local_4e40._24_8_;
      auVar56._32_8_ = local_4e40._32_8_;
      auVar56._40_8_ = local_4e40._40_8_;
      auVar56._48_8_ = local_4e40._48_8_;
      auVar56._56_8_ = local_4e40._56_8_;
      auVar55._16_8_ = local_4e40._16_8_;
      auVar55._0_16_ = local_4e40._0_16_;
      auVar55._24_8_ = local_4e40._24_8_;
      auVar55._32_8_ = local_4e40._32_8_;
      auVar55._40_8_ = local_4e40._40_8_;
      auVar55._48_8_ = local_4e40._48_8_;
      auVar55._56_8_ = local_4e40._56_8_;
      local_5000 = vmulps_avx512f(auVar56,auVar55);
      uStack_5038._0_4_ = 0.070376836;
      uStack_5038._4_4_ = 0.070376836;
      local_5040._0_4_ = 0.070376836;
      local_5040._4_4_ = 0.070376836;
      local_2300[0] = 0.070376836;
      local_2300[1] = 0.070376836;
      afStack_22f8[0] = 0.070376836;
      afStack_22f8[1] = 0.070376836;
      afStack_22f0[0] = 0.070376836;
      afStack_22f0[1] = 0.070376836;
      afStack_22e8[0] = 0.070376836;
      afStack_22e8[1] = 0.070376836;
      afStack_22e0[0] = 0.070376836;
      afStack_22e0[1] = 0.070376836;
      afStack_22d8[0] = 0.070376836;
      afStack_22d8[1] = 0.070376836;
      afStack_22d0[0] = 0.070376836;
      afStack_22d0[1] = 0.070376836;
      afStack_22c8[0] = 0.070376836;
      afStack_22c8[1] = 0.070376836;
      local_2340 = local_4e40._0_8_;
      uStack_2338 = local_4e40._8_8_;
      uStack_2330 = local_4e40._16_8_;
      uStack_2328 = local_4e40._24_8_;
      uStack_2320 = local_4e40._32_8_;
      uStack_2318 = local_4e40._40_8_;
      uStack_2310 = local_4e40._48_8_;
      uStack_2308 = local_4e40._56_8_;
      local_2380[0] = -0.1151461;
      local_2380[1] = -0.1151461;
      afStack_2378[0] = -0.1151461;
      afStack_2378[1] = -0.1151461;
      afStack_2370[0] = -0.1151461;
      afStack_2370[1] = -0.1151461;
      afStack_2368[0] = -0.1151461;
      afStack_2368[1] = -0.1151461;
      afStack_2360[0] = -0.1151461;
      afStack_2360[1] = -0.1151461;
      afStack_2358[0] = -0.1151461;
      afStack_2358[1] = -0.1151461;
      afStack_2350[0] = -0.1151461;
      afStack_2350[1] = -0.1151461;
      afStack_2348[0] = -0.1151461;
      afStack_2348[1] = -0.1151461;
      auVar85._16_4_ = 0.070376836;
      auVar85._20_4_ = 0.070376836;
      auVar85._0_16_ = _local_5040;
      auVar85._24_4_ = 0.070376836;
      auVar85._28_4_ = 0.070376836;
      auVar85._32_4_ = 0.070376836;
      auVar85._36_4_ = 0.070376836;
      auVar85._40_4_ = 0.070376836;
      auVar85._44_4_ = 0.070376836;
      auVar85._48_4_ = 0.070376836;
      auVar85._52_4_ = 0.070376836;
      auVar85._56_4_ = 0.070376836;
      auVar85._60_4_ = 0.070376836;
      auVar84._16_8_ = local_4e40._16_8_;
      auVar84._0_16_ = local_4e40._0_16_;
      auVar84._24_8_ = local_4e40._24_8_;
      auVar84._32_8_ = local_4e40._32_8_;
      auVar84._40_8_ = local_4e40._40_8_;
      auVar84._48_8_ = local_4e40._48_8_;
      auVar84._56_8_ = local_4e40._56_8_;
      auVar83._8_4_ = -0.1151461;
      auVar83._12_4_ = -0.1151461;
      auVar83._0_4_ = -0.1151461;
      auVar83._4_4_ = -0.1151461;
      auVar83._16_4_ = -0.1151461;
      auVar83._20_4_ = -0.1151461;
      auVar83._24_4_ = -0.1151461;
      auVar83._28_4_ = -0.1151461;
      auVar83._32_4_ = -0.1151461;
      auVar83._36_4_ = -0.1151461;
      auVar83._40_4_ = -0.1151461;
      auVar83._44_4_ = -0.1151461;
      auVar83._48_4_ = -0.1151461;
      auVar83._52_4_ = -0.1151461;
      auVar83._56_4_ = -0.1151461;
      auVar83._60_4_ = -0.1151461;
      auVar185 = vfmadd213ps_avx512f(auVar84,auVar85,auVar83);
      local_5040 = auVar185._0_8_;
      local_23c0 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_23b8 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_23b0 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_23a8 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_23a0 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2398 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2390 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2388 = uStack_5008;
      local_2400 = local_4e40._0_8_;
      uStack_23f8 = local_4e40._8_8_;
      uStack_23f0 = local_4e40._16_8_;
      uStack_23e8 = local_4e40._24_8_;
      uStack_23e0 = local_4e40._32_8_;
      uStack_23d8 = local_4e40._40_8_;
      uStack_23d0 = local_4e40._48_8_;
      uStack_23c8 = local_4e40._56_8_;
      local_2440[0] = 0.116769984;
      local_2440[1] = 0.116769984;
      afStack_2438[0] = 0.116769984;
      afStack_2438[1] = 0.116769984;
      afStack_2430[0] = 0.116769984;
      afStack_2430[1] = 0.116769984;
      afStack_2428[0] = 0.116769984;
      afStack_2428[1] = 0.116769984;
      afStack_2420[0] = 0.116769984;
      afStack_2420[1] = 0.116769984;
      afStack_2418[0] = 0.116769984;
      afStack_2418[1] = 0.116769984;
      afStack_2410[0] = 0.116769984;
      afStack_2410[1] = 0.116769984;
      afStack_2408[0] = 0.116769984;
      afStack_2408[1] = 0.116769984;
      auVar82._16_8_ = local_4e40._16_8_;
      auVar82._0_16_ = local_4e40._0_16_;
      auVar82._24_8_ = local_4e40._24_8_;
      auVar82._32_8_ = local_4e40._32_8_;
      auVar82._40_8_ = local_4e40._40_8_;
      auVar82._48_8_ = local_4e40._48_8_;
      auVar82._56_8_ = local_4e40._56_8_;
      auVar81._8_4_ = 0.116769984;
      auVar81._12_4_ = 0.116769984;
      auVar81._0_4_ = 0.116769984;
      auVar81._4_4_ = 0.116769984;
      auVar81._16_4_ = 0.116769984;
      auVar81._20_4_ = 0.116769984;
      auVar81._24_4_ = 0.116769984;
      auVar81._28_4_ = 0.116769984;
      auVar81._32_4_ = 0.116769984;
      auVar81._36_4_ = 0.116769984;
      auVar81._40_4_ = 0.116769984;
      auVar81._44_4_ = 0.116769984;
      auVar81._48_4_ = 0.116769984;
      auVar81._52_4_ = 0.116769984;
      auVar81._56_4_ = 0.116769984;
      auVar81._60_4_ = 0.116769984;
      auVar185 = vfmadd213ps_avx512f(auVar82,auVar185,auVar81);
      local_5040 = auVar185._0_8_;
      local_2480 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2478 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2470 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2468 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2460 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2458 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2450 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2448 = uStack_5008;
      local_24c0 = local_4e40._0_8_;
      uStack_24b8 = local_4e40._8_8_;
      uStack_24b0 = local_4e40._16_8_;
      uStack_24a8 = local_4e40._24_8_;
      uStack_24a0 = local_4e40._32_8_;
      uStack_2498 = local_4e40._40_8_;
      uStack_2490 = local_4e40._48_8_;
      uStack_2488 = local_4e40._56_8_;
      local_2500[0] = -0.12420141;
      local_2500[1] = -0.12420141;
      afStack_24f8[0] = -0.12420141;
      afStack_24f8[1] = -0.12420141;
      afStack_24f0[0] = -0.12420141;
      afStack_24f0[1] = -0.12420141;
      afStack_24e8[0] = -0.12420141;
      afStack_24e8[1] = -0.12420141;
      afStack_24e0[0] = -0.12420141;
      afStack_24e0[1] = -0.12420141;
      afStack_24d8[0] = -0.12420141;
      afStack_24d8[1] = -0.12420141;
      afStack_24d0[0] = -0.12420141;
      afStack_24d0[1] = -0.12420141;
      afStack_24c8[0] = -0.12420141;
      afStack_24c8[1] = -0.12420141;
      auVar80._16_8_ = local_4e40._16_8_;
      auVar80._0_16_ = local_4e40._0_16_;
      auVar80._24_8_ = local_4e40._24_8_;
      auVar80._32_8_ = local_4e40._32_8_;
      auVar80._40_8_ = local_4e40._40_8_;
      auVar80._48_8_ = local_4e40._48_8_;
      auVar80._56_8_ = local_4e40._56_8_;
      auVar79._8_4_ = -0.12420141;
      auVar79._12_4_ = -0.12420141;
      auVar79._0_4_ = -0.12420141;
      auVar79._4_4_ = -0.12420141;
      auVar79._16_4_ = -0.12420141;
      auVar79._20_4_ = -0.12420141;
      auVar79._24_4_ = -0.12420141;
      auVar79._28_4_ = -0.12420141;
      auVar79._32_4_ = -0.12420141;
      auVar79._36_4_ = -0.12420141;
      auVar79._40_4_ = -0.12420141;
      auVar79._44_4_ = -0.12420141;
      auVar79._48_4_ = -0.12420141;
      auVar79._52_4_ = -0.12420141;
      auVar79._56_4_ = -0.12420141;
      auVar79._60_4_ = -0.12420141;
      auVar185 = vfmadd213ps_avx512f(auVar80,auVar185,auVar79);
      local_5040 = auVar185._0_8_;
      local_2540 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2538 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2530 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2528 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2520 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2518 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2510 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2508 = uStack_5008;
      local_2580 = local_4e40._0_8_;
      uStack_2578 = local_4e40._8_8_;
      uStack_2570 = local_4e40._16_8_;
      uStack_2568 = local_4e40._24_8_;
      uStack_2560 = local_4e40._32_8_;
      uStack_2558 = local_4e40._40_8_;
      uStack_2550 = local_4e40._48_8_;
      uStack_2548 = local_4e40._56_8_;
      local_25c0[0] = 0.14249323;
      local_25c0[1] = 0.14249323;
      afStack_25b8[0] = 0.14249323;
      afStack_25b8[1] = 0.14249323;
      afStack_25b0[0] = 0.14249323;
      afStack_25b0[1] = 0.14249323;
      afStack_25a8[0] = 0.14249323;
      afStack_25a8[1] = 0.14249323;
      afStack_25a0[0] = 0.14249323;
      afStack_25a0[1] = 0.14249323;
      afStack_2598[0] = 0.14249323;
      afStack_2598[1] = 0.14249323;
      afStack_2590[0] = 0.14249323;
      afStack_2590[1] = 0.14249323;
      afStack_2588[0] = 0.14249323;
      afStack_2588[1] = 0.14249323;
      auVar78._16_8_ = local_4e40._16_8_;
      auVar78._0_16_ = local_4e40._0_16_;
      auVar78._24_8_ = local_4e40._24_8_;
      auVar78._32_8_ = local_4e40._32_8_;
      auVar78._40_8_ = local_4e40._40_8_;
      auVar78._48_8_ = local_4e40._48_8_;
      auVar78._56_8_ = local_4e40._56_8_;
      auVar77._8_4_ = 0.14249323;
      auVar77._12_4_ = 0.14249323;
      auVar77._0_4_ = 0.14249323;
      auVar77._4_4_ = 0.14249323;
      auVar77._16_4_ = 0.14249323;
      auVar77._20_4_ = 0.14249323;
      auVar77._24_4_ = 0.14249323;
      auVar77._28_4_ = 0.14249323;
      auVar77._32_4_ = 0.14249323;
      auVar77._36_4_ = 0.14249323;
      auVar77._40_4_ = 0.14249323;
      auVar77._44_4_ = 0.14249323;
      auVar77._48_4_ = 0.14249323;
      auVar77._52_4_ = 0.14249323;
      auVar77._56_4_ = 0.14249323;
      auVar77._60_4_ = 0.14249323;
      auVar185 = vfmadd213ps_avx512f(auVar78,auVar185,auVar77);
      local_5040 = auVar185._0_8_;
      local_2600 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_25f8 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_25f0 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_25e8 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_25e0 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_25d8 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_25d0 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_25c8 = uStack_5008;
      local_2640 = local_4e40._0_8_;
      uStack_2638 = local_4e40._8_8_;
      uStack_2630 = local_4e40._16_8_;
      uStack_2628 = local_4e40._24_8_;
      uStack_2620 = local_4e40._32_8_;
      uStack_2618 = local_4e40._40_8_;
      uStack_2610 = local_4e40._48_8_;
      uStack_2608 = local_4e40._56_8_;
      local_2680[0] = -0.16668057;
      local_2680[1] = -0.16668057;
      afStack_2678[0] = -0.16668057;
      afStack_2678[1] = -0.16668057;
      afStack_2670[0] = -0.16668057;
      afStack_2670[1] = -0.16668057;
      afStack_2668[0] = -0.16668057;
      afStack_2668[1] = -0.16668057;
      afStack_2660[0] = -0.16668057;
      afStack_2660[1] = -0.16668057;
      afStack_2658[0] = -0.16668057;
      afStack_2658[1] = -0.16668057;
      afStack_2650[0] = -0.16668057;
      afStack_2650[1] = -0.16668057;
      afStack_2648[0] = -0.16668057;
      afStack_2648[1] = -0.16668057;
      auVar76._16_8_ = local_4e40._16_8_;
      auVar76._0_16_ = local_4e40._0_16_;
      auVar76._24_8_ = local_4e40._24_8_;
      auVar76._32_8_ = local_4e40._32_8_;
      auVar76._40_8_ = local_4e40._40_8_;
      auVar76._48_8_ = local_4e40._48_8_;
      auVar76._56_8_ = local_4e40._56_8_;
      auVar75._8_4_ = -0.16668057;
      auVar75._12_4_ = -0.16668057;
      auVar75._0_4_ = -0.16668057;
      auVar75._4_4_ = -0.16668057;
      auVar75._16_4_ = -0.16668057;
      auVar75._20_4_ = -0.16668057;
      auVar75._24_4_ = -0.16668057;
      auVar75._28_4_ = -0.16668057;
      auVar75._32_4_ = -0.16668057;
      auVar75._36_4_ = -0.16668057;
      auVar75._40_4_ = -0.16668057;
      auVar75._44_4_ = -0.16668057;
      auVar75._48_4_ = -0.16668057;
      auVar75._52_4_ = -0.16668057;
      auVar75._56_4_ = -0.16668057;
      auVar75._60_4_ = -0.16668057;
      auVar185 = vfmadd213ps_avx512f(auVar76,auVar185,auVar75);
      local_5040 = auVar185._0_8_;
      local_26c0 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_26b8 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_26b0 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_26a8 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_26a0 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2698 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2690 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2688 = uStack_5008;
      local_2700 = local_4e40._0_8_;
      uStack_26f8 = local_4e40._8_8_;
      uStack_26f0 = local_4e40._16_8_;
      uStack_26e8 = local_4e40._24_8_;
      uStack_26e0 = local_4e40._32_8_;
      uStack_26d8 = local_4e40._40_8_;
      uStack_26d0 = local_4e40._48_8_;
      uStack_26c8 = local_4e40._56_8_;
      local_2740[0] = 0.20000714;
      local_2740[1] = 0.20000714;
      afStack_2738[0] = 0.20000714;
      afStack_2738[1] = 0.20000714;
      afStack_2730[0] = 0.20000714;
      afStack_2730[1] = 0.20000714;
      afStack_2728[0] = 0.20000714;
      afStack_2728[1] = 0.20000714;
      afStack_2720[0] = 0.20000714;
      afStack_2720[1] = 0.20000714;
      afStack_2718[0] = 0.20000714;
      afStack_2718[1] = 0.20000714;
      afStack_2710[0] = 0.20000714;
      afStack_2710[1] = 0.20000714;
      afStack_2708[0] = 0.20000714;
      afStack_2708[1] = 0.20000714;
      auVar74._16_8_ = local_4e40._16_8_;
      auVar74._0_16_ = local_4e40._0_16_;
      auVar74._24_8_ = local_4e40._24_8_;
      auVar74._32_8_ = local_4e40._32_8_;
      auVar74._40_8_ = local_4e40._40_8_;
      auVar74._48_8_ = local_4e40._48_8_;
      auVar74._56_8_ = local_4e40._56_8_;
      auVar73._8_4_ = 0.20000714;
      auVar73._12_4_ = 0.20000714;
      auVar73._0_4_ = 0.20000714;
      auVar73._4_4_ = 0.20000714;
      auVar73._16_4_ = 0.20000714;
      auVar73._20_4_ = 0.20000714;
      auVar73._24_4_ = 0.20000714;
      auVar73._28_4_ = 0.20000714;
      auVar73._32_4_ = 0.20000714;
      auVar73._36_4_ = 0.20000714;
      auVar73._40_4_ = 0.20000714;
      auVar73._44_4_ = 0.20000714;
      auVar73._48_4_ = 0.20000714;
      auVar73._52_4_ = 0.20000714;
      auVar73._56_4_ = 0.20000714;
      auVar73._60_4_ = 0.20000714;
      auVar185 = vfmadd213ps_avx512f(auVar74,auVar185,auVar73);
      local_5040 = auVar185._0_8_;
      local_2780 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2778 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2770 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2768 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2760 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2758 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2750 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2748 = uStack_5008;
      local_27c0 = local_4e40._0_8_;
      uStack_27b8 = local_4e40._8_8_;
      uStack_27b0 = local_4e40._16_8_;
      uStack_27a8 = local_4e40._24_8_;
      uStack_27a0 = local_4e40._32_8_;
      uStack_2798 = local_4e40._40_8_;
      uStack_2790 = local_4e40._48_8_;
      uStack_2788 = local_4e40._56_8_;
      local_2800[0] = -0.24999994;
      local_2800[1] = -0.24999994;
      afStack_27f8[0] = -0.24999994;
      afStack_27f8[1] = -0.24999994;
      afStack_27f0[0] = -0.24999994;
      afStack_27f0[1] = -0.24999994;
      afStack_27e8[0] = -0.24999994;
      afStack_27e8[1] = -0.24999994;
      afStack_27e0[0] = -0.24999994;
      afStack_27e0[1] = -0.24999994;
      afStack_27d8[0] = -0.24999994;
      afStack_27d8[1] = -0.24999994;
      afStack_27d0[0] = -0.24999994;
      afStack_27d0[1] = -0.24999994;
      afStack_27c8[0] = -0.24999994;
      afStack_27c8[1] = -0.24999994;
      auVar72._16_8_ = local_4e40._16_8_;
      auVar72._0_16_ = local_4e40._0_16_;
      auVar72._24_8_ = local_4e40._24_8_;
      auVar72._32_8_ = local_4e40._32_8_;
      auVar72._40_8_ = local_4e40._40_8_;
      auVar72._48_8_ = local_4e40._48_8_;
      auVar72._56_8_ = local_4e40._56_8_;
      auVar71._8_4_ = -0.24999994;
      auVar71._12_4_ = -0.24999994;
      auVar71._0_4_ = -0.24999994;
      auVar71._4_4_ = -0.24999994;
      auVar71._16_4_ = -0.24999994;
      auVar71._20_4_ = -0.24999994;
      auVar71._24_4_ = -0.24999994;
      auVar71._28_4_ = -0.24999994;
      auVar71._32_4_ = -0.24999994;
      auVar71._36_4_ = -0.24999994;
      auVar71._40_4_ = -0.24999994;
      auVar71._44_4_ = -0.24999994;
      auVar71._48_4_ = -0.24999994;
      auVar71._52_4_ = -0.24999994;
      auVar71._56_4_ = -0.24999994;
      auVar71._60_4_ = -0.24999994;
      auVar185 = vfmadd213ps_avx512f(auVar72,auVar185,auVar71);
      local_5040 = auVar185._0_8_;
      local_2840 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2838 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2830 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2828 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2820 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2818 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2810 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2808 = uStack_5008;
      local_2880 = local_4e40._0_8_;
      uStack_2878 = local_4e40._8_8_;
      uStack_2870 = local_4e40._16_8_;
      uStack_2868 = local_4e40._24_8_;
      uStack_2860 = local_4e40._32_8_;
      uStack_2858 = local_4e40._40_8_;
      uStack_2850 = local_4e40._48_8_;
      uStack_2848 = local_4e40._56_8_;
      local_28c0[0] = 0.3333333;
      local_28c0[1] = 0.3333333;
      afStack_28b8[0] = 0.3333333;
      afStack_28b8[1] = 0.3333333;
      afStack_28b0[0] = 0.3333333;
      afStack_28b0[1] = 0.3333333;
      afStack_28a8[0] = 0.3333333;
      afStack_28a8[1] = 0.3333333;
      afStack_28a0[0] = 0.3333333;
      afStack_28a0[1] = 0.3333333;
      afStack_2898[0] = 0.3333333;
      afStack_2898[1] = 0.3333333;
      afStack_2890[0] = 0.3333333;
      afStack_2890[1] = 0.3333333;
      afStack_2888[0] = 0.3333333;
      afStack_2888[1] = 0.3333333;
      auVar70._16_8_ = local_4e40._16_8_;
      auVar70._0_16_ = local_4e40._0_16_;
      auVar70._24_8_ = local_4e40._24_8_;
      auVar70._32_8_ = local_4e40._32_8_;
      auVar70._40_8_ = local_4e40._40_8_;
      auVar70._48_8_ = local_4e40._48_8_;
      auVar70._56_8_ = local_4e40._56_8_;
      auVar69._8_4_ = 0.3333333;
      auVar69._12_4_ = 0.3333333;
      auVar69._0_4_ = 0.3333333;
      auVar69._4_4_ = 0.3333333;
      auVar69._16_4_ = 0.3333333;
      auVar69._20_4_ = 0.3333333;
      auVar69._24_4_ = 0.3333333;
      auVar69._28_4_ = 0.3333333;
      auVar69._32_4_ = 0.3333333;
      auVar69._36_4_ = 0.3333333;
      auVar69._40_4_ = 0.3333333;
      auVar69._44_4_ = 0.3333333;
      auVar69._48_4_ = 0.3333333;
      auVar69._52_4_ = 0.3333333;
      auVar69._56_4_ = 0.3333333;
      auVar69._60_4_ = 0.3333333;
      auVar185 = vfmadd213ps_avx512f(auVar70,auVar185,auVar69);
      local_5040 = auVar185._0_8_;
      local_3040 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_3038 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_3030 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_3028 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_3020 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_3018 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_3010 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_3008 = uStack_5008;
      local_3080 = local_4e40._0_8_;
      uStack_3078 = local_4e40._8_8_;
      uStack_3070 = local_4e40._16_8_;
      uStack_3068 = local_4e40._24_8_;
      uStack_3060 = local_4e40._32_8_;
      uStack_3058 = local_4e40._40_8_;
      uStack_3050 = local_4e40._48_8_;
      uStack_3048 = local_4e40._56_8_;
      auVar54._16_8_ = local_4e40._16_8_;
      auVar54._0_16_ = local_4e40._0_16_;
      auVar54._24_8_ = local_4e40._24_8_;
      auVar54._32_8_ = local_4e40._32_8_;
      auVar54._40_8_ = local_4e40._40_8_;
      auVar54._48_8_ = local_4e40._48_8_;
      auVar54._56_8_ = local_4e40._56_8_;
      auVar185 = vmulps_avx512f(auVar185,auVar54);
      local_5040 = auVar185._0_8_;
      local_30c0 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_30b8 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_30b0 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_30a8 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_30a0 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_3098 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_3090 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_3088 = uStack_5008;
      local_3100 = local_5000._0_8_;
      uStack_30f8 = local_5000._8_8_;
      uStack_30f0 = local_5000._16_8_;
      uStack_30e8 = local_5000._24_8_;
      uStack_30e0 = local_5000._32_8_;
      uStack_30d8 = local_5000._40_8_;
      uStack_30d0 = local_5000._48_8_;
      uStack_30c8 = local_5000._56_8_;
      auVar185 = vmulps_avx512f(auVar185,local_5000);
      local_2900 = local_4f40._0_8_;
      uStack_28f8 = local_4f40._8_8_;
      uStack_4f30 = auVar191._16_8_;
      uStack_28f0 = uStack_4f30;
      uStack_4f28 = auVar16._24_8_;
      uStack_28e8 = uStack_4f28;
      uStack_4f20 = auVar177._32_8_;
      uStack_28e0 = uStack_4f20;
      uStack_4f18 = auVar178._40_8_;
      uStack_28d8 = uStack_4f18;
      uStack_4f10 = auVar179._48_8_;
      uStack_28d0 = uStack_4f10;
      uStack_4f08 = auVar184._56_8_;
      uStack_28c8 = uStack_4f08;
      local_2940[0] = -0.00021219444;
      local_2940[1] = -0.00021219444;
      afStack_2938[0] = -0.00021219444;
      afStack_2938[1] = -0.00021219444;
      afStack_2930[0] = -0.00021219444;
      afStack_2930[1] = -0.00021219444;
      afStack_2928[0] = -0.00021219444;
      afStack_2928[1] = -0.00021219444;
      afStack_2920[0] = -0.00021219444;
      afStack_2920[1] = -0.00021219444;
      afStack_2918[0] = -0.00021219444;
      afStack_2918[1] = -0.00021219444;
      afStack_2910[0] = -0.00021219444;
      afStack_2910[1] = -0.00021219444;
      afStack_2908[0] = -0.00021219444;
      afStack_2908[1] = -0.00021219444;
      local_5040 = auVar185._0_8_;
      local_2980 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2978 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2970 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2968 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2960 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2958 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2950 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2948 = uStack_5008;
      auVar68._16_8_ = uStack_4f30;
      auVar68._0_16_ = local_4f40;
      auVar68._24_8_ = uStack_4f28;
      auVar68._32_8_ = uStack_4f20;
      auVar68._40_8_ = uStack_4f18;
      auVar68._48_8_ = uStack_4f10;
      auVar68._56_8_ = uStack_4f08;
      auVar67._8_4_ = -0.00021219444;
      auVar67._12_4_ = -0.00021219444;
      auVar67._0_4_ = -0.00021219444;
      auVar67._4_4_ = -0.00021219444;
      auVar67._16_4_ = -0.00021219444;
      auVar67._20_4_ = -0.00021219444;
      auVar67._24_4_ = -0.00021219444;
      auVar67._28_4_ = -0.00021219444;
      auVar67._32_4_ = -0.00021219444;
      auVar67._36_4_ = -0.00021219444;
      auVar67._40_4_ = -0.00021219444;
      auVar67._44_4_ = -0.00021219444;
      auVar67._48_4_ = -0.00021219444;
      auVar67._52_4_ = -0.00021219444;
      auVar67._56_4_ = -0.00021219444;
      auVar67._60_4_ = -0.00021219444;
      auVar185 = vfmadd213ps_avx512f(auVar67,auVar68,auVar185);
      local_20c0 = local_5000._0_8_;
      uStack_20b8 = local_5000._8_8_;
      uStack_20b0 = local_5000._16_8_;
      uStack_20a8 = local_5000._24_8_;
      uStack_20a0 = local_5000._32_8_;
      uStack_2098 = local_5000._40_8_;
      uStack_2090 = local_5000._48_8_;
      uStack_2088 = local_5000._56_8_;
      local_2100[0] = 0.5;
      local_2100[1] = 0.5;
      afStack_20f8[0] = 0.5;
      afStack_20f8[1] = 0.5;
      afStack_20f0[0] = 0.5;
      afStack_20f0[1] = 0.5;
      afStack_20e8[0] = 0.5;
      afStack_20e8[1] = 0.5;
      afStack_20e0[0] = 0.5;
      afStack_20e0[1] = 0.5;
      afStack_20d8[0] = 0.5;
      afStack_20d8[1] = 0.5;
      afStack_20d0[0] = 0.5;
      afStack_20d0[1] = 0.5;
      afStack_20c8[0] = 0.5;
      afStack_20c8[1] = 0.5;
      local_5040 = auVar185._0_8_;
      local_2140 = local_5040;
      uStack_5038 = auVar185._8_8_;
      uStack_2138 = uStack_5038;
      uStack_5030 = auVar185._16_8_;
      uStack_2130 = uStack_5030;
      uStack_5028 = auVar185._24_8_;
      uStack_2128 = uStack_5028;
      uStack_5020 = auVar185._32_8_;
      uStack_2120 = uStack_5020;
      uStack_5018 = auVar185._40_8_;
      uStack_2118 = uStack_5018;
      uStack_5010 = auVar185._48_8_;
      uStack_2110 = uStack_5010;
      uStack_5008 = auVar185._56_8_;
      uStack_2108 = uStack_5008;
      auVar90._8_4_ = 0.5;
      auVar90._12_4_ = 0.5;
      auVar90._0_4_ = 0.5;
      auVar90._4_4_ = 0.5;
      auVar90._16_4_ = 0.5;
      auVar90._20_4_ = 0.5;
      auVar90._24_4_ = 0.5;
      auVar90._28_4_ = 0.5;
      auVar90._32_4_ = 0.5;
      auVar90._36_4_ = 0.5;
      auVar90._40_4_ = 0.5;
      auVar90._44_4_ = 0.5;
      auVar90._48_4_ = 0.5;
      auVar90._52_4_ = 0.5;
      auVar90._56_4_ = 0.5;
      auVar90._60_4_ = 0.5;
      auVar186 = vfnmadd213ps_avx512f(auVar90,local_5000,auVar185);
      local_4d00 = local_4e40._0_8_;
      uStack_4cf8 = local_4e40._8_8_;
      uStack_4cf0 = local_4e40._16_8_;
      uStack_4ce8 = local_4e40._24_8_;
      uStack_4ce0 = local_4e40._32_8_;
      uStack_4cd8 = local_4e40._40_8_;
      uStack_4cd0 = local_4e40._48_8_;
      uStack_4cc8 = local_4e40._56_8_;
      local_5040 = auVar186._0_8_;
      local_4d40 = local_5040;
      uStack_5038 = auVar186._8_8_;
      uStack_4d38 = uStack_5038;
      uStack_5030 = auVar186._16_8_;
      uStack_4d30 = uStack_5030;
      uStack_5028 = auVar186._24_8_;
      uStack_4d28 = uStack_5028;
      uStack_5020 = auVar186._32_8_;
      uStack_4d20 = uStack_5020;
      uStack_5018 = auVar186._40_8_;
      uStack_4d18 = uStack_5018;
      uStack_5010 = auVar186._48_8_;
      uStack_4d10 = uStack_5010;
      uStack_5008 = auVar186._56_8_;
      uStack_4d08 = uStack_5008;
      auVar185._16_8_ = local_4e40._16_8_;
      auVar185._0_16_ = local_4e40._0_16_;
      auVar185._24_8_ = local_4e40._24_8_;
      auVar185._32_8_ = local_4e40._32_8_;
      auVar185._40_8_ = local_4e40._40_8_;
      auVar185._48_8_ = local_4e40._48_8_;
      auVar185._56_8_ = local_4e40._56_8_;
      auVar185 = vaddps_avx512f(auVar185,auVar186);
      local_29c0 = local_4f40._0_8_;
      uStack_29b8 = local_4f40._8_8_;
      uStack_29b0 = uStack_4f30;
      uStack_29a8 = uStack_4f28;
      uStack_29a0 = uStack_4f20;
      uStack_2998 = uStack_4f18;
      uStack_2990 = uStack_4f10;
      uStack_2988 = uStack_4f08;
      local_2a00[0] = 0.6933594;
      local_2a00[1] = 0.6933594;
      afStack_29f8[0] = 0.6933594;
      afStack_29f8[1] = 0.6933594;
      afStack_29f0[0] = 0.6933594;
      afStack_29f0[1] = 0.6933594;
      afStack_29e8[0] = 0.6933594;
      afStack_29e8[1] = 0.6933594;
      afStack_29e0[0] = 0.6933594;
      afStack_29e0[1] = 0.6933594;
      afStack_29d8[0] = 0.6933594;
      afStack_29d8[1] = 0.6933594;
      afStack_29d0[0] = 0.6933594;
      afStack_29d0[1] = 0.6933594;
      afStack_29c8[0] = 0.6933594;
      afStack_29c8[1] = 0.6933594;
      local_4e40._0_8_ = auVar185._0_8_;
      local_2a40 = local_4e40._0_8_;
      local_4e40._8_8_ = auVar185._8_8_;
      uStack_2a38 = local_4e40._8_8_;
      local_4e40._16_8_ = auVar185._16_8_;
      uStack_2a30 = local_4e40._16_8_;
      local_4e40._24_8_ = auVar185._24_8_;
      uStack_2a28 = local_4e40._24_8_;
      local_4e40._32_8_ = auVar185._32_8_;
      uStack_2a20 = local_4e40._32_8_;
      local_4e40._40_8_ = auVar185._40_8_;
      uStack_2a18 = local_4e40._40_8_;
      local_4e40._48_8_ = auVar185._48_8_;
      uStack_2a10 = local_4e40._48_8_;
      local_4e40._56_8_ = auVar185._56_8_;
      uStack_2a08 = local_4e40._56_8_;
      auVar66._16_8_ = uStack_4f30;
      auVar66._0_16_ = local_4f40;
      auVar66._24_8_ = uStack_4f28;
      auVar66._32_8_ = uStack_4f20;
      auVar66._40_8_ = uStack_4f18;
      auVar66._48_8_ = uStack_4f10;
      auVar66._56_8_ = uStack_4f08;
      auVar65._8_4_ = 0.6933594;
      auVar65._12_4_ = 0.6933594;
      auVar65._0_4_ = 0.6933594;
      auVar65._4_4_ = 0.6933594;
      auVar65._16_4_ = 0.6933594;
      auVar65._20_4_ = 0.6933594;
      auVar65._24_4_ = 0.6933594;
      auVar65._28_4_ = 0.6933594;
      auVar65._32_4_ = 0.6933594;
      auVar65._36_4_ = 0.6933594;
      auVar65._40_4_ = 0.6933594;
      auVar65._44_4_ = 0.6933594;
      auVar65._48_4_ = 0.6933594;
      auVar65._52_4_ = 0.6933594;
      auVar65._56_4_ = 0.6933594;
      auVar65._60_4_ = 0.6933594;
      local_4e40 = vfmadd213ps_avx512f(auVar65,auVar66,auVar185);
      local_3680 = local_4e40._0_8_;
      uStack_3678 = local_4e40._8_8_;
      uStack_3670 = local_4e40._16_8_;
      uStack_3668 = local_4e40._24_8_;
      uStack_3660 = local_4e40._32_8_;
      uStack_3658 = local_4e40._40_8_;
      uStack_3650 = local_4e40._48_8_;
      uStack_3648 = local_4e40._56_8_;
      auVar185 = vpmovm2d_avx512dq(uVar24 & 0xffff);
      local_4dc0 = vmovdqa64_avx512f(auVar185);
      auVar185 = vmovdqa64_avx512f(local_4dc0);
      local_36c0 = vmovdqa64_avx512f(auVar185);
      auVar185 = vmovdqa64_avx512f(local_4e40);
      auVar186 = vmovdqa64_avx512f(local_36c0);
      auVar185 = vpord_avx512f(auVar185,auVar186);
      _local_5040 = vmovdqa64_avx512f(auVar185);
      local_4600 = local_5040;
      uStack_45f8 = uStack_5038;
      uStack_45f0 = uStack_5030;
      uStack_45e8 = uStack_5028;
      uStack_45e0 = uStack_5020;
      uStack_45d8 = uStack_5018;
      uStack_45d0 = uStack_5010;
      uStack_45c8 = uStack_5008;
      local_4500 = local_5040;
      uStack_44f8 = uStack_5038;
      uStack_44f0 = uStack_5030;
      uStack_44e8 = uStack_5028;
      uStack_44e0 = uStack_5020;
      uStack_44d8 = uStack_5018;
      uStack_44d0 = uStack_5010;
      uStack_44c8 = uStack_5008;
      local_4580._0_4_ = local_5040._0_4_;
      local_4580._4_4_ = local_5040._4_4_;
      uStack_4578._0_4_ = local_5040._8_4_;
      uStack_4578._4_4_ = local_5040._12_4_;
      uStack_4570._0_4_ = local_5040._16_4_;
      uStack_4570._4_4_ = local_5040._20_4_;
      uStack_4568._0_4_ = local_5040._24_4_;
      uStack_4568._4_4_ = local_5040._28_4_;
      uStack_4560._0_4_ = local_5040._32_4_;
      uStack_4560._4_4_ = local_5040._36_4_;
      uStack_4558._0_4_ = local_5040._40_4_;
      uStack_4558._4_4_ = local_5040._44_4_;
      uStack_4550._0_4_ = local_5040._48_4_;
      uStack_4550._4_4_ = local_5040._52_4_;
      uStack_4548._0_4_ = local_5040._56_4_;
      uStack_4548._4_4_ = local_5040._60_4_;
      auVar185 = vaddps_avx512f(_local_5040,*local_5338);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_4582 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4582 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4582 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4582 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4582 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4582 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4582 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4450 = local_5338;
      local_44c0 = CONCAT44((uint)bVar2 * auVar185._4_4_ | (uint)!bVar2 * local_4580._4_4_,
                            (uint)bVar1 * auVar185._0_4_ | (uint)!bVar1 * (int)local_4580);
      uStack_44b8 = CONCAT44((uint)bVar4 * auVar185._12_4_ | (uint)!bVar4 * uStack_4578._4_4_,
                             (uint)bVar3 * auVar185._8_4_ | (uint)!bVar3 * (int)uStack_4578);
      uStack_44b0 = CONCAT44((uint)bVar6 * auVar185._20_4_ | (uint)!bVar6 * uStack_4570._4_4_,
                             (uint)bVar5 * auVar185._16_4_ | (uint)!bVar5 * (int)uStack_4570);
      uStack_44a8 = CONCAT44((uint)bVar8 * auVar185._28_4_ | (uint)!bVar8 * uStack_4568._4_4_,
                             (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * (int)uStack_4568);
      uStack_44a0 = CONCAT44((uint)bVar10 * auVar185._36_4_ | (uint)!bVar10 * uStack_4560._4_4_,
                             (uint)(bVar9 & 1) * auVar185._32_4_ |
                             (uint)!(bool)(bVar9 & 1) * (int)uStack_4560);
      uStack_4498 = CONCAT44((uint)bVar12 * auVar185._44_4_ | (uint)!bVar12 * uStack_4558._4_4_,
                             (uint)bVar11 * auVar185._40_4_ | (uint)!bVar11 * (int)uStack_4558);
      uStack_4490 = CONCAT44((uint)bVar14 * auVar185._52_4_ | (uint)!bVar14 * uStack_4550._4_4_,
                             (uint)bVar13 * auVar185._48_4_ | (uint)!bVar13 * (int)uStack_4550);
      uStack_4488 = CONCAT44((uint)(bVar9 >> 7) * auVar185._60_4_ |
                             (uint)!(bool)(bVar9 >> 7) * uStack_4548._4_4_,
                             (uint)bVar15 * auVar185._56_4_ | (uint)!bVar15 * (int)uStack_4548);
      *(undefined8 *)*local_5338 = local_44c0;
      *(undefined8 *)(*local_5338 + 8) = uStack_44b8;
      *(undefined8 *)(*local_5338 + 0x10) = uStack_44b0;
      *(undefined8 *)(*local_5338 + 0x18) = uStack_44a8;
      *(undefined8 *)(*local_5338 + 0x20) = uStack_44a0;
      *(undefined8 *)(*local_5338 + 0x28) = uStack_4498;
      *(undefined8 *)(*local_5338 + 0x30) = uStack_4490;
      *(undefined8 *)(*local_5338 + 0x38) = uStack_4488;
      local_5338 = local_5338 + 1;
      local_5100 = local_5140;
      uStack_50f8 = uStack_5138;
      uStack_50f0 = uStack_5130;
      uStack_50e8 = uStack_5128;
      uStack_50e0 = uStack_5120;
      uStack_50d8 = uStack_5118;
      uStack_50d0 = uStack_5110;
      uStack_50c8 = uStack_5108;
      _local_4f40 = auVar184;
      _local_4a80 = auVar48;
      local_4702 = local_4f42;
      local_4700 = local_4780;
      uStack_46f8 = uStack_4778;
      uStack_46f0 = uStack_4770;
      uStack_46e8 = uStack_4768;
      uStack_46e0 = uStack_4760;
      uStack_46d8 = uStack_4758;
      uStack_46d0 = uStack_4750;
      uStack_46c8 = uStack_4748;
      local_4640 = local_5140;
      uStack_4638 = uStack_5138;
      uStack_4630 = uStack_5130;
      uStack_4628 = uStack_5128;
      uStack_4620 = uStack_5120;
      uStack_4618 = uStack_5118;
      uStack_4610 = uStack_5110;
      uStack_4608 = uStack_5108;
      local_4580 = local_4600;
      uStack_4578 = uStack_45f8;
      uStack_4570 = uStack_45f0;
      uStack_4568 = uStack_45e8;
      uStack_4560 = uStack_45e0;
      uStack_4558 = uStack_45d8;
      uStack_4550 = uStack_45d0;
      uStack_4548 = uStack_45c8;
      local_4540 = local_5140;
      uStack_4538 = uStack_5138;
      uStack_4530 = uStack_5130;
      uStack_4528 = uStack_5128;
      uStack_4520 = uStack_5120;
      uStack_4518 = uStack_5118;
      uStack_4510 = uStack_5110;
      uStack_4508 = uStack_5108;
      local_3442 = local_4b02;
      local_3440 = local_34c0;
      uStack_3438 = uStack_34b8;
      uStack_3430 = uStack_34b0;
      uStack_3428 = uStack_34a8;
      uStack_3420 = uStack_34a0;
      uStack_3418 = uStack_3498;
      uStack_3410 = uStack_3490;
      uStack_3408 = uStack_3488;
      local_32c2 = local_4f42;
      local_32c0 = local_3340;
      uStack_32b8 = uStack_3338;
      uStack_32b0 = uStack_3330;
      uStack_32a8 = uStack_3328;
      uStack_32a0 = uStack_3320;
      uStack_3298 = uStack_3318;
      uStack_3290 = uStack_3310;
      uStack_3288 = uStack_3308;
      local_3140 = local_3180;
      uStack_3138 = uStack_3178;
      uStack_3130 = uStack_3170;
      uStack_3128 = uStack_3168;
      uStack_3120 = uStack_3160;
      uStack_3118 = uStack_3158;
      uStack_3110 = uStack_3150;
      uStack_3108 = uStack_3148;
      local_2fc0 = local_3000;
      uStack_2fb8 = uStack_2ff8;
      uStack_2fb0 = uStack_2ff0;
      uStack_2fa8 = uStack_2fe8;
      uStack_2fa0 = uStack_2fe0;
      uStack_2f98 = uStack_2fd8;
      uStack_2f90 = uStack_2fd0;
      uStack_2f88 = uStack_2fc8;
      local_2042 = local_4ec2;
    }
    local_4444 = 0x3f800000;
    local_1e04 = 0x3f800000;
    local_1e08 = 0x3f800000;
    local_1e0c = 0x3f800000;
    local_1e10 = 0x3f800000;
    local_1e14 = 0x3f800000;
    local_1e18 = 0x3f800000;
    local_1e1c = 0x3f800000;
    local_1e20 = 0x3f800000;
    auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
    local_1e40 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
    auStack_1e30 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
    local_4420 = 0;
    uStack_4418 = 0;
    uStack_4410 = 0;
    uStack_4408 = 0;
    for (; local_5390 + 7 < local_5328; local_5390 = local_5390 + 8) {
      local_43e8 = local_5338;
      local_43c0 = *(undefined8 *)*local_5338;
      uStack_43b8 = *(undefined8 *)(*local_5338 + 8);
      uStack_43b0 = *(undefined8 *)(*local_5338 + 0x10);
      uStack_43a8 = *(undefined8 *)(*local_5338 + 0x18);
      uStack_5594 = (undefined4)((ulong)uStack_43b8 >> 0x20);
      uStack_5590 = (undefined4)uStack_43b0;
      uStack_558c = (undefined4)((ulong)uStack_43b0 >> 0x20);
      uStack_5588 = (undefined4)uStack_43a8;
      uStack_5584 = (undefined4)((ulong)uStack_43a8 >> 0x20);
      auVar16._12_4_ = uStack_5594;
      auVar16._0_12_ = *(undefined1 (*) [12])*local_5338;
      auVar16._16_4_ = uStack_5590;
      auVar16._20_4_ = uStack_558c;
      auVar16._24_4_ = uStack_5588;
      auVar16._28_4_ = uStack_5584;
      local_4440 = 0;
      uStack_4438 = 0;
      uStack_4430 = 0;
      uStack_4428 = 0;
      auVar16 = vcmpps_avx(ZEXT1632(ZEXT816(0)),auVar16,1);
      local_43a0[0] = 0x7fffffff;
      local_43a0[1] = 0x7fffffff;
      aiStack_4398[0] = 0x7fffffff;
      aiStack_4398[1] = 0x7fffffff;
      aiStack_4390[0] = 0x7fffffff;
      aiStack_4390[1] = 0x7fffffff;
      aiStack_4388[0] = 0x7fffffff;
      aiStack_4388[1] = 0x7fffffff;
      auVar21._8_4_ = 0x7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar21._0_4_ = 0x7fffffff;
      auVar21._4_4_ = 0x7fffffff;
      auVar21._16_4_ = 0x7fffffff;
      auVar21._20_4_ = 0x7fffffff;
      auVar21._24_4_ = 0x7fffffff;
      auVar21._28_4_ = 0x7fffffff;
      auVar21 = vpand_avx2(*(undefined1 (*) [32])*local_5338,auVar21);
      local_3da0 = 0;
      uStack_3d98 = 0;
      uStack_3d90 = 0;
      uStack_3d88 = 0;
      local_55e0 = auVar21._0_8_;
      local_3dc0 = local_55e0;
      uStack_55d8 = auVar21._8_8_;
      uStack_3db8 = uStack_55d8;
      uStack_55d0 = auVar21._16_8_;
      uStack_3db0 = uStack_55d0;
      uStack_55c8 = auVar21._24_8_;
      uStack_3da8 = uStack_55c8;
      auVar21 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar21);
      local_3f20 = 0;
      uStack_3f18 = 0;
      uStack_3f10 = 0;
      uStack_3f08 = 0;
      local_3fc0 = 0x3f800000;
      uStack_3fbc = 0x3f800000;
      uStack_3fb8 = 0x3f800000;
      uStack_3fb4 = 0x3f800000;
      uStack_3fb0 = 0x3f800000;
      uStack_3fac = 0x3f800000;
      uStack_3fa8 = 0x3f800000;
      uStack_3fa4 = 0x3f800000;
      local_3f40._0_8_ = auVar21._0_8_;
      local_b60 = local_3f40._0_8_;
      local_3f40._8_8_ = auVar21._8_8_;
      uStack_b58 = local_3f40._8_8_;
      local_3f40._16_8_ = auVar21._16_8_;
      uStack_b50 = local_3f40._16_8_;
      local_3f40._24_8_ = auVar21._24_8_;
      uStack_b48 = local_3f40._24_8_;
      local_b80 = 0x42b0c0a5;
      uStack_b7c = 0x42b0c0a5;
      uStack_b78 = 0x42b0c0a5;
      uStack_b74 = 0x42b0c0a5;
      uStack_b70 = 0x42b0c0a5;
      uStack_b6c = 0x42b0c0a5;
      uStack_b68 = 0x42b0c0a5;
      uStack_b64 = 0x42b0c0a5;
      auVar131._8_4_ = 0x42b0c0a5;
      auVar131._0_8_ = 0x42b0c0a542b0c0a5;
      auVar131._12_4_ = 0x42b0c0a5;
      auVar131._16_4_ = 0x42b0c0a5;
      auVar131._20_4_ = 0x42b0c0a5;
      auVar131._24_4_ = 0x42b0c0a5;
      auVar131._28_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar131);
      local_3f40._0_8_ = auVar21._0_8_;
      local_1de0 = local_3f40._0_8_;
      local_3f40._8_8_ = auVar21._8_8_;
      uStack_1dd8 = local_3f40._8_8_;
      local_3f40._16_8_ = auVar21._16_8_;
      uStack_1dd0 = local_3f40._16_8_;
      local_3f40._24_8_ = auVar21._24_8_;
      uStack_1dc8 = local_3f40._24_8_;
      local_1e00 = 0xc2b0c0a5;
      uStack_1dfc = 0xc2b0c0a5;
      uStack_1df8 = 0xc2b0c0a5;
      uStack_1df4 = 0xc2b0c0a5;
      uStack_1df0 = 0xc2b0c0a5;
      uStack_1dec = 0xc2b0c0a5;
      uStack_1de8 = 0xc2b0c0a5;
      uStack_1de4 = 0xc2b0c0a5;
      auVar93._8_4_ = 0xc2b0c0a5;
      auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar93._12_4_ = 0xc2b0c0a5;
      auVar93._16_4_ = 0xc2b0c0a5;
      auVar93._20_4_ = 0xc2b0c0a5;
      auVar93._24_4_ = 0xc2b0c0a5;
      auVar93._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar21,auVar93);
      local_3f40._0_8_ = auVar19._0_8_;
      local_1880 = local_3f40._0_8_;
      local_3f40._8_8_ = auVar19._8_8_;
      uStack_1878 = local_3f40._8_8_;
      local_3f40._16_8_ = auVar19._16_8_;
      uStack_1870 = local_3f40._16_8_;
      local_3f40._24_8_ = auVar19._24_8_;
      uStack_1868 = local_3f40._24_8_;
      local_18a0 = 0x3fb8aa3b;
      uStack_189c = 0x3fb8aa3b;
      uStack_1898 = 0x3fb8aa3b;
      uStack_1894 = 0x3fb8aa3b;
      uStack_1890 = 0x3fb8aa3b;
      uStack_188c = 0x3fb8aa3b;
      uStack_1888 = 0x3fb8aa3b;
      uStack_1884 = 0x3fb8aa3b;
      local_18c0 = 0x3f000000;
      uStack_18bc = 0x3f000000;
      uStack_18b8 = 0x3f000000;
      uStack_18b4 = 0x3f000000;
      uStack_18b0 = 0x3f000000;
      uStack_18ac = 0x3f000000;
      uStack_18a8 = 0x3f000000;
      uStack_18a4 = 0x3f000000;
      local_f00 = local_3f40._0_8_;
      uStack_ef8 = local_3f40._8_8_;
      uStack_ef0 = local_3f40._16_8_;
      uStack_ee8 = local_3f40._24_8_;
      local_f20 = 0x3fb8aa3b3fb8aa3b;
      uStack_f18 = 0x3fb8aa3b3fb8aa3b;
      uStack_f10 = 0x3fb8aa3b3fb8aa3b;
      uStack_f08 = 0x3fb8aa3b3fb8aa3b;
      local_f40 = 0x3f0000003f000000;
      uStack_f38 = 0x3f0000003f000000;
      uStack_f30 = 0x3f0000003f000000;
      uStack_f28 = 0x3f0000003f000000;
      auVar120._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar120._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar120._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar120._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar119._8_8_ = 0x3f0000003f000000;
      auVar119._0_8_ = 0x3f0000003f000000;
      auVar119._16_8_ = 0x3f0000003f000000;
      auVar119._24_8_ = 0x3f0000003f000000;
      auVar17 = vfmadd213ps_fma(auVar120,auVar19,auVar119);
      auVar20 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar21 = vcmpps_avx(ZEXT1632(auVar17),auVar20,1);
      local_3fe0._0_8_ = auVar21._0_8_;
      local_3ee0 = local_3fe0._0_8_;
      local_3fe0._8_8_ = auVar21._8_8_;
      uStack_3ed8 = local_3fe0._8_8_;
      local_3fe0._16_8_ = auVar21._16_8_;
      uStack_3ed0 = local_3fe0._16_8_;
      local_3fe0._24_8_ = auVar21._24_8_;
      uStack_3ec8 = local_3fe0._24_8_;
      local_3f00 = 0x3f8000003f800000;
      uStack_3ef8 = 0x3f8000003f800000;
      uStack_3ef0 = 0x3f8000003f800000;
      uStack_3ee8 = 0x3f8000003f800000;
      auVar41._8_8_ = 0x3f8000003f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._16_8_ = 0x3f8000003f800000;
      auVar41._24_8_ = 0x3f8000003f800000;
      local_3fe0 = vpand_avx2(auVar21,auVar41);
      local_3f60 = auVar20._0_8_;
      local_3e60 = local_3f60;
      uStack_3f58 = auVar20._8_8_;
      uStack_3e58 = uStack_3f58;
      uStack_3f50 = auVar20._16_8_;
      uStack_3e50 = uStack_3f50;
      uStack_3f48 = auVar20._24_8_;
      uStack_3e48 = uStack_3f48;
      local_3e80 = local_3fe0._0_8_;
      uStack_3e78 = local_3fe0._8_8_;
      uStack_3e70 = local_3fe0._16_8_;
      uStack_3e68 = local_3fe0._24_8_;
      local_3f80 = vsubps_avx(auVar20,local_3fe0);
      local_1400 = local_3f80._0_8_;
      uStack_13f8 = local_3f80._8_8_;
      uStack_13f0 = local_3f80._16_8_;
      uStack_13e8 = local_3f80._24_8_;
      local_1440 = local_3f40._0_8_;
      uStack_1438 = local_3f40._8_8_;
      uStack_1430 = local_3f40._16_8_;
      uStack_1428 = local_3f40._24_8_;
      local_1420 = 0x3f318000;
      uStack_141c = 0x3f318000;
      uStack_1418 = 0x3f318000;
      uStack_1414 = 0x3f318000;
      uStack_1410 = 0x3f318000;
      uStack_140c = 0x3f318000;
      uStack_1408 = 0x3f318000;
      uStack_1404 = 0x3f318000;
      local_c00 = local_3f80._0_8_;
      uStack_bf8 = local_3f80._8_8_;
      uStack_bf0 = local_3f80._16_8_;
      uStack_be8 = local_3f80._24_8_;
      local_c20 = 0x3f3180003f318000;
      uStack_c18 = 0x3f3180003f318000;
      uStack_c10 = 0x3f3180003f318000;
      uStack_c08 = 0x3f3180003f318000;
      local_c40 = local_3f40._0_8_;
      uStack_c38 = local_3f40._8_8_;
      uStack_c30 = local_3f40._16_8_;
      uStack_c28 = local_3f40._24_8_;
      auVar129._8_8_ = 0x3f3180003f318000;
      auVar129._0_8_ = 0x3f3180003f318000;
      auVar129._16_8_ = 0x3f3180003f318000;
      auVar129._24_8_ = 0x3f3180003f318000;
      auVar17 = vfnmadd213ps_fma(auVar129,local_3f80,auVar19);
      local_1460 = local_3f80._0_8_;
      uStack_1458 = local_3f80._8_8_;
      uStack_1450 = local_3f80._16_8_;
      uStack_1448 = local_3f80._24_8_;
      local_3f40._0_8_ = auVar17._0_8_;
      local_14a0 = local_3f40._0_8_;
      local_3f40._8_8_ = auVar17._8_8_;
      uStack_1498 = local_3f40._8_8_;
      uStack_1490 = 0;
      uStack_1488 = 0;
      local_1480 = 0xb95e8083;
      uStack_147c = 0xb95e8083;
      uStack_1478 = 0xb95e8083;
      uStack_1474 = 0xb95e8083;
      uStack_1470 = 0xb95e8083;
      uStack_146c = 0xb95e8083;
      uStack_1468 = 0xb95e8083;
      uStack_1464 = 0xb95e8083;
      local_ba0 = local_3f80._0_8_;
      uStack_b98 = local_3f80._8_8_;
      uStack_b90 = local_3f80._16_8_;
      uStack_b88 = local_3f80._24_8_;
      local_bc0 = 0xb95e8083b95e8083;
      uStack_bb8 = 0xb95e8083b95e8083;
      uStack_bb0 = 0xb95e8083b95e8083;
      uStack_ba8 = 0xb95e8083b95e8083;
      local_be0 = local_3f40._0_8_;
      uStack_bd8 = local_3f40._8_8_;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      auVar130._8_8_ = 0xb95e8083b95e8083;
      auVar130._0_8_ = 0xb95e8083b95e8083;
      auVar130._16_8_ = 0xb95e8083b95e8083;
      auVar130._24_8_ = 0xb95e8083b95e8083;
      auVar25 = vfnmadd213ps_fma(auVar130,local_3f80,ZEXT1632(auVar17));
      local_3f40._0_8_ = auVar25._0_8_;
      local_1c00 = local_3f40._0_8_;
      local_3f40._8_8_ = auVar25._8_8_;
      uStack_1bf8 = local_3f40._8_8_;
      uStack_1bf0 = 0;
      uStack_1be8 = 0;
      local_1be0._0_4_ = auVar25._0_4_;
      local_1be0._4_4_ = auVar25._4_4_;
      uStack_1bd8._0_4_ = auVar25._8_4_;
      uStack_1bd8._4_4_ = auVar25._12_4_;
      local_3f60._4_4_ = local_1be0._4_4_ * local_1be0._4_4_;
      local_3f60._0_4_ = (float)local_1be0 * (float)local_1be0;
      local_1ae0 = local_3f60;
      uStack_3f58._0_4_ = (float)uStack_1bd8 * (float)uStack_1bd8;
      uStack_3f58._4_4_ = uStack_1bd8._4_4_ * uStack_1bd8._4_4_;
      auVar189 = _local_3f60;
      _local_3f60 = ZEXT1632(_local_3f60);
      auVar93 = _local_3f60;
      uStack_3ff8._0_4_ = 0x39506967;
      local_4000 = (undefined1  [8])0x3950696739506967;
      uStack_3ff8._4_4_ = 0x39506967;
      uStack_3ff0._0_4_ = 0x39506967;
      uStack_3ff0._4_4_ = 0x39506967;
      auVar191 = _local_4000;
      uStack_3fe8._0_4_ = 0x39506967;
      uStack_3fe8._4_4_ = 0x39506967;
      auVar21 = _local_4000;
      local_18e0 = 0x3950696739506967;
      uStack_18d8 = uStack_3ff8;
      uStack_3ff0 = auVar191._16_8_;
      uStack_18d0 = uStack_3ff0;
      uStack_3fe8 = auVar21._24_8_;
      uStack_18c8 = uStack_3fe8;
      local_1900 = local_3f40._0_8_;
      uStack_18f8 = local_3f40._8_8_;
      uStack_18f0 = 0;
      uStack_18e8 = 0;
      local_1920 = 0x3ab743ce;
      uStack_191c = 0x3ab743ce;
      uStack_1918 = 0x3ab743ce;
      uStack_1914 = 0x3ab743ce;
      uStack_1910 = 0x3ab743ce;
      uStack_190c = 0x3ab743ce;
      uStack_1908 = 0x3ab743ce;
      uStack_1904 = 0x3ab743ce;
      local_ea0 = 0x3950696739506967;
      uStack_e98 = uStack_3ff8;
      uStack_e90 = uStack_3ff0;
      uStack_e88 = uStack_3fe8;
      local_ec0 = local_3f40._0_8_;
      uStack_eb8 = local_3f40._8_8_;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = 0x3ab743ce3ab743ce;
      uStack_ed8 = 0x3ab743ce3ab743ce;
      uStack_ed0 = 0x3ab743ce3ab743ce;
      uStack_ec8 = 0x3ab743ce3ab743ce;
      auVar122._16_8_ = uStack_3ff0;
      auVar122._0_16_ = _local_4000;
      auVar122._24_8_ = uStack_3fe8;
      auVar121._8_8_ = 0x3ab743ce3ab743ce;
      auVar121._0_8_ = 0x3ab743ce3ab743ce;
      auVar121._16_8_ = 0x3ab743ce3ab743ce;
      auVar121._24_8_ = 0x3ab743ce3ab743ce;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar122,auVar121);
      local_4000 = auVar17._0_8_;
      local_1940 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uStack_1938 = uStack_3ff8;
      uStack_1930 = 0;
      uStack_1928 = 0;
      local_1960 = local_3f40._0_8_;
      uStack_1958 = local_3f40._8_8_;
      uStack_1950 = 0;
      uStack_1948 = 0;
      local_1980 = 0x3c088908;
      uStack_197c = 0x3c088908;
      uStack_1978 = 0x3c088908;
      uStack_1974 = 0x3c088908;
      uStack_1970 = 0x3c088908;
      uStack_196c = 0x3c088908;
      uStack_1968 = 0x3c088908;
      uStack_1964 = 0x3c088908;
      local_e40 = local_4000;
      uStack_e38 = uStack_3ff8;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = local_3f40._0_8_;
      uStack_e58 = local_3f40._8_8_;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = 0x3c0889083c088908;
      uStack_e78 = 0x3c0889083c088908;
      uStack_e70 = 0x3c0889083c088908;
      uStack_e68 = 0x3c0889083c088908;
      auVar123._8_8_ = 0x3c0889083c088908;
      auVar123._0_8_ = 0x3c0889083c088908;
      auVar123._16_8_ = 0x3c0889083c088908;
      auVar123._24_8_ = 0x3c0889083c088908;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar17),auVar123);
      local_4000 = auVar17._0_8_;
      local_19a0 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uStack_1998 = uStack_3ff8;
      uStack_1990 = 0;
      uStack_1988 = 0;
      local_19c0 = local_3f40._0_8_;
      uStack_19b8 = local_3f40._8_8_;
      uStack_19b0 = 0;
      uStack_19a8 = 0;
      local_19e0 = 0x3d2aa9c1;
      uStack_19dc = 0x3d2aa9c1;
      uStack_19d8 = 0x3d2aa9c1;
      uStack_19d4 = 0x3d2aa9c1;
      uStack_19d0 = 0x3d2aa9c1;
      uStack_19cc = 0x3d2aa9c1;
      uStack_19c8 = 0x3d2aa9c1;
      uStack_19c4 = 0x3d2aa9c1;
      local_de0 = local_4000;
      uStack_dd8 = uStack_3ff8;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_e00 = local_3f40._0_8_;
      uStack_df8 = local_3f40._8_8_;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = 0x3d2aa9c13d2aa9c1;
      uStack_e18 = 0x3d2aa9c13d2aa9c1;
      uStack_e10 = 0x3d2aa9c13d2aa9c1;
      uStack_e08 = 0x3d2aa9c13d2aa9c1;
      auVar124._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar124._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar124._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar124._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar17),auVar124);
      local_4000 = auVar17._0_8_;
      local_1a00 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uStack_19f8 = uStack_3ff8;
      uStack_19f0 = 0;
      uStack_19e8 = 0;
      local_1a20 = local_3f40._0_8_;
      uStack_1a18 = local_3f40._8_8_;
      uStack_1a10 = 0;
      uStack_1a08 = 0;
      local_1a40 = 0x3e2aaaaa;
      uStack_1a3c = 0x3e2aaaaa;
      uStack_1a38 = 0x3e2aaaaa;
      uStack_1a34 = 0x3e2aaaaa;
      uStack_1a30 = 0x3e2aaaaa;
      uStack_1a2c = 0x3e2aaaaa;
      uStack_1a28 = 0x3e2aaaaa;
      uStack_1a24 = 0x3e2aaaaa;
      local_d80 = local_4000;
      uStack_d78 = uStack_3ff8;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = local_3f40._0_8_;
      uStack_d98 = local_3f40._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = 0x3e2aaaaa3e2aaaaa;
      uStack_db8 = 0x3e2aaaaa3e2aaaaa;
      uStack_db0 = 0x3e2aaaaa3e2aaaaa;
      uStack_da8 = 0x3e2aaaaa3e2aaaaa;
      auVar125._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar125._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar125._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar125._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar17),auVar125);
      local_4000 = auVar17._0_8_;
      local_1a60 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uStack_1a58 = uStack_3ff8;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = local_3f40._0_8_;
      uStack_1a78 = local_3f40._8_8_;
      uStack_1a70 = 0;
      uStack_1a68 = 0;
      local_1aa0 = 0x3f000000;
      uStack_1a9c = 0x3f000000;
      uStack_1a98 = 0x3f000000;
      uStack_1a94 = 0x3f000000;
      uStack_1a90 = 0x3f000000;
      uStack_1a8c = 0x3f000000;
      uStack_1a88 = 0x3f000000;
      uStack_1a84 = 0x3f000000;
      local_d20 = local_4000;
      uStack_d18 = uStack_3ff8;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_d40 = local_3f40._0_8_;
      uStack_d38 = local_3f40._8_8_;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = 0x3f0000003f000000;
      uStack_d58 = 0x3f0000003f000000;
      uStack_d50 = 0x3f0000003f000000;
      uStack_d48 = 0x3f0000003f000000;
      auVar126._8_8_ = 0x3f0000003f000000;
      auVar126._0_8_ = 0x3f0000003f000000;
      auVar126._16_8_ = 0x3f0000003f000000;
      auVar126._24_8_ = 0x3f0000003f000000;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar25),ZEXT1632(auVar17),auVar126);
      local_4000 = auVar17._0_8_;
      local_1ac0 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uStack_1ab8 = uStack_3ff8;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      uStack_3f58 = auVar189._8_8_;
      uStack_1ad8 = uStack_3f58;
      uStack_1ad0 = 0;
      uStack_1ac8 = 0;
      local_1b00 = local_3f40._0_8_;
      uStack_1af8 = local_3f40._8_8_;
      uStack_1af0 = 0;
      uStack_1ae8 = 0;
      local_cc0 = local_4000;
      uStack_cb8 = uStack_3ff8;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      local_ce0 = local_1ae0;
      uStack_cd8 = uStack_3f58;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_3f40._0_8_;
      uStack_cf8 = local_3f40._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar189),ZEXT1632(auVar17),ZEXT1632(auVar25));
      local_4000 = auVar17._0_8_;
      uVar22 = local_4000;
      uStack_3ff8 = auVar17._8_8_;
      uVar23 = uStack_3ff8;
      uStack_3e90 = 0;
      uStack_3e88 = 0;
      local_3ec0 = 0x3f8000003f800000;
      uStack_3eb8 = 0x3f8000003f800000;
      uStack_3eb0 = 0x3f8000003f800000;
      uStack_3ea8 = 0x3f8000003f800000;
      local_3ea0._0_4_ = auVar17._0_4_;
      local_3ea0._4_4_ = auVar17._4_4_;
      uStack_3e98._0_4_ = auVar17._8_4_;
      uStack_3e98._4_4_ = auVar17._12_4_;
      local_4000._4_4_ = local_3ea0._4_4_ + 1.0;
      local_4000._0_4_ = (float)local_3ea0 + 1.0;
      uStack_3ff8._0_4_ = (float)uStack_3e98 + 1.0;
      uStack_3ff8._4_4_ = uStack_3e98._4_4_ + 1.0;
      uStack_3ff0._0_4_ = 0x3f800000;
      uStack_3ff0._4_4_ = 0x3f800000;
      auVar191 = _local_4000;
      uStack_3fe8._0_4_ = 0x3f800000;
      uStack_3fe8._4_4_ = 0x3f800000;
      auVar19 = _local_4000;
      local_b40._0_4_ = local_3f80._0_4_;
      local_b40._4_4_ = local_3f80._4_4_;
      uStack_b38._0_4_ = local_3f80._8_4_;
      uStack_b38._4_4_ = local_3f80._12_4_;
      uStack_b30._0_4_ = local_3f80._16_4_;
      uStack_b30._4_4_ = local_3f80._20_4_;
      uStack_b28._0_4_ = local_3f80._24_4_;
      uStack_b28._4_4_ = local_3f80._28_4_;
      local_3fa0._4_4_ = (int)local_b40._4_4_;
      local_3fa0._0_4_ = (int)(float)local_b40;
      local_3fa0._8_4_ = (int)(float)uStack_b38;
      local_3fa0._12_4_ = (int)uStack_b38._4_4_;
      local_3fa0._16_4_ = (int)(float)uStack_b30;
      local_3fa0._20_4_ = (int)uStack_b30._4_4_;
      auVar180 = local_3fa0._0_24_;
      local_3fa0._24_4_ = (int)(float)uStack_b28;
      local_3fa0._28_4_ = (int)uStack_b28._4_4_;
      auVar21 = local_3fa0;
      local_b00 = local_3fa0._0_8_;
      uStack_af8 = local_3fa0._8_8_;
      local_3fa0._16_8_ = auVar180._16_8_;
      uStack_af0 = local_3fa0._16_8_;
      local_3fa0._24_8_ = auVar21._24_8_;
      uStack_ae8 = local_3fa0._24_8_;
      local_b20 = 0x7f0000007f;
      uStack_b18 = 0x7f0000007f;
      uStack_b10 = 0x7f0000007f;
      uStack_b08 = 0x7f0000007f;
      local_a60 = local_3fa0._0_8_;
      uStack_a58 = local_3fa0._8_8_;
      uStack_a50 = local_3fa0._16_8_;
      uStack_a48 = local_3fa0._24_8_;
      local_a80 = 0x7f0000007f;
      uStack_a78 = 0x7f0000007f;
      uStack_a70 = 0x7f0000007f;
      uStack_a68 = 0x7f0000007f;
      auVar133._16_8_ = local_3fa0._16_8_;
      auVar133._0_16_ = local_3fa0._0_16_;
      auVar133._24_8_ = local_3fa0._24_8_;
      auVar132._8_8_ = 0x7f0000007f;
      auVar132._0_8_ = 0x7f0000007f;
      auVar132._16_8_ = 0x7f0000007f;
      auVar132._24_8_ = 0x7f0000007f;
      auVar21 = vpaddd_avx2(auVar132,auVar133);
      local_3fa0._0_8_ = auVar21._0_8_;
      local_ac0 = local_3fa0._0_8_;
      local_3fa0._8_8_ = auVar21._8_8_;
      uStack_ab8 = local_3fa0._8_8_;
      local_3fa0._16_8_ = auVar21._16_8_;
      uStack_ab0 = local_3fa0._16_8_;
      local_3fa0._24_8_ = auVar21._24_8_;
      uStack_aa8 = local_3fa0._24_8_;
      local_ac4 = 0x17;
      local_a20 = local_3fa0._0_8_;
      uStack_a18 = local_3fa0._8_8_;
      uStack_a10 = local_3fa0._16_8_;
      uStack_a08 = local_3fa0._24_8_;
      local_a24 = 0x17;
      local_3fa0 = vpslld_avx2(auVar21,ZEXT416(0x17));
      local_aa0 = local_3fa0._0_8_;
      uStack_a98 = local_3fa0._8_8_;
      uStack_a90 = local_3fa0._16_8_;
      uStack_a88 = local_3fa0._24_8_;
      local_4020 = local_3fa0._0_8_;
      uStack_4018 = local_3fa0._8_8_;
      uStack_4010 = local_3fa0._16_8_;
      uStack_4008 = local_3fa0._24_8_;
      local_1c20 = local_4000;
      uStack_1c18 = uStack_3ff8;
      uStack_3ff0 = auVar191._16_8_;
      uStack_1c10 = uStack_3ff0;
      uStack_3fe8 = auVar19._24_8_;
      uStack_1c08 = uStack_3fe8;
      local_1c40 = local_3fa0._0_8_;
      uStack_1c38 = local_3fa0._8_8_;
      uStack_1c30 = local_3fa0._16_8_;
      uStack_1c28 = local_3fa0._24_8_;
      local_4000._0_4_ = local_3fa0._0_4_ * ((float)local_3ea0 + 1.0);
      local_4000._4_4_ = local_3fa0._4_4_ * (local_3ea0._4_4_ + 1.0);
      fVar193 = local_3fa0._8_4_ * ((float)uStack_3e98 + 1.0);
      fVar194 = local_3fa0._12_4_ * (uStack_3e98._4_4_ + 1.0);
      fVar195 = local_3fa0._16_4_ * 1.0;
      fVar196 = local_3fa0._20_4_ * 1.0;
      fVar197 = local_3fa0._24_4_ * 1.0;
      uStack_3ff8._0_4_ = fVar193;
      uStack_3ff8._4_4_ = fVar194;
      uStack_3ff0._0_4_ = fVar195;
      uStack_3ff0._4_4_ = fVar196;
      auVar191 = _local_4000;
      uStack_3fe8._0_4_ = fVar197;
      uStack_3fe8._4_4_ = 0x3f800000;
      auVar41 = _local_4000;
      local_4060 = local_4000;
      uStack_4058 = uStack_3ff8;
      uStack_3ff0 = auVar191._16_8_;
      uStack_4050 = uStack_3ff0;
      uStack_3fe8 = auVar41._24_8_;
      uStack_4048 = uStack_3fe8;
      local_4040._0_4_ = local_1e40._0_4_;
      local_4040._4_4_ = local_1e40._4_4_;
      uStack_4038._0_4_ = local_1e40._8_4_;
      uStack_4038._4_4_ = local_1e40._12_4_;
      uStack_4030._0_4_ = auStack_1e30._0_4_;
      uStack_4030._4_4_ = auStack_1e30._4_4_;
      uStack_4028._0_4_ = auStack_1e30._8_4_;
      uStack_4028._4_4_ = auStack_1e30._12_4_;
      auVar189._0_8_ =
           CONCAT44(local_4040._4_4_ + (float)local_4000._4_4_,
                    (float)local_4040 + (float)local_4000._0_4_);
      auVar189._8_4_ = (float)uStack_4038 + fVar193;
      auVar189._12_4_ = uStack_4038._4_4_ + fVar194;
      auVar191._16_4_ = (float)uStack_4030 + fVar195;
      auVar191._0_16_ = auVar189;
      auVar191._20_4_ = uStack_4030._4_4_ + fVar196;
      auVar192._24_4_ = (float)uStack_4028 + fVar197;
      auVar192._0_24_ = auVar191;
      auVar192._28_4_ = uStack_4028._4_4_ + 1.0;
      local_42a0 = 0x3f800000;
      uStack_429c = 0x3f800000;
      uStack_4298 = 0x3f800000;
      uStack_4294 = 0x3f800000;
      uStack_4290 = 0x3f800000;
      uStack_428c = 0x3f800000;
      uStack_4288 = 0x3f800000;
      uStack_4284 = 0x3f800000;
      local_4240 = 0;
      uStack_4238 = 0;
      uStack_4230 = 0;
      uStack_4228 = 0;
      local_42c0 = vcmpps_avx(auVar192,ZEXT1632(ZEXT816(0)),2);
      uStack_4258 = auVar189._8_8_;
      uStack_1d98 = uStack_4258;
      uStack_4250 = auVar191._16_8_;
      uStack_1d90 = uStack_4250;
      uStack_4248 = auVar192._24_8_;
      uStack_1d88 = uStack_4248;
      local_1dc0 = 0x800000;
      uStack_1dbc = 0x800000;
      uStack_1db8 = 0x800000;
      uStack_1db4 = 0x800000;
      uStack_1db0 = 0x800000;
      uStack_1dac = 0x800000;
      uStack_1da8 = 0x800000;
      uStack_1da4 = 0x800000;
      auVar95._16_8_ = uStack_4250;
      auVar95._0_16_ = auVar189;
      auVar95._24_8_ = uStack_4248;
      auVar94._8_4_ = 0x800000;
      auVar94._0_8_ = 0x80000000800000;
      auVar94._12_4_ = 0x800000;
      auVar94._16_4_ = 0x800000;
      auVar94._20_4_ = 0x800000;
      auVar94._24_4_ = 0x800000;
      auVar94._28_4_ = 0x800000;
      auVar21 = vmaxps_avx(auVar95,auVar94);
      local_4260 = auVar21._0_8_;
      local_1d40 = local_4260;
      uStack_4258 = auVar21._8_8_;
      uStack_1d38 = uStack_4258;
      uStack_4250 = auVar21._16_8_;
      uStack_1d30 = uStack_4250;
      uStack_4248 = auVar21._24_8_;
      uStack_1d28 = uStack_4248;
      local_1d60 = local_4260;
      uStack_1d58 = uStack_4258;
      uStack_1d50 = uStack_4250;
      uStack_1d48 = uStack_4248;
      local_1d64 = 0x17;
      local_1360 = local_4260;
      uStack_1358 = uStack_4258;
      uStack_1350 = uStack_4250;
      uStack_1348 = uStack_4248;
      local_1364 = 0x17;
      auVar20 = vpsrld_avx2(auVar21,ZEXT416(0x17));
      local_4180 = local_4260;
      uStack_4178 = uStack_4258;
      uStack_4170 = uStack_4250;
      uStack_4168 = uStack_4248;
      local_41a0 = 0x807fffff;
      uStack_419c = 0x807fffff;
      uStack_4198 = 0x807fffff;
      uStack_4194 = 0x807fffff;
      uStack_4190 = 0x807fffff;
      uStack_418c = 0x807fffff;
      uStack_4188 = 0x807fffff;
      uStack_4184 = 0x807fffff;
      auVar40._8_4_ = 0x807fffff;
      auVar40._0_8_ = 0x807fffff807fffff;
      auVar40._12_4_ = 0x807fffff;
      auVar40._16_4_ = 0x807fffff;
      auVar40._20_4_ = 0x807fffff;
      auVar40._24_4_ = 0x807fffff;
      auVar40._28_4_ = 0x807fffff;
      auVar21 = vpand_avx2(auVar21,auVar40);
      local_4260 = auVar21._0_8_;
      local_1cc0 = local_4260;
      uStack_4258 = auVar21._8_8_;
      uStack_1cb8 = uStack_4258;
      uStack_4250 = auVar21._16_8_;
      uStack_1cb0 = uStack_4250;
      uStack_4248 = auVar21._24_8_;
      uStack_1ca8 = uStack_4248;
      local_1ce0 = 0x3f000000;
      uStack_1cdc = 0x3f000000;
      uStack_1cd8 = 0x3f000000;
      uStack_1cd4 = 0x3f000000;
      uStack_1cd0 = 0x3f000000;
      uStack_1ccc = 0x3f000000;
      uStack_1cc8 = 0x3f000000;
      uStack_1cc4 = 0x3f000000;
      auVar96._8_4_ = 0x3f000000;
      auVar96._0_8_ = 0x3f0000003f000000;
      auVar96._12_4_ = 0x3f000000;
      auVar96._16_4_ = 0x3f000000;
      auVar96._20_4_ = 0x3f000000;
      auVar96._24_4_ = 0x3f000000;
      auVar96._28_4_ = 0x3f000000;
      auVar19 = vpor_avx2(auVar21,auVar96);
      local_4280._0_8_ = auVar20._0_8_;
      local_1c80 = local_4280._0_8_;
      local_4280._8_8_ = auVar20._8_8_;
      uStack_1c78 = local_4280._8_8_;
      local_4280._16_8_ = auVar20._16_8_;
      uStack_1c70 = local_4280._16_8_;
      local_4280._24_8_ = auVar20._24_8_;
      uStack_1c68 = local_4280._24_8_;
      local_1ca0 = 0x7f0000007f;
      uStack_1c98 = 0x7f0000007f;
      uStack_1c90 = 0x7f0000007f;
      uStack_1c88 = 0x7f0000007f;
      local_1320 = local_4280._0_8_;
      uStack_1318 = local_4280._8_8_;
      uStack_1310 = local_4280._16_8_;
      uStack_1308 = local_4280._24_8_;
      local_1340 = 0x7f0000007f;
      uStack_1338 = 0x7f0000007f;
      uStack_1330 = 0x7f0000007f;
      uStack_1328 = 0x7f0000007f;
      auVar97._8_8_ = 0x7f0000007f;
      auVar97._0_8_ = 0x7f0000007f;
      auVar97._16_8_ = 0x7f0000007f;
      auVar97._24_8_ = 0x7f0000007f;
      local_4280 = vpsubd_avx2(auVar20,auVar97);
      local_1c60 = local_4280._0_8_;
      uStack_1c58 = local_4280._8_8_;
      uStack_1c50 = local_4280._16_8_;
      uStack_1c48 = local_4280._24_8_;
      auVar21 = vcvtdq2ps_avx(local_4280);
      local_42e0 = auVar21._0_8_;
      uVar26 = local_42e0;
      uStack_42d8 = auVar21._8_8_;
      uVar27 = uStack_42d8;
      uStack_42d0 = auVar21._16_8_;
      uVar28 = uStack_42d0;
      uStack_42c8 = auVar21._24_8_;
      uVar29 = uStack_42c8;
      local_40e0 = 0x3f8000003f800000;
      uStack_40d8 = 0x3f8000003f800000;
      uStack_40d0 = 0x3f8000003f800000;
      uStack_40c8 = 0x3f8000003f800000;
      local_40c0._0_4_ = auVar21._0_4_;
      local_40c0._4_4_ = auVar21._4_4_;
      uStack_40b8._0_4_ = auVar21._8_4_;
      uStack_40b8._4_4_ = auVar21._12_4_;
      uStack_40b0._0_4_ = auVar21._16_4_;
      uStack_40b0._4_4_ = auVar21._20_4_;
      uStack_40a8._0_4_ = auVar21._24_4_;
      uStack_40a8._4_4_ = auVar21._28_4_;
      local_42e0._4_4_ = local_40c0._4_4_ + 1.0;
      local_42e0._0_4_ = (float)local_40c0 + 1.0;
      uStack_42d8._0_4_ = (float)uStack_40b8 + 1.0;
      uStack_42d8._4_4_ = uStack_40b8._4_4_ + 1.0;
      uStack_42d0._0_4_ = (float)uStack_40b0 + 1.0;
      uStack_42d0._4_4_ = uStack_40b0._4_4_ + 1.0;
      auVar191 = _local_42e0;
      uStack_42c8._0_4_ = (float)uStack_40a8 + 1.0;
      uStack_42c8._4_4_ = uStack_40a8._4_4_ + 1.0;
      auVar20 = _local_42e0;
      auVar188._8_4_ = 0x3f3504f3;
      auVar188._0_8_ = 0x3f3504f33f3504f3;
      auVar188._12_4_ = 0x3f3504f3;
      auVar188._16_4_ = 0x3f3504f3;
      auVar188._20_4_ = 0x3f3504f3;
      auVar188._24_4_ = 0x3f3504f3;
      auVar188._28_4_ = 0x3f3504f3;
      local_4300 = vcmpps_avx(auVar19,auVar188,1);
      local_4260 = auVar19._0_8_;
      local_41c0 = local_4260;
      uStack_4258 = auVar19._8_8_;
      uStack_41b8 = uStack_4258;
      uStack_4250 = auVar19._16_8_;
      uStack_41b0 = uStack_4250;
      uStack_4248 = auVar19._24_8_;
      uStack_41a8 = uStack_4248;
      local_41e0 = local_4300._0_8_;
      uStack_41d8 = local_4300._8_8_;
      uStack_41d0 = local_4300._16_8_;
      uStack_41c8 = local_4300._24_8_;
      local_4320 = vpand_avx2(auVar19,local_4300);
      local_3de0 = local_4260;
      uStack_3dd8 = uStack_4258;
      uStack_3dd0 = uStack_4250;
      uStack_3dc8 = uStack_4248;
      local_3e00 = 0x3f8000003f800000;
      uStack_3df8 = 0x3f8000003f800000;
      uStack_3df0 = 0x3f8000003f800000;
      uStack_3de8 = 0x3f8000003f800000;
      auVar42._8_8_ = 0x3f8000003f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._16_8_ = 0x3f8000003f800000;
      auVar42._24_8_ = 0x3f8000003f800000;
      auVar21 = vsubps_avx(auVar19,auVar42);
      local_3e20 = local_42e0;
      uStack_3e18 = uStack_42d8;
      uStack_42d0 = auVar191._16_8_;
      uStack_3e10 = uStack_42d0;
      uStack_42c8 = auVar20._24_8_;
      uStack_3e08 = uStack_42c8;
      local_4200 = 0x3f8000003f800000;
      uStack_41f8 = 0x3f8000003f800000;
      uStack_41f0 = 0x3f8000003f800000;
      uStack_41e8 = 0x3f8000003f800000;
      local_4220 = local_4300._0_8_;
      uStack_4218 = local_4300._8_8_;
      uStack_4210 = local_4300._16_8_;
      uStack_4208 = local_4300._24_8_;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._16_8_ = 0x3f8000003f800000;
      auVar19._24_8_ = 0x3f8000003f800000;
      local_3e40 = vpand_avx2(auVar19,local_4300);
      auVar20._16_8_ = uStack_42d0;
      auVar20._0_16_ = _local_42e0;
      auVar20._24_8_ = uStack_42c8;
      _local_42e0 = vsubps_avx(auVar20,local_3e40);
      local_4260 = auVar21._0_8_;
      uVar30 = local_4260;
      uStack_4258 = auVar21._8_8_;
      uVar31 = uStack_4258;
      uStack_4250 = auVar21._16_8_;
      uVar32 = uStack_4250;
      uStack_4248 = auVar21._24_8_;
      uVar33 = uStack_4248;
      local_4100._0_4_ = auVar21._0_4_;
      local_4100._4_4_ = auVar21._4_4_;
      uStack_40f8._0_4_ = auVar21._8_4_;
      uStack_40f8._4_4_ = auVar21._12_4_;
      uStack_40f0._0_4_ = auVar21._16_4_;
      uStack_40f0._4_4_ = auVar21._20_4_;
      uStack_40e8._0_4_ = auVar21._24_4_;
      uStack_40e8._4_4_ = auVar21._28_4_;
      local_4120._0_4_ = local_4320._0_4_;
      local_4120._4_4_ = local_4320._4_4_;
      uStack_4118._0_4_ = local_4320._8_4_;
      uStack_4118._4_4_ = local_4320._12_4_;
      uStack_4110._0_4_ = local_4320._16_4_;
      uStack_4110._4_4_ = local_4320._20_4_;
      uStack_4108._0_4_ = local_4320._24_4_;
      uStack_4108._4_4_ = local_4320._28_4_;
      local_4260._0_4_ = (float)local_4100 + (float)local_4120;
      local_4260._4_4_ = local_4100._4_4_ + local_4120._4_4_;
      uStack_40f8._0_4_ = (float)uStack_40f8 + (float)uStack_4118;
      uStack_40f8._4_4_ = uStack_40f8._4_4_ + uStack_4118._4_4_;
      uStack_40f0._0_4_ = (float)uStack_40f0 + (float)uStack_4110;
      uStack_40f0._4_4_ = uStack_40f0._4_4_ + uStack_4110._4_4_;
      uStack_40e8._0_4_ = (float)uStack_40e8 + (float)uStack_4108;
      fStack_4324 = uStack_40e8._4_4_ + uStack_4108._4_4_;
      uStack_4258._0_4_ = (float)uStack_40f8;
      uStack_4258._4_4_ = uStack_40f8._4_4_;
      uStack_4250._0_4_ = (float)uStack_40f0;
      uStack_4250._4_4_ = uStack_40f0._4_4_;
      auVar191 = _local_4260;
      uStack_4248._0_4_ = (float)uStack_40e8;
      uStack_4248._4_4_ = fStack_4324;
      auVar21 = _local_4260;
      local_1b40 = local_4260;
      uStack_1b38 = uStack_4258;
      uStack_4250 = auVar191._16_8_;
      uStack_1b30 = uStack_4250;
      uStack_4248 = auVar21._24_8_;
      uStack_1b28 = uStack_4248;
      local_4340 = (float)local_4260._0_4_ * (float)local_4260._0_4_;
      fStack_433c = (float)local_4260._4_4_ * (float)local_4260._4_4_;
      fStack_4338 = (float)uStack_40f8 * (float)uStack_40f8;
      fStack_4334 = uStack_40f8._4_4_ * uStack_40f8._4_4_;
      fStack_4330 = (float)uStack_40f0 * (float)uStack_40f0;
      fStack_432c = uStack_40f0._4_4_ * uStack_40f0._4_4_;
      fStack_4328 = (float)uStack_40e8 * (float)uStack_40e8;
      uStack_4358._0_4_ = 0x3d9021bb;
      local_4360 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_4358._4_4_ = 0x3d9021bb;
      uStack_4350._0_4_ = 0x3d9021bb;
      uStack_4350._4_4_ = 0x3d9021bb;
      auVar191 = _local_4360;
      uStack_4348._0_4_ = 0x3d9021bb;
      uStack_4348._4_4_ = 0x3d9021bb;
      auVar21 = _local_4360;
      local_14c0 = 0x3d9021bb3d9021bb;
      uStack_14b8 = uStack_4358;
      uStack_4350 = auVar191._16_8_;
      uStack_14b0 = uStack_4350;
      uStack_4348 = auVar21._24_8_;
      uStack_14a8 = uStack_4348;
      local_14e0 = local_4260;
      uStack_14d8 = uStack_4258;
      uStack_14d0 = uStack_4250;
      uStack_14c8 = uStack_4248;
      local_1500 = 0xbdebd1b8;
      uStack_14fc = 0xbdebd1b8;
      uStack_14f8 = 0xbdebd1b8;
      uStack_14f4 = 0xbdebd1b8;
      uStack_14f0 = 0xbdebd1b8;
      uStack_14ec = 0xbdebd1b8;
      uStack_14e8 = 0xbdebd1b8;
      uStack_14e4 = 0xbdebd1b8;
      local_12c0 = 0x3d9021bb3d9021bb;
      uStack_12b8 = uStack_4358;
      uStack_12b0 = uStack_4350;
      uStack_12a8 = uStack_4348;
      local_12e0 = local_4260;
      uStack_12d8 = uStack_4258;
      uStack_12d0 = uStack_4250;
      uStack_12c8 = uStack_4248;
      local_1300 = 0xbdebd1b8bdebd1b8;
      uStack_12f8 = 0xbdebd1b8bdebd1b8;
      uStack_12f0 = 0xbdebd1b8bdebd1b8;
      uStack_12e8 = 0xbdebd1b8bdebd1b8;
      auVar100._16_8_ = uStack_4350;
      auVar100._0_16_ = _local_4360;
      auVar100._24_8_ = uStack_4348;
      auVar99._16_8_ = uStack_4250;
      auVar99._0_16_ = _local_4260;
      auVar99._24_8_ = uStack_4248;
      auVar98._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar98._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar98._16_8_ = 0xbdebd1b8bdebd1b8;
      auVar98._24_8_ = 0xbdebd1b8bdebd1b8;
      auVar17 = vfmadd213ps_fma(auVar99,auVar100,auVar98);
      local_4360 = auVar17._0_8_;
      local_1520 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_1518 = uStack_4358;
      uStack_1510 = 0;
      uStack_1508 = 0;
      local_1540 = local_4260;
      uStack_1538 = uStack_4258;
      uStack_1530 = uStack_4250;
      uStack_1528 = uStack_4248;
      local_1560 = 0x3def251a;
      uStack_155c = 0x3def251a;
      uStack_1558 = 0x3def251a;
      uStack_1554 = 0x3def251a;
      uStack_1550 = 0x3def251a;
      uStack_154c = 0x3def251a;
      uStack_1548 = 0x3def251a;
      uStack_1544 = 0x3def251a;
      local_1260 = local_4360;
      uStack_1258 = uStack_4358;
      uStack_1250 = 0;
      uStack_1248 = 0;
      local_1280 = local_4260;
      uStack_1278 = uStack_4258;
      uStack_1270 = uStack_4250;
      uStack_1268 = uStack_4248;
      local_12a0 = 0x3def251a3def251a;
      uStack_1298 = 0x3def251a3def251a;
      uStack_1290 = 0x3def251a3def251a;
      uStack_1288 = 0x3def251a3def251a;
      auVar102._16_8_ = uStack_4250;
      auVar102._0_16_ = _local_4260;
      auVar102._24_8_ = uStack_4248;
      auVar101._8_8_ = 0x3def251a3def251a;
      auVar101._0_8_ = 0x3def251a3def251a;
      auVar101._16_8_ = 0x3def251a3def251a;
      auVar101._24_8_ = 0x3def251a3def251a;
      auVar17 = vfmadd213ps_fma(auVar102,ZEXT1632(auVar17),auVar101);
      local_4360 = auVar17._0_8_;
      local_1580 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_1578 = uStack_4358;
      uStack_1570 = 0;
      uStack_1568 = 0;
      local_15a0 = local_4260;
      uStack_1598 = uStack_4258;
      uStack_1590 = uStack_4250;
      uStack_1588 = uStack_4248;
      local_15c0 = 0xbdfe5d4f;
      uStack_15bc = 0xbdfe5d4f;
      uStack_15b8 = 0xbdfe5d4f;
      uStack_15b4 = 0xbdfe5d4f;
      uStack_15b0 = 0xbdfe5d4f;
      uStack_15ac = 0xbdfe5d4f;
      uStack_15a8 = 0xbdfe5d4f;
      uStack_15a4 = 0xbdfe5d4f;
      local_1200 = local_4360;
      uStack_11f8 = uStack_4358;
      uStack_11f0 = 0;
      uStack_11e8 = 0;
      local_1220 = local_4260;
      uStack_1218 = uStack_4258;
      uStack_1210 = uStack_4250;
      uStack_1208 = uStack_4248;
      local_1240 = 0xbdfe5d4fbdfe5d4f;
      uStack_1238 = 0xbdfe5d4fbdfe5d4f;
      uStack_1230 = 0xbdfe5d4fbdfe5d4f;
      uStack_1228 = 0xbdfe5d4fbdfe5d4f;
      auVar104._16_8_ = uStack_4250;
      auVar104._0_16_ = _local_4260;
      auVar104._24_8_ = uStack_4248;
      auVar103._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar103._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar103._16_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar103._24_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar17 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar17),auVar103);
      local_4360 = auVar17._0_8_;
      local_15e0 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_15d8 = uStack_4358;
      uStack_15d0 = 0;
      uStack_15c8 = 0;
      local_1600 = local_4260;
      uStack_15f8 = uStack_4258;
      uStack_15f0 = uStack_4250;
      uStack_15e8 = uStack_4248;
      local_1620 = 0x3e11e9bf;
      uStack_161c = 0x3e11e9bf;
      uStack_1618 = 0x3e11e9bf;
      uStack_1614 = 0x3e11e9bf;
      uStack_1610 = 0x3e11e9bf;
      uStack_160c = 0x3e11e9bf;
      uStack_1608 = 0x3e11e9bf;
      uStack_1604 = 0x3e11e9bf;
      local_11a0 = local_4360;
      uStack_1198 = uStack_4358;
      uStack_1190 = 0;
      uStack_1188 = 0;
      local_11c0 = local_4260;
      uStack_11b8 = uStack_4258;
      uStack_11b0 = uStack_4250;
      uStack_11a8 = uStack_4248;
      local_11e0 = 0x3e11e9bf3e11e9bf;
      uStack_11d8 = 0x3e11e9bf3e11e9bf;
      uStack_11d0 = 0x3e11e9bf3e11e9bf;
      uStack_11c8 = 0x3e11e9bf3e11e9bf;
      auVar106._16_8_ = uStack_4250;
      auVar106._0_16_ = _local_4260;
      auVar106._24_8_ = uStack_4248;
      auVar105._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar105._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar105._16_8_ = 0x3e11e9bf3e11e9bf;
      auVar105._24_8_ = 0x3e11e9bf3e11e9bf;
      auVar17 = vfmadd213ps_fma(auVar106,ZEXT1632(auVar17),auVar105);
      local_4360 = auVar17._0_8_;
      local_1640 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_1638 = uStack_4358;
      uStack_1630 = 0;
      uStack_1628 = 0;
      local_1660 = local_4260;
      uStack_1658 = uStack_4258;
      uStack_1650 = uStack_4250;
      uStack_1648 = uStack_4248;
      local_1680 = 0xbe2aae50;
      uStack_167c = 0xbe2aae50;
      uStack_1678 = 0xbe2aae50;
      uStack_1674 = 0xbe2aae50;
      uStack_1670 = 0xbe2aae50;
      uStack_166c = 0xbe2aae50;
      uStack_1668 = 0xbe2aae50;
      uStack_1664 = 0xbe2aae50;
      local_1140 = local_4360;
      uStack_1138 = uStack_4358;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1160 = local_4260;
      uStack_1158 = uStack_4258;
      uStack_1150 = uStack_4250;
      uStack_1148 = uStack_4248;
      local_1180 = 0xbe2aae50be2aae50;
      uStack_1178 = 0xbe2aae50be2aae50;
      uStack_1170 = 0xbe2aae50be2aae50;
      uStack_1168 = 0xbe2aae50be2aae50;
      auVar108._16_8_ = uStack_4250;
      auVar108._0_16_ = _local_4260;
      auVar108._24_8_ = uStack_4248;
      auVar107._8_8_ = 0xbe2aae50be2aae50;
      auVar107._0_8_ = 0xbe2aae50be2aae50;
      auVar107._16_8_ = 0xbe2aae50be2aae50;
      auVar107._24_8_ = 0xbe2aae50be2aae50;
      auVar17 = vfmadd213ps_fma(auVar108,ZEXT1632(auVar17),auVar107);
      local_4360 = auVar17._0_8_;
      local_16a0 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_1698 = uStack_4358;
      uStack_1690 = 0;
      uStack_1688 = 0;
      local_16c0 = local_4260;
      uStack_16b8 = uStack_4258;
      uStack_16b0 = uStack_4250;
      uStack_16a8 = uStack_4248;
      local_16e0 = 0x3e4cceac;
      uStack_16dc = 0x3e4cceac;
      uStack_16d8 = 0x3e4cceac;
      uStack_16d4 = 0x3e4cceac;
      uStack_16d0 = 0x3e4cceac;
      uStack_16cc = 0x3e4cceac;
      uStack_16c8 = 0x3e4cceac;
      uStack_16c4 = 0x3e4cceac;
      local_10e0 = local_4360;
      uStack_10d8 = uStack_4358;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      local_1100 = local_4260;
      uStack_10f8 = uStack_4258;
      uStack_10f0 = uStack_4250;
      uStack_10e8 = uStack_4248;
      local_1120 = 0x3e4cceac3e4cceac;
      uStack_1118 = 0x3e4cceac3e4cceac;
      uStack_1110 = 0x3e4cceac3e4cceac;
      uStack_1108 = 0x3e4cceac3e4cceac;
      auVar110._16_8_ = uStack_4250;
      auVar110._0_16_ = _local_4260;
      auVar110._24_8_ = uStack_4248;
      auVar109._8_8_ = 0x3e4cceac3e4cceac;
      auVar109._0_8_ = 0x3e4cceac3e4cceac;
      auVar109._16_8_ = 0x3e4cceac3e4cceac;
      auVar109._24_8_ = 0x3e4cceac3e4cceac;
      auVar17 = vfmadd213ps_fma(auVar110,ZEXT1632(auVar17),auVar109);
      local_4360 = auVar17._0_8_;
      local_1700 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_16f8 = uStack_4358;
      uStack_16f0 = 0;
      uStack_16e8 = 0;
      local_1720 = local_4260;
      uStack_1718 = uStack_4258;
      uStack_1710 = uStack_4250;
      uStack_1708 = uStack_4248;
      local_1740 = 0xbe7ffffc;
      uStack_173c = 0xbe7ffffc;
      uStack_1738 = 0xbe7ffffc;
      uStack_1734 = 0xbe7ffffc;
      uStack_1730 = 0xbe7ffffc;
      uStack_172c = 0xbe7ffffc;
      uStack_1728 = 0xbe7ffffc;
      uStack_1724 = 0xbe7ffffc;
      local_1080 = local_4360;
      uStack_1078 = uStack_4358;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_10a0 = local_4260;
      uStack_1098 = uStack_4258;
      uStack_1090 = uStack_4250;
      uStack_1088 = uStack_4248;
      local_10c0 = 0xbe7ffffcbe7ffffc;
      uStack_10b8 = 0xbe7ffffcbe7ffffc;
      uStack_10b0 = 0xbe7ffffcbe7ffffc;
      uStack_10a8 = 0xbe7ffffcbe7ffffc;
      auVar112._16_8_ = uStack_4250;
      auVar112._0_16_ = _local_4260;
      auVar112._24_8_ = uStack_4248;
      auVar111._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar111._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar111._16_8_ = 0xbe7ffffcbe7ffffc;
      auVar111._24_8_ = 0xbe7ffffcbe7ffffc;
      auVar17 = vfmadd213ps_fma(auVar112,ZEXT1632(auVar17),auVar111);
      local_4360 = auVar17._0_8_;
      local_1760 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_1758 = uStack_4358;
      uStack_1750 = 0;
      uStack_1748 = 0;
      local_1780 = local_4260;
      uStack_1778 = uStack_4258;
      uStack_1770 = uStack_4250;
      uStack_1768 = uStack_4248;
      local_17a0 = 0x3eaaaaaa;
      uStack_179c = 0x3eaaaaaa;
      uStack_1798 = 0x3eaaaaaa;
      uStack_1794 = 0x3eaaaaaa;
      uStack_1790 = 0x3eaaaaaa;
      uStack_178c = 0x3eaaaaaa;
      uStack_1788 = 0x3eaaaaaa;
      uStack_1784 = 0x3eaaaaaa;
      local_1020 = local_4360;
      uStack_1018 = uStack_4358;
      uStack_1010 = 0;
      uStack_1008 = 0;
      local_1040 = local_4260;
      uStack_1038 = uStack_4258;
      uStack_1030 = uStack_4250;
      uStack_1028 = uStack_4248;
      local_1060 = 0x3eaaaaaa3eaaaaaa;
      uStack_1058 = 0x3eaaaaaa3eaaaaaa;
      uStack_1050 = 0x3eaaaaaa3eaaaaaa;
      uStack_1048 = 0x3eaaaaaa3eaaaaaa;
      auVar114._16_8_ = uStack_4250;
      auVar114._0_16_ = _local_4260;
      auVar114._24_8_ = uStack_4248;
      auVar113._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar113._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar113._16_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar113._24_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar17 = vfmadd213ps_fma(auVar114,ZEXT1632(auVar17),auVar113);
      local_4360 = auVar17._0_8_;
      uVar34 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uVar35 = uStack_4358;
      uStack_1b50 = 0;
      uStack_1b48 = 0;
      local_1b80 = local_4260;
      uStack_1b78 = uStack_4258;
      uStack_1b70 = uStack_4250;
      uStack_1b68 = uStack_4248;
      local_1b60._0_4_ = auVar17._0_4_;
      local_1b60._4_4_ = auVar17._4_4_;
      uStack_1b58._0_4_ = auVar17._8_4_;
      uStack_1b58._4_4_ = auVar17._12_4_;
      local_4360._4_4_ = local_1b60._4_4_ * (float)local_4260._4_4_;
      local_4360._0_4_ = (float)local_1b60 * (float)local_4260._0_4_;
      uStack_4358._0_4_ = (float)uStack_1b58 * (float)uStack_40f8;
      uStack_4358._4_4_ = uStack_1b58._4_4_ * uStack_40f8._4_4_;
      uStack_4350._0_4_ = (float)uStack_40f0 * 0.0;
      uStack_4350._4_4_ = uStack_40f0._4_4_ * 0.0;
      auVar191 = _local_4360;
      local_1ba0 = local_4360;
      uStack_1b98 = uStack_4358;
      uStack_4350 = auVar191._16_8_;
      uStack_1b90 = uStack_4350;
      uStack_4348 = (ulong)(uint)((float)uStack_40e8 * 0.0);
      uStack_1b88 = uStack_4348;
      local_1bc0 = CONCAT44(fStack_433c,local_4340);
      uStack_1bb8 = CONCAT44(fStack_4334,fStack_4338);
      uStack_1bb0 = CONCAT44(fStack_432c,fStack_4330);
      uStack_1ba8 = CONCAT44(fStack_4324,fStack_4328);
      fVar193 = (float)uStack_40e8 * 0.0 * fStack_4328;
      local_4360._4_4_ = local_1b60._4_4_ * (float)local_4260._4_4_ * fStack_433c;
      local_4360._0_4_ = (float)local_1b60 * (float)local_4260._0_4_ * local_4340;
      uStack_4358._0_4_ = (float)uStack_1b58 * (float)uStack_40f8 * fStack_4338;
      uStack_4358._4_4_ = uStack_1b58._4_4_ * uStack_40f8._4_4_ * fStack_4334;
      uStack_4350._0_4_ = (float)uStack_40f0 * 0.0 * fStack_4330;
      uStack_4350._4_4_ = uStack_40f0._4_4_ * 0.0 * fStack_432c;
      auVar191 = _local_4360;
      local_17c0 = local_42e0;
      uStack_17b8 = uStack_42d8;
      uStack_17b0 = uStack_42d0;
      uStack_17a8 = uStack_42c8;
      local_1800 = local_4360;
      uStack_17f8 = uStack_4358;
      uStack_4350 = auVar191._16_8_;
      uStack_17f0 = uStack_4350;
      uStack_4348 = (ulong)(uint)fVar193;
      uStack_17e8 = uStack_4348;
      local_17e0 = 0xb95e8083;
      uStack_17dc = 0xb95e8083;
      uStack_17d8 = 0xb95e8083;
      uStack_17d4 = 0xb95e8083;
      uStack_17d0 = 0xb95e8083;
      uStack_17cc = 0xb95e8083;
      uStack_17c8 = 0xb95e8083;
      uStack_17c4 = 0xb95e8083;
      local_fc0 = local_42e0;
      uStack_fb8 = uStack_42d8;
      uStack_fb0 = uStack_42d0;
      uStack_fa8 = uStack_42c8;
      local_fe0 = 0xb95e8083b95e8083;
      uStack_fd8 = 0xb95e8083b95e8083;
      uStack_fd0 = 0xb95e8083b95e8083;
      uStack_fc8 = 0xb95e8083b95e8083;
      local_1000 = local_4360;
      uStack_ff8 = uStack_4358;
      uStack_ff0 = uStack_4350;
      uStack_fe8 = uStack_4348;
      auVar116._8_8_ = 0xb95e8083b95e8083;
      auVar116._0_8_ = 0xb95e8083b95e8083;
      auVar116._16_8_ = 0xb95e8083b95e8083;
      auVar116._24_8_ = 0xb95e8083b95e8083;
      auVar115._16_8_ = uStack_4350;
      auVar115._0_16_ = _local_4360;
      auVar115._24_4_ = fVar193;
      auVar115._28_4_ = 0;
      auVar17 = vfmadd213ps_fma(auVar116,_local_42e0,auVar115);
      local_13a0 = CONCAT44(fStack_433c,local_4340);
      uStack_1398 = CONCAT44(fStack_4334,fStack_4338);
      uStack_1390 = CONCAT44(fStack_432c,fStack_4330);
      uStack_1388 = CONCAT44(fStack_4324,fStack_4328);
      local_4360 = auVar17._0_8_;
      local_13e0 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uStack_13d8 = uStack_4358;
      uStack_13d0 = 0;
      uStack_13c8 = 0;
      local_13c0 = 0x3f000000;
      uStack_13bc = 0x3f000000;
      uStack_13b8 = 0x3f000000;
      uStack_13b4 = 0x3f000000;
      uStack_13b0 = 0x3f000000;
      uStack_13ac = 0x3f000000;
      uStack_13a8 = 0x3f000000;
      uStack_13a4 = 0x3f000000;
      local_c80 = 0x3f0000003f000000;
      uStack_c78 = 0x3f0000003f000000;
      uStack_c70 = 0x3f0000003f000000;
      uStack_c68 = 0x3f0000003f000000;
      local_ca0 = local_4360;
      uStack_c98 = uStack_4358;
      uStack_c90 = 0;
      uStack_c88 = 0;
      auVar128._8_8_ = uStack_1398;
      auVar128._0_8_ = local_13a0;
      auVar128._16_8_ = uStack_1390;
      auVar128._24_8_ = uStack_1388;
      auVar127._8_8_ = 0x3f0000003f000000;
      auVar127._0_8_ = 0x3f0000003f000000;
      auVar127._16_8_ = 0x3f0000003f000000;
      auVar127._24_8_ = 0x3f0000003f000000;
      auVar17 = vfnmadd213ps_fma(auVar127,auVar128,ZEXT1632(auVar17));
      local_4140 = local_4260;
      uStack_4138 = uStack_4258;
      uStack_4130 = uStack_4250;
      uStack_4128 = uStack_4248;
      local_4360 = auVar17._0_8_;
      uVar36 = local_4360;
      uStack_4358 = auVar17._8_8_;
      uVar37 = uStack_4358;
      uStack_4150 = 0;
      uStack_4148 = 0;
      local_4160._0_4_ = auVar17._0_4_;
      local_4160._4_4_ = auVar17._4_4_;
      uStack_4158._0_4_ = auVar17._8_4_;
      uStack_4158._4_4_ = auVar17._12_4_;
      local_4260._4_4_ = (float)local_4260._4_4_ + local_4160._4_4_;
      local_4260._0_4_ = (float)local_4260._0_4_ + (float)local_4160;
      uStack_4258._0_4_ = (float)uStack_40f8 + (float)uStack_4158;
      uStack_4258._4_4_ = uStack_40f8._4_4_ + uStack_4158._4_4_;
      uStack_4250._0_4_ = (float)uStack_40f0 + 0.0;
      uStack_4250._4_4_ = uStack_40f0._4_4_ + 0.0;
      auVar191 = _local_4260;
      uStack_4248._0_4_ = (float)uStack_40e8 + 0.0;
      uStack_4248._4_4_ = fStack_4324 + 0.0;
      auVar21 = _local_4260;
      local_1820 = local_42e0;
      uStack_1818 = uStack_42d8;
      uStack_1810 = uStack_42d0;
      uStack_1808 = uStack_42c8;
      local_1860 = local_4260;
      uStack_1858 = uStack_4258;
      uStack_4250 = auVar191._16_8_;
      uStack_1850 = uStack_4250;
      uStack_4248 = auVar21._24_8_;
      uStack_1848 = uStack_4248;
      local_1840 = 0x3f318000;
      uStack_183c = 0x3f318000;
      uStack_1838 = 0x3f318000;
      uStack_1834 = 0x3f318000;
      uStack_1830 = 0x3f318000;
      uStack_182c = 0x3f318000;
      uStack_1828 = 0x3f318000;
      uStack_1824 = 0x3f318000;
      local_f60 = local_42e0;
      uStack_f58 = uStack_42d8;
      uStack_f50 = uStack_42d0;
      uStack_f48 = uStack_42c8;
      local_f80 = 0x3f3180003f318000;
      uStack_f78 = 0x3f3180003f318000;
      uStack_f70 = 0x3f3180003f318000;
      uStack_f68 = 0x3f3180003f318000;
      local_fa0 = local_4260;
      uStack_f98 = uStack_4258;
      uStack_f90 = uStack_4250;
      uStack_f88 = uStack_4248;
      auVar118._8_8_ = 0x3f3180003f318000;
      auVar118._0_8_ = 0x3f3180003f318000;
      auVar118._16_8_ = 0x3f3180003f318000;
      auVar118._24_8_ = 0x3f3180003f318000;
      auVar117._16_8_ = uStack_4250;
      auVar117._0_16_ = _local_4260;
      auVar117._24_8_ = uStack_4248;
      auVar17 = vfmadd213ps_fma(auVar118,_local_42e0,auVar117);
      local_4260 = auVar17._0_8_;
      local_1d00 = local_4260;
      uStack_4258 = auVar17._8_8_;
      uStack_1cf8 = uStack_4258;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      local_1d20 = local_42c0._0_8_;
      uStack_1d18 = local_42c0._8_8_;
      uStack_1d10 = local_42c0._16_8_;
      uStack_1d08 = local_42c0._24_8_;
      _local_4360 = vpor_avx2(ZEXT1632(auVar17),local_42c0);
      local_55c0 = auVar16._0_8_;
      local_43e0 = local_55c0;
      uStack_55b8 = auVar16._8_8_;
      uStack_43d8 = uStack_55b8;
      uStack_55b0 = auVar16._16_8_;
      uStack_43d0 = uStack_55b0;
      uStack_55a8 = auVar16._24_8_;
      uStack_43c8 = uStack_55a8;
      auVar16 = vpand_avx2(*(undefined1 (*) [32])*local_5338,auVar16);
      local_5620 = auVar16._0_8_;
      uStack_5618 = auVar16._8_8_;
      uStack_5610 = auVar16._16_8_;
      uStack_5608 = auVar16._24_8_;
      local_4080._0_4_ = auVar16._0_4_;
      local_4080._4_4_ = auVar16._4_4_;
      uStack_4078._0_4_ = auVar16._8_4_;
      uStack_4078._4_4_ = auVar16._12_4_;
      uStack_4070._0_4_ = auVar16._16_4_;
      uStack_4070._4_4_ = auVar16._20_4_;
      uStack_4068._0_4_ = auVar16._24_4_;
      uStack_4068._4_4_ = auVar16._28_4_;
      local_40a0._0_4_ = local_4360._0_4_;
      local_40a0._4_4_ = local_4360._4_4_;
      uStack_4098._0_4_ = local_4360._8_4_;
      uStack_4098._4_4_ = local_4360._12_4_;
      uStack_4090._0_4_ = local_4360._16_4_;
      uStack_4090._4_4_ = local_4360._20_4_;
      uStack_4088._0_4_ = local_4360._24_4_;
      uStack_4088._4_4_ = local_4360._28_4_;
      local_3d48 = local_5338;
      local_3d80 = CONCAT44(local_4080._4_4_ + local_40a0._4_4_,
                            (float)local_4080 + (float)local_40a0);
      uStack_3d78 = CONCAT44(uStack_4078._4_4_ + uStack_4098._4_4_,
                             (float)uStack_4078 + (float)uStack_4098);
      uStack_3d70 = CONCAT44(uStack_4070._4_4_ + uStack_4090._4_4_,
                             (float)uStack_4070 + (float)uStack_4090);
      uStack_3d68 = CONCAT44(uStack_4068._4_4_ + uStack_4088._4_4_,
                             (float)uStack_4068 + (float)uStack_4088);
      *(undefined8 *)*local_5338 = local_3d80;
      *(undefined8 *)(*local_5338 + 8) = uStack_3d78;
      *(undefined8 *)(*local_5338 + 0x10) = uStack_3d70;
      *(undefined8 *)(*local_5338 + 0x18) = uStack_3d68;
      local_5338 = (undefined1 (*) [64])(*local_5338 + 0x20);
      local_4380 = local_43c0;
      uStack_4378 = uStack_43b8;
      uStack_4370 = uStack_43b0;
      uStack_4368 = uStack_43a8;
      _local_4260 = ZEXT1632(auVar17);
      local_4160 = uVar36;
      uStack_4158 = uVar37;
      local_4120 = local_4320._0_8_;
      uStack_4118 = local_4320._8_8_;
      uStack_4110 = local_4320._16_8_;
      uStack_4108 = local_4320._24_8_;
      local_4100 = uVar30;
      uStack_40f8 = uVar31;
      uStack_40f0 = uVar32;
      uStack_40e8 = uVar33;
      local_40c0 = uVar26;
      uStack_40b8 = uVar27;
      uStack_40b0 = uVar28;
      uStack_40a8 = uVar29;
      local_40a0 = local_4360;
      uStack_4098 = uStack_4358;
      uStack_4090 = uStack_4350;
      uStack_4088 = uStack_4348;
      local_4080 = local_5620;
      uStack_4078 = uStack_5618;
      uStack_4070 = uStack_5610;
      uStack_4068 = uStack_5608;
      local_4040 = local_1e40._0_8_;
      uStack_4038 = local_1e40._8_8_;
      uStack_4030 = auStack_1e30._0_8_;
      uStack_4028 = auStack_1e30._8_8_;
      _local_4000 = auVar41;
      _local_3f60 = auVar93;
      local_3f40 = ZEXT1632(auVar25);
      local_3ea0 = uVar22;
      uStack_3e98 = uVar23;
      local_1da0 = auVar189._0_8_;
      local_1be0 = local_1c00;
      uStack_1bd8 = uStack_1bf8;
      uStack_1bd0 = uStack_1bf0;
      uStack_1bc8 = uStack_1be8;
      local_1b60 = uVar34;
      uStack_1b58 = uVar35;
      local_1b20 = local_1b40;
      uStack_1b18 = uStack_1b38;
      uStack_1b10 = uStack_1b30;
      uStack_1b08 = uStack_1b28;
      local_c60 = local_13a0;
      uStack_c58 = uStack_1398;
      uStack_c50 = uStack_1390;
      uStack_c48 = uStack_1388;
      local_b40 = local_3f80._0_8_;
      uStack_b38 = local_3f80._8_8_;
      uStack_b30 = local_3f80._16_8_;
      uStack_b28 = local_3f80._24_8_;
    }
    local_3d24 = 0x3f800000;
    local_3d40 = 0x3f800000;
    uStack_3d3c = 0x3f800000;
    uStack_3d38 = 0x3f800000;
    uStack_3d34 = 0x3f800000;
    local_3d20 = (undefined1  [16])0x0;
    for (; local_38f0 = local_52d0, local_5360 = local_3950, local_5390 + 3 < local_5328;
        local_5390 = local_5390 + 4) {
      local_3d08 = local_5338;
      local_3cf0 = *(undefined8 *)*local_5338;
      uStack_3ce8 = *(undefined8 *)(*local_5338 + 8);
      local_3d00 = 0;
      uStack_3cf8 = 0;
      auVar17 = vcmpps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_5338,1);
      local_3cc0[0] = 0x7fffffff;
      local_3cc0[1] = 0x7fffffff;
      aiStack_3cb8[0] = 0x7fffffff;
      aiStack_3cb8[1] = 0x7fffffff;
      auVar25._8_4_ = 0x7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25._0_4_ = 0x7fffffff;
      auVar25._4_4_ = 0x7fffffff;
      auVar25 = vpand_avx(*(undefined1 (*) [16])*local_5338,auVar25);
      local_3980 = 0;
      uStack_3978 = 0;
      local_5670 = auVar25._0_8_;
      local_3990 = local_5670;
      uStack_5668 = auVar25._8_8_;
      uStack_3988 = uStack_5668;
      auVar25 = vsubps_avx(ZEXT816(0),auVar25);
      local_3a80 = (undefined1  [16])0x0;
      local_3ad0 = 0x3f800000;
      uStack_3acc = 0x3f800000;
      uStack_3ac8 = 0x3f800000;
      uStack_3ac4 = 0x3f800000;
      local_3a90._0_8_ = auVar25._0_8_;
      local_d0 = local_3a90._0_8_;
      local_3a90._8_8_ = auVar25._8_8_;
      uStack_c8 = local_3a90._8_8_;
      local_e0 = 0x42b0c0a5;
      uStack_dc = 0x42b0c0a5;
      uStack_d8 = 0x42b0c0a5;
      uStack_d4 = 0x42b0c0a5;
      auVar174._8_4_ = 0x42b0c0a5;
      auVar174._0_8_ = 0x42b0c0a542b0c0a5;
      auVar174._12_4_ = 0x42b0c0a5;
      auVar25 = vminps_avx(auVar25,auVar174);
      local_3a90._0_8_ = auVar25._0_8_;
      local_9c0 = local_3a90._0_8_;
      local_3a90._8_8_ = auVar25._8_8_;
      uStack_9b8 = local_3a90._8_8_;
      local_9d0 = 0xc2b0c0a5;
      uStack_9cc = 0xc2b0c0a5;
      uStack_9c8 = 0xc2b0c0a5;
      uStack_9c4 = 0xc2b0c0a5;
      auVar135._8_4_ = 0xc2b0c0a5;
      auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar135._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar25,auVar135);
      local_3a90._0_8_ = auVar18._0_8_;
      uVar22 = local_3a90._0_8_;
      local_3a90._8_8_ = auVar18._8_8_;
      uVar23 = local_3a90._8_8_;
      local_880 = 0x3fb8aa3b;
      uStack_87c = 0x3fb8aa3b;
      uStack_878 = 0x3fb8aa3b;
      uStack_874 = 0x3fb8aa3b;
      local_870._0_4_ = auVar18._0_4_;
      local_870._4_4_ = auVar18._4_4_;
      uStack_868._0_4_ = auVar18._8_4_;
      uStack_868._4_4_ = auVar18._12_4_;
      local_3ab0._4_4_ = local_870._4_4_ * 1.442695;
      local_3ab0._0_4_ = (float)local_870 * 1.442695;
      uStack_3aa8._0_4_ = (float)uStack_868 * 1.442695;
      uStack_3aa8._4_4_ = uStack_868._4_4_ * 1.442695;
      local_3a00 = local_3ab0;
      uStack_39f8 = uStack_3aa8;
      local_3a10 = 0x3f000000;
      uStack_3a0c = 0x3f000000;
      uStack_3a08 = 0x3f000000;
      uStack_3a04 = 0x3f000000;
      local_3ab0._0_4_ = (float)local_870 * 1.442695 + 0.5;
      local_3ab0._4_4_ = local_870._4_4_ * 1.442695 + 0.5;
      fVar193 = (float)uStack_868 * 1.442695 + 0.5;
      fVar194 = uStack_868._4_4_ * 1.442695 + 0.5;
      uStack_3aa8._0_4_ = fVar193;
      uStack_3aa8._4_4_ = fVar194;
      local_b0 = local_3ab0;
      uStack_a8 = uStack_3aa8;
      local_3ac0._4_4_ = (int)(float)local_3ab0._4_4_;
      local_3ac0._0_4_ = (int)(float)local_3ab0._0_4_;
      local_3ac0._8_4_ = (int)fVar193;
      local_3ac0._12_4_ = (int)fVar194;
      local_900 = local_3ac0._0_8_;
      uStack_8f8 = local_3ac0._8_8_;
      auVar140._8_8_ = local_3ac0._8_8_;
      auVar140._0_8_ = local_3ac0._0_8_;
      auVar189 = vcvtdq2ps_avx(auVar140);
      local_3aa0 = auVar189._0_8_;
      local_3a60 = local_3aa0;
      uStack_3a98 = auVar189._8_8_;
      uStack_3a58 = uStack_3a98;
      local_3a70 = local_3ab0;
      uStack_3a68 = uStack_3aa8;
      auVar44._8_8_ = uStack_3aa8;
      auVar44._0_8_ = local_3ab0;
      auVar25 = vcmpps_avx(auVar44,auVar189,1);
      local_3ae0._0_8_ = auVar25._0_8_;
      local_3a40 = local_3ae0._0_8_;
      local_3ae0._8_8_ = auVar25._8_8_;
      uStack_3a38 = local_3ae0._8_8_;
      local_3a50 = 0x3f8000003f800000;
      uStack_3a48 = 0x3f8000003f800000;
      auVar45._8_8_ = 0x3f8000003f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      local_3ae0 = vpand_avx(auVar25,auVar45);
      local_39e0 = local_3aa0;
      uStack_39d8 = uStack_3a98;
      local_39f0 = local_3ae0._0_8_;
      uStack_39e8 = local_3ae0._8_8_;
      _local_3ab0 = vsubps_avx(auVar189,local_3ae0);
      local_4b0 = local_3ab0;
      uStack_4a8 = uStack_3aa8;
      local_4d0 = local_3a90._0_8_;
      uStack_4c8 = local_3a90._8_8_;
      local_4c0 = 0x3f318000;
      uStack_4bc = 0x3f318000;
      uStack_4b8 = 0x3f318000;
      uStack_4b4 = 0x3f318000;
      local_120 = local_3ab0;
      uStack_118 = uStack_3aa8;
      local_130 = 0x3f3180003f318000;
      uStack_128 = 0x3f3180003f318000;
      local_140 = local_3a90._0_8_;
      uStack_138 = local_3a90._8_8_;
      auVar172._8_8_ = 0x3f3180003f318000;
      auVar172._0_8_ = 0x3f3180003f318000;
      auVar25 = vfnmadd213ps_fma(auVar172,_local_3ab0,auVar18);
      local_4e0 = local_3ab0;
      uStack_4d8 = uStack_3aa8;
      local_3a90._0_8_ = auVar25._0_8_;
      local_500 = local_3a90._0_8_;
      local_3a90._8_8_ = auVar25._8_8_;
      uStack_4f8 = local_3a90._8_8_;
      local_4f0 = 0xb95e8083;
      uStack_4ec = 0xb95e8083;
      uStack_4e8 = 0xb95e8083;
      uStack_4e4 = 0xb95e8083;
      local_f0 = local_3ab0;
      uStack_e8 = uStack_3aa8;
      local_100 = 0xb95e8083b95e8083;
      uStack_f8 = 0xb95e8083b95e8083;
      local_110 = local_3a90._0_8_;
      uStack_108 = local_3a90._8_8_;
      auVar173._8_8_ = 0xb95e8083b95e8083;
      auVar173._0_8_ = 0xb95e8083b95e8083;
      local_3a90 = vfnmadd213ps_fma(auVar173,_local_3ab0,auVar25);
      local_8a0 = local_3a90._0_8_;
      uStack_898 = local_3a90._8_8_;
      local_890._0_4_ = local_3a90._0_4_;
      local_890._4_4_ = local_3a90._4_4_;
      uStack_888._0_4_ = local_3a90._8_4_;
      uStack_888._4_4_ = local_3a90._12_4_;
      local_3aa0 = CONCAT44(local_890._4_4_ * local_890._4_4_,(float)local_890 * (float)local_890);
      uStack_3a98._0_4_ = (float)uStack_888 * (float)uStack_888;
      uStack_3a98._4_4_ = uStack_888._4_4_ * uStack_888._4_4_;
      uStack_3ae8._0_4_ = 0x39506967;
      local_3af0 = 0x3950696739506967;
      uStack_3ae8._4_4_ = 0x39506967;
      local_6f0 = 0x3950696739506967;
      uStack_6e8 = uStack_3ae8;
      local_700 = local_3a90._0_8_;
      uStack_6f8 = local_3a90._8_8_;
      local_710 = 0x3ab743ce;
      uStack_70c = 0x3ab743ce;
      uStack_708 = 0x3ab743ce;
      uStack_704 = 0x3ab743ce;
      local_270 = 0x3950696739506967;
      uStack_268 = uStack_3ae8;
      local_280 = local_3a90._0_8_;
      uStack_278 = local_3a90._8_8_;
      local_290 = 0x3ab743ce3ab743ce;
      uStack_288 = 0x3ab743ce3ab743ce;
      auVar164._8_8_ = uStack_3ae8;
      auVar164._0_8_ = 0x3950696739506967;
      auVar163._8_8_ = 0x3ab743ce3ab743ce;
      auVar163._0_8_ = 0x3ab743ce3ab743ce;
      auVar25 = vfmadd213ps_fma(local_3a90,auVar164,auVar163);
      local_3af0 = auVar25._0_8_;
      local_720 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uStack_718 = uStack_3ae8;
      local_730 = local_3a90._0_8_;
      uStack_728 = local_3a90._8_8_;
      local_740 = 0x3c088908;
      uStack_73c = 0x3c088908;
      uStack_738 = 0x3c088908;
      uStack_734 = 0x3c088908;
      local_240 = local_3af0;
      uStack_238 = uStack_3ae8;
      local_250 = local_3a90._0_8_;
      uStack_248 = local_3a90._8_8_;
      local_260 = 0x3c0889083c088908;
      uStack_258 = 0x3c0889083c088908;
      auVar165._8_8_ = 0x3c0889083c088908;
      auVar165._0_8_ = 0x3c0889083c088908;
      auVar25 = vfmadd213ps_fma(local_3a90,auVar25,auVar165);
      local_3af0 = auVar25._0_8_;
      local_750 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uStack_748 = uStack_3ae8;
      local_760 = local_3a90._0_8_;
      uStack_758 = local_3a90._8_8_;
      local_770 = 0x3d2aa9c1;
      uStack_76c = 0x3d2aa9c1;
      uStack_768 = 0x3d2aa9c1;
      uStack_764 = 0x3d2aa9c1;
      local_210 = local_3af0;
      uStack_208 = uStack_3ae8;
      local_220 = local_3a90._0_8_;
      uStack_218 = local_3a90._8_8_;
      local_230 = 0x3d2aa9c13d2aa9c1;
      uStack_228 = 0x3d2aa9c13d2aa9c1;
      auVar166._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar166._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar25 = vfmadd213ps_fma(local_3a90,auVar25,auVar166);
      local_3af0 = auVar25._0_8_;
      local_780 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uStack_778 = uStack_3ae8;
      local_790 = local_3a90._0_8_;
      uStack_788 = local_3a90._8_8_;
      local_7a0 = 0x3e2aaaaa;
      uStack_79c = 0x3e2aaaaa;
      uStack_798 = 0x3e2aaaaa;
      uStack_794 = 0x3e2aaaaa;
      local_1e0 = local_3af0;
      uStack_1d8 = uStack_3ae8;
      local_1f0 = local_3a90._0_8_;
      uStack_1e8 = local_3a90._8_8_;
      local_200 = 0x3e2aaaaa3e2aaaaa;
      uStack_1f8 = 0x3e2aaaaa3e2aaaaa;
      auVar167._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar167._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar25 = vfmadd213ps_fma(local_3a90,auVar25,auVar167);
      local_3af0 = auVar25._0_8_;
      local_7b0 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uStack_7a8 = uStack_3ae8;
      local_7c0 = local_3a90._0_8_;
      uStack_7b8 = local_3a90._8_8_;
      local_7d0 = 0x3f000000;
      uStack_7cc = 0x3f000000;
      uStack_7c8 = 0x3f000000;
      uStack_7c4 = 0x3f000000;
      local_1b0 = local_3af0;
      uStack_1a8 = uStack_3ae8;
      local_1c0 = local_3a90._0_8_;
      uStack_1b8 = local_3a90._8_8_;
      local_1d0 = 0x3f0000003f000000;
      uStack_1c8 = 0x3f0000003f000000;
      auVar168._8_8_ = 0x3f0000003f000000;
      auVar168._0_8_ = 0x3f0000003f000000;
      auVar25 = vfmadd213ps_fma(local_3a90,auVar25,auVar168);
      local_3af0 = auVar25._0_8_;
      local_7e0 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uStack_7d8 = uStack_3ae8;
      local_7f0 = local_3aa0;
      uStack_7e8 = uStack_3a98;
      local_800 = local_3a90._0_8_;
      uStack_7f8 = local_3a90._8_8_;
      local_180 = local_3af0;
      uStack_178 = uStack_3ae8;
      local_190 = local_3aa0;
      uStack_188 = uStack_3a98;
      local_1a0 = local_3a90._0_8_;
      uStack_198 = local_3a90._8_8_;
      auVar169._8_8_ = uStack_3a98;
      auVar169._0_8_ = local_3aa0;
      auVar25 = vfmadd213ps_fma(auVar169,auVar25,local_3a90);
      local_3af0 = auVar25._0_8_;
      uVar26 = local_3af0;
      uStack_3ae8 = auVar25._8_8_;
      uVar27 = uStack_3ae8;
      local_3a30 = 0x3f8000003f800000;
      uStack_3a28 = 0x3f8000003f800000;
      local_3a20._0_4_ = auVar25._0_4_;
      local_3a20._4_4_ = auVar25._4_4_;
      uStack_3a18._0_4_ = auVar25._8_4_;
      uStack_3a18._4_4_ = auVar25._12_4_;
      local_3af0 = CONCAT44(local_3a20._4_4_ + 1.0,(float)local_3a20 + 1.0);
      uStack_3ae8._0_4_ = (float)uStack_3a18 + 1.0;
      uStack_3ae8._4_4_ = uStack_3a18._4_4_ + 1.0;
      local_c0._0_4_ = local_3ab0._0_4_;
      local_c0._4_4_ = local_3ab0._4_4_;
      uStack_b8._0_4_ = local_3ab0._8_4_;
      uStack_b8._4_4_ = local_3ab0._12_4_;
      local_3ac0._4_4_ = (int)local_c0._4_4_;
      local_3ac0._0_4_ = (int)(float)local_c0;
      local_3ac0._8_4_ = (int)(float)uStack_b8;
      local_3ac0._12_4_ = (int)uStack_b8._4_4_;
      local_90 = local_3ac0._0_8_;
      uStack_88 = local_3ac0._8_8_;
      local_a0 = 0x7f0000007f;
      uStack_98 = 0x7f0000007f;
      auVar176._8_8_ = local_3ac0._8_8_;
      auVar176._0_8_ = local_3ac0._0_8_;
      auVar175._8_8_ = 0x7f0000007f;
      auVar175._0_8_ = 0x7f0000007f;
      auVar25 = vpaddd_avx(auVar175,auVar176);
      local_3ac0._0_8_ = auVar25._0_8_;
      local_70 = local_3ac0._0_8_;
      local_3ac0._8_8_ = auVar25._8_8_;
      uStack_68 = local_3ac0._8_8_;
      local_74 = 0x17;
      local_3ac0 = vpslld_avx(auVar25,ZEXT416(0x17));
      local_60 = local_3ac0._0_8_;
      uStack_58 = local_3ac0._8_8_;
      local_3b00 = local_3ac0._0_8_;
      uStack_3af8 = local_3ac0._8_8_;
      local_8b0 = local_3af0;
      uStack_8a8 = uStack_3ae8;
      local_8c0 = local_3ac0._0_8_;
      uStack_8b8 = local_3ac0._8_8_;
      fVar193 = local_3ac0._0_4_ * ((float)local_3a20 + 1.0);
      fVar194 = local_3ac0._4_4_ * (local_3a20._4_4_ + 1.0);
      fVar195 = local_3ac0._8_4_ * ((float)uStack_3a18 + 1.0);
      fVar196 = local_3ac0._12_4_ * (uStack_3a18._4_4_ + 1.0);
      local_3af0 = CONCAT44(fVar194,fVar193);
      uStack_3ae8._0_4_ = fVar195;
      uStack_3ae8._4_4_ = fVar196;
      local_3b20 = local_3af0;
      uStack_3b18 = uStack_3ae8;
      auVar190._0_8_ = CONCAT44(fVar194 + 1.0,fVar193 + 1.0);
      auVar190._8_4_ = fVar195 + 1.0;
      auVar190._12_4_ = fVar196 + 1.0;
      local_3c40 = 0x3f800000;
      uStack_3c3c = 0x3f800000;
      uStack_3c38 = 0x3f800000;
      uStack_3c34 = 0x3f800000;
      uStack_3c18 = auVar190._8_8_;
      uStack_9d8 = uStack_3c18;
      local_3c10 = (undefined1  [16])0x0;
      local_9f0 = 0;
      uStack_9e8 = 0;
      auVar134._8_8_ = uStack_3c18;
      auVar134._0_8_ = auVar190._0_8_;
      local_3c50 = vcmpps_avx(auVar134,ZEXT816(0),2);
      uStack_998 = uStack_3c18;
      local_9b0 = 0x800000;
      uStack_9ac = 0x800000;
      uStack_9a8 = 0x800000;
      uStack_9a4 = 0x800000;
      auVar137._8_8_ = uStack_3c18;
      auVar137._0_8_ = auVar190._0_8_;
      auVar136._8_4_ = 0x800000;
      auVar136._0_8_ = 0x80000000800000;
      auVar136._12_4_ = 0x800000;
      auVar25 = vmaxps_avx(auVar137,auVar136);
      local_3c20 = auVar25._0_8_;
      local_970 = local_3c20;
      uStack_3c18 = auVar25._8_8_;
      uStack_968 = uStack_3c18;
      local_980 = local_3c20;
      uStack_978 = uStack_3c18;
      local_984 = 0x17;
      auVar18 = vpsrld_avx(auVar25,ZEXT416(0x17));
      local_3bb0 = local_3c20;
      uStack_3ba8 = uStack_3c18;
      local_3bc0 = 0x807fffff;
      uStack_3bbc = 0x807fffff;
      uStack_3bb8 = 0x807fffff;
      uStack_3bb4 = 0x807fffff;
      auVar43._8_4_ = 0x807fffff;
      auVar43._0_8_ = 0x807fffff807fffff;
      auVar43._12_4_ = 0x807fffff;
      auVar25 = vpand_avx(auVar25,auVar43);
      local_3c20 = auVar25._0_8_;
      local_930 = local_3c20;
      uStack_3c18 = auVar25._8_8_;
      uStack_928 = uStack_3c18;
      local_940 = 0x3f000000;
      uStack_93c = 0x3f000000;
      uStack_938 = 0x3f000000;
      uStack_934 = 0x3f000000;
      auVar138._8_4_ = 0x3f000000;
      auVar138._0_8_ = 0x3f0000003f000000;
      auVar138._12_4_ = 0x3f000000;
      auVar189 = vpor_avx(auVar25,auVar138);
      local_3c30._0_8_ = auVar18._0_8_;
      local_910 = local_3c30._0_8_;
      local_3c30._8_8_ = auVar18._8_8_;
      uStack_908 = local_3c30._8_8_;
      local_920 = 0x7f0000007f;
      uStack_918 = 0x7f0000007f;
      auVar139._8_8_ = 0x7f0000007f;
      auVar139._0_8_ = 0x7f0000007f;
      local_3c30 = vpsubd_avx(auVar18,auVar139);
      local_8f0 = local_3c30._0_8_;
      uStack_8e8 = local_3c30._8_8_;
      auVar25 = vcvtdq2ps_avx(local_3c30);
      local_3c60 = auVar25._0_8_;
      uVar28 = local_3c60;
      uStack_3c58 = auVar25._8_8_;
      uVar29 = uStack_3c58;
      local_3b60 = 0x3f8000003f800000;
      uStack_3b58 = 0x3f8000003f800000;
      local_3b50._0_4_ = auVar25._0_4_;
      local_3b50._4_4_ = auVar25._4_4_;
      uStack_3b48._0_4_ = auVar25._8_4_;
      uStack_3b48._4_4_ = auVar25._12_4_;
      local_3c60._4_4_ = local_3b50._4_4_ + 1.0;
      local_3c60._0_4_ = (float)local_3b50 + 1.0;
      uStack_3c58._0_4_ = (float)uStack_3b48 + 1.0;
      uStack_3c58._4_4_ = uStack_3b48._4_4_ + 1.0;
      local_3c20 = auVar189._0_8_;
      local_8d0 = local_3c20;
      uStack_3c18 = auVar189._8_8_;
      uStack_8c8 = uStack_3c18;
      local_8e0 = 0x3f3504f3;
      uStack_8dc = 0x3f3504f3;
      uStack_8d8 = 0x3f3504f3;
      uStack_8d4 = 0x3f3504f3;
      auVar141._8_4_ = 0x3f3504f3;
      auVar141._0_8_ = 0x3f3504f33f3504f3;
      auVar141._12_4_ = 0x3f3504f3;
      local_3c70 = vcmpps_avx(auVar189,auVar141,1);
      local_3bd0 = local_3c20;
      uStack_3bc8 = uStack_3c18;
      local_3be0 = local_3c70._0_8_;
      uStack_3bd8 = local_3c70._8_8_;
      local_3c80 = vpand_avx(auVar189,local_3c70);
      local_39a0 = local_3c20;
      uStack_3998 = uStack_3c18;
      local_39b0 = 0x3f8000003f800000;
      uStack_39a8 = 0x3f8000003f800000;
      auVar47._8_8_ = 0x3f8000003f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar25 = vsubps_avx(auVar189,auVar47);
      local_39c0 = local_3c60;
      uStack_39b8 = uStack_3c58;
      local_3bf0 = 0x3f8000003f800000;
      uStack_3be8 = 0x3f8000003f800000;
      local_3c00 = local_3c70._0_8_;
      uStack_3bf8 = local_3c70._8_8_;
      auVar18._8_8_ = 0x3f8000003f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      local_39d0 = vpand_avx(auVar18,local_3c70);
      auVar46._8_8_ = uStack_3c58;
      auVar46._0_8_ = local_3c60;
      _local_3c60 = vsubps_avx(auVar46,local_39d0);
      local_3c20 = auVar25._0_8_;
      uVar30 = local_3c20;
      uStack_3c18 = auVar25._8_8_;
      uVar31 = uStack_3c18;
      local_3b70._0_4_ = auVar25._0_4_;
      local_3b70._4_4_ = auVar25._4_4_;
      uStack_3b68._0_4_ = auVar25._8_4_;
      uStack_3b68._4_4_ = auVar25._12_4_;
      local_3b80._0_4_ = local_3c80._0_4_;
      local_3b80._4_4_ = local_3c80._4_4_;
      uStack_3b78._0_4_ = local_3c80._8_4_;
      uStack_3b78._4_4_ = local_3c80._12_4_;
      local_3c20._0_4_ = (float)local_3b70 + (float)local_3b80;
      local_3c20._4_4_ = local_3b70._4_4_ + local_3b80._4_4_;
      uStack_3b68._0_4_ = (float)uStack_3b68 + (float)uStack_3b78;
      uStack_3b68._4_4_ = uStack_3b68._4_4_ + uStack_3b78._4_4_;
      uStack_3c18._0_4_ = (float)uStack_3b68;
      uStack_3c18._4_4_ = uStack_3b68._4_4_;
      local_820 = local_3c20;
      uStack_818 = uStack_3c18;
      local_3c90 = (float)local_3c20._0_4_ * (float)local_3c20._0_4_;
      fStack_3c8c = (float)local_3c20._4_4_ * (float)local_3c20._4_4_;
      fStack_3c88 = (float)uStack_3b68 * (float)uStack_3b68;
      fStack_3c84 = uStack_3b68._4_4_ * uStack_3b68._4_4_;
      uStack_3c98._0_4_ = 0x3d9021bb;
      local_3ca0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3c98._4_4_ = 0x3d9021bb;
      local_510 = 0x3d9021bb3d9021bb;
      uStack_508 = uStack_3c98;
      local_520 = local_3c20;
      uStack_518 = uStack_3c18;
      local_530 = 0xbdebd1b8;
      uStack_52c = 0xbdebd1b8;
      uStack_528 = 0xbdebd1b8;
      uStack_524 = 0xbdebd1b8;
      local_450 = 0x3d9021bb3d9021bb;
      uStack_448 = uStack_3c98;
      local_460 = local_3c20;
      uStack_458 = uStack_3c18;
      local_470 = 0xbdebd1b8bdebd1b8;
      uStack_468 = 0xbdebd1b8bdebd1b8;
      auVar144._8_8_ = uStack_3c98;
      auVar144._0_8_ = 0x3d9021bb3d9021bb;
      auVar143._8_8_ = uStack_3c18;
      auVar143._0_8_ = local_3c20;
      auVar142._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar142._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar25 = vfmadd213ps_fma(auVar143,auVar144,auVar142);
      local_3ca0 = auVar25._0_8_;
      local_540 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_538 = uStack_3c98;
      local_550 = local_3c20;
      uStack_548 = uStack_3c18;
      local_560 = 0x3def251a;
      uStack_55c = 0x3def251a;
      uStack_558 = 0x3def251a;
      uStack_554 = 0x3def251a;
      local_420 = local_3ca0;
      uStack_418 = uStack_3c98;
      local_430 = local_3c20;
      uStack_428 = uStack_3c18;
      local_440 = 0x3def251a3def251a;
      uStack_438 = 0x3def251a3def251a;
      auVar146._8_8_ = uStack_3c18;
      auVar146._0_8_ = local_3c20;
      auVar145._8_8_ = 0x3def251a3def251a;
      auVar145._0_8_ = 0x3def251a3def251a;
      auVar25 = vfmadd213ps_fma(auVar146,auVar25,auVar145);
      local_3ca0 = auVar25._0_8_;
      local_570 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_568 = uStack_3c98;
      local_580 = local_3c20;
      uStack_578 = uStack_3c18;
      local_590 = 0xbdfe5d4f;
      uStack_58c = 0xbdfe5d4f;
      uStack_588 = 0xbdfe5d4f;
      uStack_584 = 0xbdfe5d4f;
      local_3f0 = local_3ca0;
      uStack_3e8 = uStack_3c98;
      local_400 = local_3c20;
      uStack_3f8 = uStack_3c18;
      local_410 = 0xbdfe5d4fbdfe5d4f;
      uStack_408 = 0xbdfe5d4fbdfe5d4f;
      auVar148._8_8_ = uStack_3c18;
      auVar148._0_8_ = local_3c20;
      auVar147._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar147._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar25 = vfmadd213ps_fma(auVar148,auVar25,auVar147);
      local_3ca0 = auVar25._0_8_;
      local_5a0 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_598 = uStack_3c98;
      local_5b0 = local_3c20;
      uStack_5a8 = uStack_3c18;
      local_5c0 = 0x3e11e9bf;
      uStack_5bc = 0x3e11e9bf;
      uStack_5b8 = 0x3e11e9bf;
      uStack_5b4 = 0x3e11e9bf;
      local_3c0 = local_3ca0;
      uStack_3b8 = uStack_3c98;
      local_3d0 = local_3c20;
      uStack_3c8 = uStack_3c18;
      local_3e0 = 0x3e11e9bf3e11e9bf;
      uStack_3d8 = 0x3e11e9bf3e11e9bf;
      auVar150._8_8_ = uStack_3c18;
      auVar150._0_8_ = local_3c20;
      auVar149._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar149._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar25 = vfmadd213ps_fma(auVar150,auVar25,auVar149);
      local_3ca0 = auVar25._0_8_;
      local_5d0 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_5c8 = uStack_3c98;
      local_5e0 = local_3c20;
      uStack_5d8 = uStack_3c18;
      local_5f0 = 0xbe2aae50;
      uStack_5ec = 0xbe2aae50;
      uStack_5e8 = 0xbe2aae50;
      uStack_5e4 = 0xbe2aae50;
      local_390 = local_3ca0;
      uStack_388 = uStack_3c98;
      local_3a0 = local_3c20;
      uStack_398 = uStack_3c18;
      local_3b0 = 0xbe2aae50be2aae50;
      uStack_3a8 = 0xbe2aae50be2aae50;
      auVar152._8_8_ = uStack_3c18;
      auVar152._0_8_ = local_3c20;
      auVar151._8_8_ = 0xbe2aae50be2aae50;
      auVar151._0_8_ = 0xbe2aae50be2aae50;
      auVar25 = vfmadd213ps_fma(auVar152,auVar25,auVar151);
      local_3ca0 = auVar25._0_8_;
      local_600 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_5f8 = uStack_3c98;
      local_610 = local_3c20;
      uStack_608 = uStack_3c18;
      local_620 = 0x3e4cceac;
      uStack_61c = 0x3e4cceac;
      uStack_618 = 0x3e4cceac;
      uStack_614 = 0x3e4cceac;
      local_360 = local_3ca0;
      uStack_358 = uStack_3c98;
      local_370 = local_3c20;
      uStack_368 = uStack_3c18;
      local_380 = 0x3e4cceac3e4cceac;
      uStack_378 = 0x3e4cceac3e4cceac;
      auVar154._8_8_ = uStack_3c18;
      auVar154._0_8_ = local_3c20;
      auVar153._8_8_ = 0x3e4cceac3e4cceac;
      auVar153._0_8_ = 0x3e4cceac3e4cceac;
      auVar25 = vfmadd213ps_fma(auVar154,auVar25,auVar153);
      local_3ca0 = auVar25._0_8_;
      local_630 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_628 = uStack_3c98;
      local_640 = local_3c20;
      uStack_638 = uStack_3c18;
      local_650 = 0xbe7ffffc;
      uStack_64c = 0xbe7ffffc;
      uStack_648 = 0xbe7ffffc;
      uStack_644 = 0xbe7ffffc;
      local_330 = local_3ca0;
      uStack_328 = uStack_3c98;
      local_340 = local_3c20;
      uStack_338 = uStack_3c18;
      local_350 = 0xbe7ffffcbe7ffffc;
      uStack_348 = 0xbe7ffffcbe7ffffc;
      auVar156._8_8_ = uStack_3c18;
      auVar156._0_8_ = local_3c20;
      auVar155._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar155._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar25 = vfmadd213ps_fma(auVar156,auVar25,auVar155);
      local_3ca0 = auVar25._0_8_;
      local_660 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_658 = uStack_3c98;
      local_670 = local_3c20;
      uStack_668 = uStack_3c18;
      local_680 = 0x3eaaaaaa;
      uStack_67c = 0x3eaaaaaa;
      uStack_678 = 0x3eaaaaaa;
      uStack_674 = 0x3eaaaaaa;
      local_300 = local_3ca0;
      uStack_2f8 = uStack_3c98;
      local_310 = local_3c20;
      uStack_308 = uStack_3c18;
      local_320 = 0x3eaaaaaa3eaaaaaa;
      uStack_318 = 0x3eaaaaaa3eaaaaaa;
      auVar158._8_8_ = uStack_3c18;
      auVar158._0_8_ = local_3c20;
      auVar157._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar157._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar25 = vfmadd213ps_fma(auVar158,auVar25,auVar157);
      local_3ca0 = auVar25._0_8_;
      uVar32 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uVar33 = uStack_3c98;
      local_840 = local_3c20;
      uStack_838 = uStack_3c18;
      local_830._0_4_ = auVar25._0_4_;
      local_830._4_4_ = auVar25._4_4_;
      uStack_828._0_4_ = auVar25._8_4_;
      uStack_828._4_4_ = auVar25._12_4_;
      local_3ca0._4_4_ = local_830._4_4_ * (float)local_3c20._4_4_;
      local_3ca0._0_4_ = (float)local_830 * (float)local_3c20._0_4_;
      uStack_3c98._0_4_ = (float)uStack_828 * (float)uStack_3b68;
      uStack_3c98._4_4_ = uStack_828._4_4_ * uStack_3b68._4_4_;
      local_850 = local_3ca0;
      uStack_848 = uStack_3c98;
      local_860 = CONCAT44(fStack_3c8c,local_3c90);
      uStack_858 = CONCAT44(fStack_3c84,fStack_3c88);
      local_3ca0._4_4_ = local_830._4_4_ * (float)local_3c20._4_4_ * fStack_3c8c;
      local_3ca0._0_4_ = (float)local_830 * (float)local_3c20._0_4_ * local_3c90;
      uStack_3c98._0_4_ = (float)uStack_828 * (float)uStack_3b68 * fStack_3c88;
      uStack_3c98._4_4_ = uStack_828._4_4_ * uStack_3b68._4_4_ * fStack_3c84;
      local_690 = local_3c60;
      uStack_688 = uStack_3c58;
      local_6b0 = local_3ca0;
      uStack_6a8 = uStack_3c98;
      local_6a0 = 0xb95e8083;
      uStack_69c = 0xb95e8083;
      uStack_698 = 0xb95e8083;
      uStack_694 = 0xb95e8083;
      local_2d0 = local_3c60;
      uStack_2c8 = uStack_3c58;
      local_2e0 = 0xb95e8083b95e8083;
      uStack_2d8 = 0xb95e8083b95e8083;
      local_2f0 = local_3ca0;
      uStack_2e8 = uStack_3c98;
      auVar160._8_8_ = 0xb95e8083b95e8083;
      auVar160._0_8_ = 0xb95e8083b95e8083;
      auVar159._8_8_ = uStack_3c98;
      auVar159._0_8_ = local_3ca0;
      auVar25 = vfmadd213ps_fma(auVar160,_local_3c60,auVar159);
      local_480 = CONCAT44(fStack_3c8c,local_3c90);
      uStack_478 = CONCAT44(fStack_3c84,fStack_3c88);
      local_3ca0 = auVar25._0_8_;
      local_4a0 = local_3ca0;
      uStack_3c98 = auVar25._8_8_;
      uStack_498 = uStack_3c98;
      local_490 = 0x3f000000;
      uStack_48c = 0x3f000000;
      uStack_488 = 0x3f000000;
      uStack_484 = 0x3f000000;
      local_160 = 0x3f0000003f000000;
      uStack_158 = 0x3f0000003f000000;
      local_170 = local_3ca0;
      uStack_168 = uStack_3c98;
      auVar171._8_8_ = uStack_478;
      auVar171._0_8_ = local_480;
      auVar170._8_8_ = 0x3f0000003f000000;
      auVar170._0_8_ = 0x3f0000003f000000;
      _local_3ca0 = vfnmadd213ps_fma(auVar170,auVar171,auVar25);
      local_3b90 = local_3c20;
      uStack_3b88 = uStack_3c18;
      local_3ba0._0_4_ = local_3ca0._0_4_;
      local_3ba0._4_4_ = local_3ca0._4_4_;
      uStack_3b98._0_4_ = local_3ca0._8_4_;
      uStack_3b98._4_4_ = local_3ca0._12_4_;
      local_3c20._4_4_ = (float)local_3c20._4_4_ + local_3ba0._4_4_;
      local_3c20._0_4_ = (float)local_3c20._0_4_ + (float)local_3ba0;
      uStack_3c18._0_4_ = (float)uStack_3b68 + (float)uStack_3b98;
      uStack_3c18._4_4_ = uStack_3b68._4_4_ + uStack_3b98._4_4_;
      local_6c0 = local_3c60;
      uStack_6b8 = uStack_3c58;
      local_6e0 = local_3c20;
      uStack_6d8 = uStack_3c18;
      local_6d0 = 0x3f318000;
      uStack_6cc = 0x3f318000;
      uStack_6c8 = 0x3f318000;
      uStack_6c4 = 0x3f318000;
      local_2a0 = local_3c60;
      uStack_298 = uStack_3c58;
      local_2b0 = 0x3f3180003f318000;
      uStack_2a8 = 0x3f3180003f318000;
      local_2c0 = local_3c20;
      uStack_2b8 = uStack_3c18;
      auVar162._8_8_ = 0x3f3180003f318000;
      auVar162._0_8_ = 0x3f3180003f318000;
      auVar161._8_8_ = uStack_3c18;
      auVar161._0_8_ = local_3c20;
      auVar25 = vfmadd213ps_fma(auVar162,_local_3c60,auVar161);
      local_3c20 = auVar25._0_8_;
      local_950 = local_3c20;
      uStack_3c18 = auVar25._8_8_;
      uStack_948 = uStack_3c18;
      local_960 = local_3c50._0_8_;
      uStack_958 = local_3c50._8_8_;
      _local_3c20 = vpor_avx(auVar25,local_3c50);
      local_5660 = auVar17._0_8_;
      local_3ce0 = local_5660;
      uStack_5658 = auVar17._8_8_;
      uStack_3cd8 = uStack_5658;
      auVar17 = vpand_avx(*(undefined1 (*) [16])*local_5338,auVar17);
      local_5690 = auVar17._0_8_;
      uStack_5688 = auVar17._8_8_;
      local_3b30._0_4_ = auVar17._0_4_;
      local_3b30._4_4_ = auVar17._4_4_;
      uStack_3b28._0_4_ = auVar17._8_4_;
      uStack_3b28._4_4_ = auVar17._12_4_;
      local_3b40._0_4_ = local_3c20._0_4_;
      local_3b40._4_4_ = local_3c20._4_4_;
      uStack_3b38._0_4_ = local_3c20._8_4_;
      uStack_3b38._4_4_ = local_3c20._12_4_;
      local_5650 = CONCAT44(local_3b30._4_4_ + local_3b40._4_4_,
                            (float)local_3b30 + (float)local_3b40);
      uStack_5648 = CONCAT44(uStack_3b28._4_4_ + uStack_3b38._4_4_,
                             (float)uStack_3b28 + (float)uStack_3b38);
      local_3958 = local_5338;
      local_3970 = local_5650;
      uStack_3968 = uStack_5648;
      *(undefined8 *)*local_5338 = local_5650;
      *(undefined8 *)(*local_5338 + 8) = uStack_5648;
      local_5338 = (undefined1 (*) [64])(*local_5338 + 0x10);
      local_3cd0 = local_3cf0;
      uStack_3cc8 = uStack_3ce8;
      local_3cb0 = local_3cf0;
      uStack_3ca8 = uStack_3ce8;
      local_3ba0 = local_3ca0;
      uStack_3b98 = uStack_3c98;
      local_3b80 = local_3c80._0_8_;
      uStack_3b78 = local_3c80._8_8_;
      local_3b70 = uVar30;
      uStack_3b68 = uVar31;
      local_3b50 = uVar28;
      uStack_3b48 = uVar29;
      local_3b40 = local_3c20;
      uStack_3b38 = uStack_3c18;
      local_3b30 = local_5690;
      uStack_3b28 = uStack_5688;
      local_3b10 = 0x3f8000003f800000;
      uStack_3b08 = 0x3f8000003f800000;
      local_3a20 = uVar26;
      uStack_3a18 = uVar27;
      local_9e0 = auVar190._0_8_;
      local_9a0 = auVar190._0_8_;
      local_890 = local_8a0;
      uStack_888 = uStack_898;
      local_870 = uVar22;
      uStack_868 = uVar23;
      local_830 = uVar32;
      uStack_828 = uVar33;
      local_810 = local_820;
      uStack_808 = uStack_818;
      local_150 = local_480;
      uStack_148 = uStack_478;
      local_c0 = local_3ab0;
      uStack_b8 = uStack_3aa8;
    }
    for (; local_5390 < local_5328; local_5390 = local_5390 + 1) {
      if (*(float *)*local_5338 <= 0.0) {
        dVar187 = std::exp((double)(ulong)*(uint *)*local_5338);
        dVar187 = std::log((double)(ulong)(uint)(SUB84(dVar187,0) + 1.0));
        *(int *)*local_5338 = SUB84(dVar187,0);
      }
      else {
        fVar193 = *(float *)*local_5338;
        dVar187 = std::exp((double)(ulong)(*(uint *)*local_5338 ^ 0x80000000));
        dVar187 = std::log((double)(ulong)(uint)(SUB84(dVar187,0) + 1.0));
        *(float *)*local_5338 = fVar193 + SUB84(dVar187,0);
      }
      local_5338 = (undefined1 (*) [64])(*local_5338 + 4);
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}